

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sten.cpp
# Opt level: O2

void __thiscall amrex::MLNodeLaplacian::buildStencil(MLNodeLaplacian *this)

{
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  *this_00;
  MultiFab *pMVar1;
  Array4<const_int> *pAVar2;
  size_t __n;
  int iVar3;
  long *plVar4;
  pointer puVar5;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar6;
  Geometry *this_01;
  FabArray<amrex::FArrayBox> *this_02;
  FabArray<amrex::FArrayBox> *this_03;
  double dVar7;
  double dVar8;
  int i_;
  int i__00;
  int j_;
  int i__01;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  _func_int **pp_Var11;
  double *pdVar12;
  IndexType IVar13;
  bool bVar14;
  bool bVar15;
  int i;
  FabType FVar16;
  uint uVar17;
  int iVar18;
  int j__00;
  int iVar19;
  ulong uVar20;
  EBFArrayBoxFactory *this_04;
  long lVar21;
  int *piVar22;
  undefined8 *puVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  Periodicity *period;
  MultiArray4<double> MVar28;
  MultiArray4<const_int> MVar29;
  Array4<double> *pAVar30;
  int j_3;
  int iVar31;
  int iVar32;
  int k_;
  int j__01;
  int j__02;
  int iVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  int j_4;
  long lVar43;
  Vector<int,_std::allocator<int>_> *pVVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  undefined8 *puVar59;
  FabArray<amrex::FArrayBox> *pFVar60;
  long lVar61;
  void *pvVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  int iVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  ulong uVar79;
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  *this_05;
  long lVar80;
  long lVar81;
  long lVar82;
  int iVar83;
  long lVar84;
  undefined8 *puVar85;
  long lVar86;
  Vector<int,_std::allocator<int>_> *pVVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  int j;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  int j_1;
  int i__02;
  long lVar96;
  long lVar97;
  int iVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  int amrlev;
  int iVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  double dVar110;
  double dVar111;
  undefined8 uVar112;
  double dVar113;
  Real RVar114;
  Real RVar115;
  Real RVar116;
  Real RVar117;
  Real RVar118;
  Real RVar119;
  Real RVar120;
  Real RVar121;
  Real RVar122;
  Real RVar123;
  Real RVar124;
  Real RVar125;
  Real RVar126;
  Real RVar127;
  Real RVar128;
  Real RVar129;
  Real RVar130;
  Real RVar131;
  Real RVar132;
  Real RVar133;
  Real RVar134;
  Real RVar135;
  Real RVar136;
  Real RVar137;
  Real RVar138;
  Real RVar139;
  Real RVar140;
  Real RVar141;
  Real RVar142;
  Real RVar143;
  Real RVar144;
  Real RVar145;
  Real RVar146;
  Real RVar147;
  Real RVar148;
  Real RVar149;
  Real RVar150;
  Real RVar151;
  Real RVar152;
  Real RVar153;
  Real RVar154;
  Real RVar155;
  Real RVar156;
  Real RVar157;
  Real RVar158;
  Real RVar159;
  Real RVar160;
  Real RVar161;
  Real RVar162;
  Real RVar163;
  Real RVar164;
  Real RVar165;
  Real RVar166;
  Real RVar167;
  Real RVar168;
  Real RVar169;
  Real RVar170;
  Real RVar171;
  Real RVar172;
  Real RVar173;
  Real RVar174;
  Real RVar175;
  Real RVar176;
  Real RVar177;
  Real RVar178;
  Real RVar179;
  Real RVar180;
  Real RVar181;
  Real RVar182;
  Real RVar183;
  Real RVar184;
  Real RVar185;
  Real RVar186;
  Real RVar187;
  Real RVar188;
  Real RVar189;
  Real RVar190;
  Real RVar191;
  Real RVar192;
  Real RVar193;
  Real RVar194;
  Real RVar195;
  Real RVar196;
  Real RVar197;
  Real RVar198;
  Real RVar199;
  Real RVar200;
  Real RVar201;
  Real RVar202;
  Real RVar203;
  Real RVar204;
  Real RVar205;
  Real RVar206;
  Real RVar207;
  Real RVar208;
  Real RVar209;
  Real RVar210;
  Real RVar211;
  Real RVar212;
  Real RVar213;
  Real RVar214;
  Real RVar215;
  Real RVar216;
  Real RVar217;
  Real RVar218;
  Real RVar219;
  Real RVar220;
  Real RVar221;
  Real RVar222;
  Real RVar223;
  Real RVar224;
  Real RVar225;
  Real RVar226;
  Real RVar227;
  Real RVar228;
  Real RVar229;
  Real RVar230;
  Real RVar231;
  Real RVar232;
  Real RVar233;
  Real RVar234;
  Real RVar235;
  Real RVar236;
  Real RVar237;
  Real RVar238;
  Real RVar239;
  Real RVar240;
  Real RVar241;
  Real RVar242;
  Real RVar243;
  Real RVar244;
  Real RVar245;
  Real RVar246;
  Real RVar247;
  Real RVar248;
  Real RVar249;
  Real RVar250;
  Real RVar251;
  Real RVar252;
  Real RVar253;
  Real RVar254;
  Real RVar255;
  Real RVar256;
  Real RVar257;
  Real RVar258;
  Real RVar259;
  Real RVar260;
  Real RVar261;
  Real RVar262;
  Real RVar263;
  Real RVar264;
  Real RVar265;
  Real RVar266;
  Real RVar267;
  Real RVar268;
  Real RVar269;
  Real RVar270;
  Real RVar271;
  Real RVar272;
  Real RVar273;
  Real RVar274;
  Real RVar275;
  Real RVar276;
  Real RVar277;
  Real RVar278;
  Real RVar279;
  Real RVar280;
  Real RVar281;
  Real RVar282;
  Real RVar283;
  Real RVar284;
  Real RVar285;
  Real RVar286;
  Real RVar287;
  Real RVar288;
  Real RVar289;
  Real RVar290;
  Real RVar291;
  Real RVar292;
  Real RVar293;
  Real RVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  Vector<int,_std::allocator<int>_> *pVVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  Periodicity PVar307;
  long local_f68;
  long local_f48;
  Real facz;
  long local_f28;
  long local_f18;
  long local_f00;
  long local_ef8;
  anon_class_8_1_a7ed5350 A00p;
  anon_class_8_1_a7ed5350 A0pp;
  anon_class_8_1_a7ed5350 A0p0;
  long local_ea8;
  anon_class_8_1_a7ed5350 Ap0p;
  anon_class_8_1_a7ed5350 Ap00;
  anon_class_8_1_a7ed5350 A000;
  long local_e78;
  long local_e58;
  anon_class_8_1_a7ed5350 App0;
  anon_class_8_1_a7ed5350 Am0p;
  anon_class_8_1_a7ed5350 Appp;
  long local_e28;
  anon_class_8_1_a7ed5350 A0mp;
  long local_df8;
  long local_de8;
  anon_class_8_1_a7ed5350 Amp0;
  anon_class_8_1_a7ed5350 Apmp;
  long local_da8;
  long local_d98;
  anon_class_8_1_a7ed5350 Ampp;
  long local_d88;
  long local_d80;
  undefined8 *local_d78;
  long local_d68;
  anon_class_8_1_a7ed5350 Am00;
  anon_class_8_1_a7ed5350 A0m0;
  long local_d28;
  long local_d18;
  long local_d08;
  anon_class_8_1_a7ed5350 Appm;
  anon_class_8_1_a7ed5350 Ammp;
  anon_class_8_1_a7ed5350 Apm0;
  anon_class_8_1_a7ed5350 A0pm;
  long local_cd8;
  long local_cc8;
  long local_cb8;
  anon_class_8_1_a7ed5350 Ap0m;
  long local_c98;
  long local_c88;
  anon_class_8_1_a7ed5350 A00m;
  long local_c68;
  anon_class_8_1_a7ed5350 Ampm;
  long local_c58;
  anon_class_8_1_a7ed5350 restrict_from_00p_to;
  anon_class_8_1_a7ed5350 interp_from_00p_to;
  long local_c38;
  anon_class_8_1_a7ed5350 Amm0;
  FArrayBox sgfab;
  element_type *local_bd8;
  element_type *local_bc8;
  long local_bb8;
  long local_ba8;
  long local_b98;
  long local_b88;
  long local_b58;
  long local_b48;
  long local_b38;
  anon_class_8_1_a7ed5350 restrict_from_0pp_to;
  anon_class_8_1_a7ed5350 restrict_from_0p0_to;
  anon_class_8_1_a7ed5350 interp_from_0p0_to;
  long local_af8;
  anon_class_8_1_a7ed5350 interp_from_mmp_to;
  int iStack_ae0;
  int iStack_adc;
  int iStack_ad8;
  int local_ad4;
  IndexType local_ad0;
  long local_ab8;
  long local_a90;
  long local_a88;
  long local_a80;
  long local_a78;
  long local_a70;
  long local_a68;
  long local_a60;
  long local_a58;
  long local_a48;
  long local_a40;
  long local_a30;
  long local_a28;
  long local_a20;
  anon_class_8_1_a7ed5350 interp_from_0pp_to;
  anon_class_8_1_a7ed5350 restrict_from_p0p_to;
  anon_class_8_1_a7ed5350 restrict_from_p00_to;
  anon_class_8_1_a7ed5350 interp_from_p00_to;
  anon_class_8_1_a7ed5350 interp_from_p0p_to;
  Box result;
  long local_9a8;
  element_type *local_998;
  long local_990;
  anon_class_8_1_a7ed5350 restrict_from_m0p_to;
  anon_class_8_1_a7ed5350 restrict_from_m00_to;
  anon_class_8_1_a7ed5350 interp_from_m00_to;
  anon_class_8_1_a7ed5350 interp_from_m0p_to;
  undefined8 *local_968;
  anon_class_8_1_a7ed5350 restrict_from_ppp_to;
  anon_class_8_1_a7ed5350 restrict_from_0mp_to;
  anon_class_8_1_a7ed5350 restrict_from_pp0_to;
  anon_class_8_1_a7ed5350 restrict_from_0m0_to;
  anon_class_8_1_a7ed5350 Apmm;
  anon_class_8_1_a7ed5350 interp_from_0m0_to;
  anon_class_8_1_a7ed5350 interp_from_pp0_to;
  element_type *local_8e8;
  anon_class_8_1_a7ed5350 interp_from_pmm_to;
  long local_8d0;
  long local_8c8;
  long local_8c0;
  int local_8b8;
  int local_8b4;
  int local_8b0;
  long local_868;
  long local_858;
  long local_848;
  long local_838;
  long local_828;
  long local_818;
  Box lhs_1;
  int local_7e8;
  int local_7e4;
  int local_7e0;
  long local_7c0;
  anon_class_8_1_a7ed5350 restrict_from_mpp_to;
  anon_class_8_1_a7ed5350 restrict_from_mp0_to;
  anon_class_8_1_a7ed5350 interp_from_mp0_to;
  Box lhs;
  long local_778;
  long local_768;
  long local_758;
  long local_6c0;
  long local_6b8;
  long local_6a8;
  anon_class_8_1_a7ed5350 restrict_from_pmp_to;
  anon_class_8_1_a7ed5350 restrict_from_pm0_to;
  anon_class_8_1_a7ed5350 Am0m;
  anon_class_8_1_a7ed5350 interp_from_pm0_to;
  int ncomp_s;
  int nghost;
  int iStack_66c;
  int local_668;
  int local_664;
  int local_660;
  int iStack_65c;
  IndexType local_658;
  int local_654;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  Array4<double> ns_starr;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  long local_5c0;
  long local_5b8;
  long local_5b0;
  element_type *local_5a8;
  long local_5a0;
  element_type *local_598;
  long local_590;
  MFIter mfi;
  anon_class_8_1_a7ed5350 restrict_from_mmp_to;
  anon_class_8_1_a7ed5350 restrict_from_mm0_to;
  anon_class_8_1_a7ed5350 restrict_from_0pm_to;
  anon_class_8_1_a7ed5350 restrict_from_00m_to;
  anon_class_8_1_a7ed5350 A0mm;
  anon_class_8_1_a7ed5350 interp_from_00m_to;
  anon_class_8_1_a7ed5350 interp_from_mm0_to;
  Box bx;
  long local_4c8;
  long local_4b8;
  long local_4a8;
  long local_498;
  anon_class_8_1_a7ed5350 interp_from_0pm_to;
  FabArray<amrex::EBCellFlagFab> *local_428;
  anon_class_8_1_a7ed5350 restrict_from_ppm_to;
  anon_class_8_1_a7ed5350 restrict_from_p0m_to;
  anon_class_8_1_a7ed5350 interp_from_p0m_to;
  anon_class_8_1_a7ed5350 interp_from_ppm_to;
  int local_3d8;
  ulong local_3d4;
  int local_3cc;
  Array4<double> local_3c0;
  Elixir sgeli;
  FabArray<amrex::FArrayBox> *local_338;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_330;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  anon_class_8_1_a7ed5350 restrict_from_mpm_to;
  anon_class_8_1_a7ed5350 restrict_from_m0m_to;
  anon_class_8_1_a7ed5350 interp_from_m0m_to;
  Elixir cneli;
  MFIter mfi_1;
  anon_class_8_1_a7ed5350 restrict_from_pmm_to;
  anon_class_8_1_a7ed5350 restrict_from_0mm_to;
  
  this_05 = &this->m_stencil;
  std::
  vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::resize(&this_05->
            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  this_00 = &this->m_nosigma_stencil;
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::resize(&this_00->
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  std::
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::resize(&(this->m_s0_norm0).
            super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
           ,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  lVar53 = 0;
  for (lVar103 = 0; lVar103 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
      lVar103 = lVar103 + 1) {
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::resize((vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              *)((long)&(((this->m_stencil).
                          super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        ).
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                + lVar53),
             (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                   super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar103]);
    mfi_1.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
    mfi_1.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->m_s0_norm0).
                         super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_> + lVar53),
               (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                     super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar103],(value_type_conflict2 *)&mfi_1);
    lVar53 = lVar53 + 0x18;
  }
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    ncomp_s = 9;
    if (**(int **)&(((this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> == 1) {
      Assert_host("!m_geom[0][0].IsRZ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sten.cpp"
                  ,0x22,"\"MLNodeLaplacian::buildStencil: cylindrical not supported for RAP\"");
    }
    uVar79 = 0;
    while( true ) {
      iVar31 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
      uVar20 = (ulong)iVar31;
      if ((long)uVar20 <= (long)uVar79) break;
      if ((uVar79 != iVar31 - 1) &&
         ((this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar79] != 2)) {
        Assert_host("amrlev == m_num_amr_levels-1 || AMRRefRatio(amrlev) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sten.cpp"
                    ,0x26,(char *)0x0);
      }
      lVar103 = 0;
      lVar53 = 0;
      uVar20 = 0;
      while (uVar17 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                      super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[uVar79], (long)uVar20 < (long)(int)uVar17) {
        nghost = (uint)((ulong)uVar17 != uVar20 + 1 || uVar79 != 0) * 3 + 1;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_2_ = 0;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._3_1_ = 0;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 1;
        mfi.fabArray._0_4_ = 1;
        convert((BoxArray *)&mfi_1,
                (BoxArray *)
                (*(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_grids.
                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar79].
                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> +
                lVar53),(IntVect *)&mfi);
        std::
        make_unique<amrex::MultiFab,amrex::BoxArray,amrex::DistributionMapping&,int_const&,int_const&>
                  ((BoxArray *)&sgfab,(DistributionMapping *)&mfi_1,
                   (int *)(*(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
                                     super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar79].
                                     super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                     .
                                     super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                          + lVar103),&ncomp_s);
        pp_Var11 = sgfab.super_BaseFab<double>._vptr_BaseFab;
        lVar21 = *(long *)&(this_05->
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ).
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar79].
                           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ;
        sgfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x0;
        plVar4 = *(long **)(lVar21 + uVar20 * 8);
        *(_func_int ***)(lVar21 + uVar20 * 8) = pp_Var11;
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 8))();
        }
        if (sgfab.super_BaseFab<double>._vptr_BaseFab != (_func_int **)0x0) {
          (**(code **)(*sgfab.super_BaseFab<double>._vptr_BaseFab + 8))();
        }
        sgfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x0;
        BoxArray::~BoxArray((BoxArray *)&mfi_1);
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (*(FabArray<amrex::FArrayBox> **)
                    (*(long *)&(this_05->
                               super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                               ).
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar79].
                               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    + uVar20 * 8),0.0);
        lVar53 = lVar53 + 0x68;
        lVar103 = lVar103 + 0x10;
        uVar20 = uVar20 + 1;
      }
      if (uVar79 != 0) {
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_2_ = 0;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._3_1_ = 0;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 1;
        mfi.fabArray._0_4_ = 1;
        convert((BoxArray *)&mfi_1,
                *(BoxArray **)
                 &(this->super_MLNodeLinOp).super_MLLinOp.m_grids.
                  super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar79].
                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
                (IntVect *)&mfi);
        nghost = 4;
        std::make_unique<amrex::MultiFab,amrex::BoxArray,amrex::DistributionMapping&,int_const&,int>
                  ((BoxArray *)&sgfab,(DistributionMapping *)&mfi_1,
                   *(int **)&(this->super_MLNodeLinOp).super_MLLinOp.m_dmap.
                             super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar79].
                             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             .
                             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                   ,&ncomp_s);
        pp_Var11 = sgfab.super_BaseFab<double>._vptr_BaseFab;
        puVar5 = (this_00->
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sgfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x0;
        tVar6.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
              &puVar5[uVar79]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        puVar5[uVar79]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
             (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)pp_Var11;
        if (tVar6.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
          (**(code **)(*(long *)tVar6.
                                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))
                    ();
        }
        if (sgfab.super_BaseFab<double>._vptr_BaseFab != (_func_int **)0x0) {
          (**(code **)(*sgfab.super_BaseFab<double>._vptr_BaseFab + 8))();
        }
        sgfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x0;
        BoxArray::~BoxArray((BoxArray *)&mfi_1);
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   (this_00->
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ).
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar79]._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0.0
                  );
      }
      this_01 = *(Geometry **)
                 &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar79].
                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      dVar298 = (this_01->super_CoordSys).inv_dx[0];
      dVar299 = (this_01->super_CoordSys).inv_dx[1];
      dVar300 = (this_01->super_CoordSys).inv_dx[2];
      lVar53 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar79].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ;
      if ((lVar53 == 0) ||
         (this_04 = (EBFArrayBoxFactory *)
                    __dynamic_cast(lVar53,&FabFactory<amrex::FArrayBox>::typeinfo,
                                   &EBFArrayBoxFactory::typeinfo,0),
         this_04 == (EBFArrayBoxFactory *)0x0)) {
        local_330._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (this->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar79]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
        bVar15 = true;
        local_428 = (FabArray<amrex::EBCellFlagFab> *)0x0;
        local_338 = (FabArray<amrex::FArrayBox> *)0x0;
      }
      else {
        local_428 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_04);
        local_330._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (this->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar79]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
        local_338 = &EBFArrayBoxFactory::getVolFrac(this_04)->super_FabArray<amrex::FArrayBox>;
        bVar15 = false;
      }
      interp_from_0pm_to.fsten._0_3_ = 0x10000;
      interp_from_0pm_to.fsten._4_4_ = Gpu::Device::max_gpu_streams;
      interp_from_0pm_to.fsten._0_2_ = 0x101;
      FArrayBox::FArrayBox(&sgfab);
      FArrayBox::FArrayBox((FArrayBox *)&nghost);
      MFIter::MFIter(&mfi,(FabArrayBase *)
                          **(undefined8 **)
                            &(this_05->
                             super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                             ).
                             super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar79].
                             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                             .
                             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ,(MFItInfo *)&interp_from_0pm_to);
      dVar300 = dVar300 * 0.027777777777777776 * dVar300;
      dVar301 = dVar300 + dVar300;
      dVar110 = -dVar301;
      dVar295 = dVar300 * 4.0;
      dVar296 = -dVar300;
      dVar298 = dVar298 * 0.027777777777777776 * dVar298;
      dVar299 = dVar299 * 0.027777777777777776 * dVar299;
      dVar302 = dVar298 * 4.0;
      dVar304 = dVar299 + dVar299;
      dVar297 = -dVar304;
      dVar305 = dVar298 + dVar298;
      dVar306 = dVar299 * 4.0;
      dVar111 = dVar298 * -2.0;
      dVar7 = -dVar299;
      dVar8 = -dVar298;
      pVVar303 = (Vector<int,_std::allocator<int>_> *)((dVar302 - dVar304) - dVar301);
      while (mfi.currentIndex < mfi.endIndex) {
        MFIter::validbox((Box *)&interp_from_ppm_to,&mfi);
        interp_from_ppm_to.fsten =
             (Array4<const_double> *)
             CONCAT44((int)((ulong)interp_from_ppm_to.fsten >> 0x20) + -1,
                      (int)interp_from_ppm_to.fsten + -1);
        local_3d8 = local_3d8 + -1;
        MFIter::growntilebox((Box *)&interp_from_mmp_to,&mfi,1);
        uVar20 = CONCAT44(-(uint)((int)((ulong)interp_from_ppm_to.fsten >> 0x20) <
                                 (int)((ulong)interp_from_mmp_to.fsten >> 0x20)),
                          -(uint)((int)interp_from_ppm_to.fsten < (int)interp_from_mmp_to.fsten));
        interp_from_mmp_to.fsten =
             (Array4<const_double> *)
             (~uVar20 & (ulong)interp_from_ppm_to.fsten | (ulong)interp_from_mmp_to.fsten & uVar20);
        iVar31 = local_3d8;
        if (local_3d8 < iStack_ae0) {
          iVar31 = iStack_ae0;
        }
        uVar20 = CONCAT44(-(uint)(iStack_ad8 < (int)(local_3d4 >> 0x20)),
                          -(uint)(iStack_adc < (int)local_3d4));
        uVar20 = ~uVar20 & local_3d4 | CONCAT44(iStack_ad8,iStack_adc) & uVar20;
        iStack_adc = (int)uVar20;
        iStack_ad8 = (int)(uVar20 >> 0x20);
        iVar34 = local_3cc;
        if (local_ad4 < local_3cc) {
          iVar34 = local_ad4;
        }
        bx.bigend.vect[2] = iVar34;
        bx.smallend.vect._0_8_ = interp_from_mmp_to.fsten;
        bx.smallend.vect[2] = iVar31;
        bx.bigend.vect[0] = iStack_adc;
        bx.bigend.vect[1] = iStack_ad8;
        for (lVar53 = 0; lVar53 != 3; lVar53 = lVar53 + 1) {
          if ((local_ad0.itype >> ((uint)lVar53 & 0x1f) & 1) != 0) {
            piVar22 = bx.bigend.vect + lVar53;
            *piVar22 = *piVar22 + -1;
          }
        }
        bx.btype.itype = 0;
        result.btype.itype = 0;
        result.smallend.vect[0] = (int)interp_from_mmp_to.fsten;
        result.smallend.vect[1] = (int)((ulong)interp_from_mmp_to.fsten >> 0x20);
        result.smallend.vect[2] = iVar31 + -1;
        result.bigend.vect[0] = bx.bigend.vect[0] + 1;
        result.smallend.vect[1] = result.smallend.vect[1] + -1;
        result.smallend.vect[0] = result.smallend.vect[0] + -1;
        result.bigend.vect[1] = bx.bigend.vect[1] + 1;
        result.bigend.vect[2] = bx.bigend.vect[2] + 1;
        piVar22 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar22 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        lVar53 = *(long *)(*(long *)(**(long **)&(this->m_sigma).
                                                 super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                                                 .
                                                 super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar79].
                                                 super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                                                 .
                                                 super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                                    + 0x108) + (long)*piVar22 * 8);
        lVar103 = *(long *)(lVar53 + 0x10);
        iVar83 = *(int *)(lVar53 + 0x18);
        iVar3 = *(int *)(lVar53 + 0x1c);
        iVar68 = *(int *)(lVar53 + 0x20);
        iVar98 = *(int *)(lVar53 + 0x24);
        iVar102 = *(int *)(lVar53 + 0x28);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_3c0,
                   (FabArray<amrex::FArrayBox> *)
                   **(undefined8 **)
                     &(this_05->
                      super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar79].
                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ,&mfi);
        tVar6.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
              &(this_00->
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar79]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        if (tVar6.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl ==
            (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
          ns_starr.kstride._0_4_ = 0;
          ns_starr.kstride._4_4_ = 0;
          ns_starr.nstride = 0;
          ns_starr.p._0_4_ = 0;
          ns_starr.p._4_4_ = 0;
          ns_starr.jstride._0_4_ = 0;
          ns_starr.jstride._4_4_ = 0;
          ns_starr.begin.x = 1;
          ns_starr.begin.y = 1;
          ns_starr.begin.z = 1;
          ns_starr.end.x = 0;
          ns_starr.end.y = 0;
          ns_starr.end.z = 0;
          ns_starr.ncomp = 0;
        }
        else {
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&ns_starr,
                     (FabArray<amrex::FArrayBox> *)
                     tVar6.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
        }
        lVar21 = (long)((iVar98 - iVar83) + 1);
        lVar54 = (long)((iVar102 - iVar3) + 1);
        lVar35 = lVar54 * lVar21;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&interp_from_pmm_to,
                   (FabArray<amrex::FArrayBox> *)
                   local_330._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
        if (bVar15) {
LAB_00540d2b:
          lhs_1.bigend.vect[1] = result.bigend.vect[1];
          lhs_1.bigend.vect[2] = result.bigend.vect[2];
          lhs_1.btype = result.btype;
          lhs_1.smallend.vect[0] = result.smallend.vect[0];
          lhs_1.smallend.vect[1] = result.smallend.vect[1];
          lhs_1.smallend.vect[2] = result.smallend.vect[2];
          lhs_1.bigend.vect[0] = result.bigend.vect[0];
          Box::operator&=(&lhs_1,(Box *)(lVar53 + 0x18));
          FArrayBox::resize((FArrayBox *)&sgfab.super_BaseFab<double>,&result,1,(Arena *)0x0);
          BaseFab<double>::elixir<double,_0>(&cneli,&sgfab.super_BaseFab<double>);
          lVar80 = (long)sgfab.super_BaseFab<double>.domain.smallend.vect[0];
          lVar84 = (long)sgfab.super_BaseFab<double>.domain.smallend.vect[1];
          iVar102 = sgfab.super_BaseFab<double>.domain.bigend.vect[0] + 1;
          lVar86 = (long)((sgfab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
                         sgfab.super_BaseFab<double>.domain.smallend.vect[1]);
          lVar92 = (long)sgfab.super_BaseFab<double>.domain.smallend.vect[2];
          lVar43 = (long)result.smallend.vect[1];
          lVar96 = (long)result.smallend.vect[2];
          lVar53 = lVar43 * 8;
          iVar98 = result.smallend.vect[0];
          lVar99 = (long)result.smallend.vect[0];
          pVVar44 = (Vector<int,_std::allocator<int>_> *)
                    (long)(iVar102 - sgfab.super_BaseFab<double>.domain.smallend.vect[0]);
          lVar103 = lVar103 + (lVar53 + (lVar96 - iVar68) * lVar54 * 8 + (long)iVar3 * -8) * lVar21
                              + lVar99 * 8 + (long)iVar83 * -8;
          pVVar87 = (Vector<int,_std::allocator<int>_> *)(lVar86 * (long)pVVar44);
          pdVar12 = sgfab.super_BaseFab<double>.dptr;
          lVar61 = (lVar53 + (lVar96 - lVar92) * lVar86 * 8 + lVar84 * -8) * (long)pVVar44 +
                   lVar99 * 8 + lVar80 * -8 + (long)sgfab.super_BaseFab<double>.dptr;
          lVar104 = (long)result.bigend.vect[0];
          lVar53 = (long)result.bigend.vect[1];
          lVar54 = (long)result.bigend.vect[2];
          for (; lVar36 = lVar61, lVar37 = lVar43, local_f00 = lVar103, lVar96 <= lVar54;
              lVar96 = lVar96 + 1) {
            for (; lVar37 <= lVar53; lVar37 = lVar37 + 1) {
              for (lVar107 = 0; lVar107 + lVar99 <= lVar104; lVar107 = lVar107 + 1) {
                mfi_1.m_fa._M_t.
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
                     iVar98 + (int)lVar107;
                mfi_1.m_fa._M_t.
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
                     (int)lVar37;
                mfi_1.fabArray._0_4_ = (int)lVar96;
                bVar14 = Box::contains(&lhs_1,(IntVect *)&mfi_1);
                uVar112 = 0;
                if (bVar14) {
                  uVar112 = *(undefined8 *)(local_f00 + lVar107 * 8);
                }
                *(undefined8 *)(lVar36 + lVar107 * 8) = uVar112;
              }
              lVar36 = lVar36 + (long)iVar102 * 8 + lVar80 * -8;
              local_f00 = local_f00 + lVar21 * 8;
            }
            lVar61 = lVar61 + (long)pVVar87 * 8;
            lVar103 = lVar103 + lVar35 * 8;
          }
          lhs.btype.itype = local_ad0.itype;
          lhs.bigend.vect[2] = iVar34;
          lhs.bigend.vect[1] = iStack_ad8;
          lhs.smallend.vect._0_8_ = interp_from_mmp_to.fsten;
          lhs.bigend.vect[0] = iStack_adc;
          mfi_1.tile_size.vect[1] = local_3c0.kstride._4_4_;
          mfi_1.tile_size.vect[0] = (int)local_3c0.kstride;
          mfi_1.beginIndex = local_3c0.begin.y;
          mfi_1.currentIndex = local_3c0.begin.x;
          mfi_1.typ.itype = local_3c0.end.y;
          mfi_1._52_8_ = local_3c0._52_8_;
          mfi_1.endIndex = local_3c0.begin.z;
          mfi_1.streams = local_3c0.end.x;
          mfi_1.tile_size.vect[2] = (undefined4)local_3c0.nstride;
          mfi_1.flags = local_3c0.nstride._4_1_;
          mfi_1._29_3_ = local_3c0.nstride._5_3_;
          mfi_1.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = (int)local_3c0.p;
          mfi_1.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
               (int)((ulong)local_3c0.p >> 0x20);
          mfi_1.fabArray._0_4_ = (int)local_3c0.jstride;
          mfi_1.fabArray._4_4_ = local_3c0.jstride._4_4_;
          lhs.smallend.vect[2] = iVar31;
          mfi_1.local_index_map = pVVar303;
          mfi_1.tile_array = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)pdVar12;
          mfi_1.local_tile_index_map = pVVar44;
          mfi_1.num_local_tiles = pVVar87;
          LoopConcurrent<amrex::mlndlap_set_stencil(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    (&lhs,(anon_class_184_9_71aa95b3 *)&mfi_1);
          if (CONCAT44(ns_starr.p._4_4_,(int)ns_starr.p) != 0) {
            lVar53 = (long)lhs_1.smallend.vect[2];
            puVar85 = (undefined8 *)
                      (((long)lhs_1.smallend.vect[1] * 8 + (lVar53 - lVar92) * lVar86 * 8 +
                       lVar84 * -8) * (long)pVVar44 + (long)lhs_1.smallend.vect[0] * 8 + lVar80 * -8
                      + (long)pdVar12);
            for (; puVar23 = puVar85, lVar103 = (long)lhs_1.smallend.vect[1],
                lVar53 <= lhs_1.bigend.vect[2]; lVar53 = lVar53 + 1) {
              for (; puVar59 = puVar23, lVar21 = (long)lhs_1.smallend.vect[0],
                  lVar103 <= lhs_1.bigend.vect[1]; lVar103 = lVar103 + 1) {
                for (; lVar21 <= lhs_1.bigend.vect[0]; lVar21 = lVar21 + 1) {
                  *puVar59 = 0x3ff0000000000000;
                  puVar59 = puVar59 + 1;
                }
                puVar23 = puVar23 + (iVar102 - lVar80);
              }
              puVar85 = puVar85 + (long)pVVar87;
            }
            lhs.bigend.vect[1] = iStack_ad8;
            lhs.smallend.vect._0_8_ = interp_from_mmp_to.fsten;
            lhs.bigend.vect[0] = iStack_adc;
            mfi_1.typ.itype = ns_starr.end.y;
            mfi_1._52_8_ = ns_starr._52_8_;
            mfi_1.tile_size.vect[1] = ns_starr.kstride._4_4_;
            mfi_1.tile_size.vect[0] = (int)ns_starr.kstride;
            mfi_1.currentIndex = ns_starr.begin.x;
            mfi_1.beginIndex = ns_starr.begin.y;
            mfi_1.endIndex = ns_starr.begin.z;
            mfi_1.streams = ns_starr.end.x;
            mfi_1.tile_size.vect[2] = (undefined4)ns_starr.nstride;
            mfi_1.flags = ns_starr.nstride._4_1_;
            mfi_1._29_3_ = ns_starr.nstride._5_3_;
            mfi_1.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
                 (int)ns_starr.p;
            mfi_1.m_fa._M_t.
            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
            _M_t.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
                 ns_starr.p._4_4_;
            mfi_1.fabArray._0_4_ = (int)ns_starr.jstride;
            mfi_1.fabArray._4_4_ = ns_starr.jstride._4_4_;
            mfi_1.tile_array = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)pdVar12;
            lhs.smallend.vect[2] = iVar31;
            mfi_1.local_index_map = pVVar303;
            mfi_1.local_tile_index_map = pVVar44;
            mfi_1.num_local_tiles = pVVar87;
            LoopConcurrent<amrex::mlndlap_set_stencil(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                      (&lhs,(anon_class_184_9_71aa95b3 *)&mfi_1);
          }
          Gpu::Elixir::~Elixir(&cneli);
        }
        else {
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    ((Array4<const_amrex::EBCellFlag> *)&mfi_1,local_428,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&lhs_1,local_338,&mfi);
          piVar22 = &mfi.currentIndex;
          if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar22 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + mfi.currentIndex;
          }
          FVar16 = EBCellFlagFab::getType
                             ((local_428->m_fabs_v).
                              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[*piVar22],&result);
          if (FVar16 == singlevalued) {
            lhs.btype.itype = result.btype.itype;
            lhs.bigend.vect[2] = result.bigend.vect[2];
            lhs.bigend.vect[1] = result.bigend.vect[1];
            lhs.smallend.vect[0] = result.smallend.vect[0];
            lhs.smallend.vect[1] = result.smallend.vect[1];
            lhs.smallend.vect[2] = result.smallend.vect[2];
            lhs.bigend.vect[0] = result.bigend.vect[0];
            Box::operator&=(&lhs,(Box *)(lVar53 + 0x18));
            FArrayBox::resize((FArrayBox *)&nghost,&result,0x1b,(Arena *)0x0);
            BaseFab<double>::elixir<double,_0>(&cneli,(BaseFab<double> *)&nghost);
            iVar32 = local_644;
            iVar18 = local_648;
            iVar19 = local_64c;
            iVar102 = local_650;
            iVar98 = local_654;
            IVar13.itype = local_658.itype;
            lVar43 = CONCAT44(iStack_65c,local_660);
            lVar100 = (long)(int)local_658.itype;
            lVar96 = (long)local_654;
            lVar61 = (long)local_650;
            FArrayBox::resize((FArrayBox *)&sgfab.super_BaseFab<double>,&result,1,(Arena *)0x0);
            lVar36 = (long)(int)((iVar19 - IVar13.itype) + 1);
            lVar63 = (long)((iVar18 - iVar98) + 1);
            lVar64 = lVar63 * lVar36;
            lVar55 = (long)((iVar32 - iVar102) + 1);
            lVar105 = lVar64 * lVar55;
            BaseFab<double>::elixir<double,_0>(&sgeli,&sgfab.super_BaseFab<double>);
            lVar45 = (long)sgfab.super_BaseFab<double>.domain.smallend.vect[0];
            lVar69 = (long)sgfab.super_BaseFab<double>.domain.smallend.vect[1];
            lVar46 = (long)((sgfab.super_BaseFab<double>.domain.bigend.vect[0] -
                            sgfab.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
            lVar80 = (long)((sgfab.super_BaseFab<double>.domain.bigend.vect[1] -
                            sgfab.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
            lVar84 = lVar80 * lVar46;
            lVar37 = (long)result.smallend.vect[1];
            lVar70 = (long)result.smallend.vect[2];
            lVar53 = lVar64 * 8;
            lVar65 = lVar53 * lVar55;
            lVar107 = (long)result.smallend.vect[0];
            local_968 = (undefined8 *)
                        ((lVar37 * 8 + (lVar70 - lVar61) * lVar63 * 8 + lVar96 * -8) * lVar36 +
                         lVar107 * 8 + lVar100 * -8 + lVar43);
            pdVar12 = sgfab.super_BaseFab<double>.dptr;
            lVar86 = (long)sgfab.super_BaseFab<double>.domain.smallend.vect[2];
            lVar92 = (long)result.bigend.vect[0];
            lVar99 = (long)result.bigend.vect[1];
            lVar104 = (long)result.bigend.vect[2];
            lVar54 = lVar36 * 8;
            for (; lVar70 <= lVar104; lVar70 = lVar70 + 1) {
              local_d78 = local_968;
              for (lVar101 = lVar37; lVar101 <= lVar99; lVar101 = lVar101 + 1) {
                lVar27 = lVar43 + (lVar70 - lVar61) * lVar64 * 8 + (lVar101 - lVar96) * lVar36 * 8;
                puVar85 = local_d78;
                for (lVar57 = lVar107; lVar38 = 0x1b, lVar57 <= lVar92; lVar57 = lVar57 + 1) {
                  interp_from_0pp_to.fsten =
                       (Array4<const_double> *)CONCAT44((int)lVar101,(int)lVar57);
                  bVar14 = Box::contains(&lhs,(IntVect *)&interp_from_0pp_to);
                  puVar23 = puVar85;
                  if (bVar14) {
                    uVar17 = *(uint *)((lVar101 - mfi_1.beginIndex) *
                                       CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) * 4 +
                                       CONCAT44(mfi_1.m_fa._M_t.
                                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                ._M_head_impl._4_4_,
                                                (int)mfi_1.m_fa._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl) + (lVar57 - mfi_1.currentIndex) * 4
                                      + (lVar70 - mfi_1.endIndex) * mfi_1.tile_size.vect._0_8_ * 4)
                             & 3;
                    if (uVar17 == 0) {
LAB_00542b74:
                      while (bVar14 = lVar38 != 0, lVar38 = lVar38 + -1, bVar14) {
                        *puVar23 = 0x3ff0000000000000;
                        puVar23 = (undefined8 *)((long)puVar23 + lVar65);
                      }
                    }
                    else if (uVar17 == 3) {
                      while (bVar14 = lVar38 != 0, lVar38 = lVar38 + -1, bVar14) {
                        *puVar23 = 0;
                        puVar23 = (undefined8 *)((long)puVar23 + lVar65);
                      }
                    }
                    else {
                      lVar39 = (lVar70 - local_7e0) *
                               CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]);
                      lVar40 = (lVar101 - local_7e4) *
                               CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 8 +
                               lhs_1.smallend.vect._0_8_ + (lVar57 - local_7e8) * 8;
                      dVar113 = *(double *)(lVar40 + lVar39 * 8);
                      if (0.9999999999999778 <= dVar113) goto LAB_00542b74;
                      lVar81 = (lVar70 - local_8b0) * local_8c8;
                      lVar26 = (lVar57 - local_8b8) * 8 + (lVar101 - local_8b4) * local_8d0 * 8;
                      lVar48 = lVar81 * 8 + lVar26;
                      lVar88 = local_8c0 * 0x18;
                      lVar56 = local_8c0 * 0x20;
                      lVar24 = local_8c0 * 0x30;
                      lVar93 = local_8c0 * 0x48;
                      lVar47 = local_8c0 * 0x58;
                      lVar25 = local_8c0 * 0x78;
                      *(double *)(lVar27 + (lVar57 - lVar100) * 8) =
                           (((*(double *)((long)interp_from_pmm_to.fsten + lVar24 + lVar48) -
                             *(double *)((long)interp_from_pmm_to.fsten + lVar93 + lVar48)) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar48)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar48)) * 9.0 +
                           dVar113 * 0.5625 +
                           ((-*(double *)((long)interp_from_pmm_to.fsten + lVar81 * 8 + lVar26) -
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar48)) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar88 + lVar48) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar48)) * 2.25;
                      lVar38 = lVar27 + (lVar57 - lVar100) * 8;
                      *(double *)(lVar38 + lVar105 * 8) =
                           (*(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar48) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar48)) * 18.0 +
                           *(double *)(lVar40 + lVar39 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + lVar88 + lVar48) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar81 * 8 + lVar26)) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar48)) * 4.5;
                      *(double *)(lVar105 * 0x10 + lVar38) =
                           (((*(double *)((long)interp_from_pmm_to.fsten + lVar93 + lVar48) -
                             *(double *)((long)interp_from_pmm_to.fsten + lVar24 + lVar48)) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar48)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar48)) * 9.0 +
                           *(double *)(lVar40 + lVar39 * 8) * 0.5625 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar48) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar81 * 8 + lVar26)) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar88 + lVar48) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar48)) * 2.25;
                      *(double *)(lVar105 * 0x18 + lVar38) =
                           (*(double *)((long)interp_from_pmm_to.fsten + lVar93 + lVar48) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar48)) * 18.0 +
                           *(double *)(lVar40 + lVar39 * 8) * 1.125 +
                           ((-*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar48) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar88 + lVar48)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar48)) * 4.5;
                      *(double *)(lVar105 * 0x20 + lVar38) =
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar48) * 36.0 +
                           *(double *)(lVar40 + lVar39 * 8) * 2.25 +
                           (-*(double *)((long)interp_from_pmm_to.fsten + lVar88 + lVar48) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar48)) * 9.0;
                      *(double *)(lVar105 * 0x28 + lVar38) =
                           (-*(double *)((long)interp_from_pmm_to.fsten + lVar93 + lVar48) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar48)) * 18.0 +
                           *(double *)(lVar40 + lVar39 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar48) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar88 + lVar48)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar48)) * 4.5;
                      *(double *)(lVar105 * 0x30 + lVar38) =
                           ((-*(double *)((long)interp_from_pmm_to.fsten + lVar24 + lVar48) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar93 + lVar48)) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar48) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar48)) * 9.0 +
                           *(double *)(lVar40 + lVar39 * 8) * 0.5625 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + lVar81 * 8 + lVar26) -
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar48)) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar88 + lVar48) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar48)) * 2.25;
                      lVar25 = (lVar70 - local_8b0) * local_8c8;
                      lVar26 = (lVar57 - local_8b8) * 8 + (lVar101 - local_8b4) * local_8d0 * 8;
                      lVar48 = lVar25 * 8 + lVar26;
                      lVar47 = local_8c0 * 0x18;
                      *(double *)(lVar105 * 0x38 + lVar38) =
                           (-*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x58 + lVar48)
                           - *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x78 + lVar48)
                           ) * 18.0 +
                           *(double *)(lVar40 + lVar39 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + lVar25 * 8 + lVar26) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar48)) -
                           *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x20 + lVar48))
                           * 4.5;
                      lVar40 = (lVar70 - local_7e0) *
                               CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]);
                      lVar24 = (lVar57 - local_7e8) * 8 +
                               (lVar101 - local_7e4) *
                               CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 8 +
                               lhs_1.smallend.vect._0_8_;
                      *(double *)(lVar105 * 0x40 + lVar38) =
                           (*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x30 + lVar48)
                            + *(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x48 + lVar48) +
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x58 + lVar48)
                           + *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x78 + lVar48)
                           ) * 9.0 + *(double *)(lVar24 + lVar40 * 8) * 0.5625 +
                                     (*(double *)
                                       ((long)interp_from_pmm_to.fsten + lVar25 * 8 + lVar26) +
                                      *(double *)
                                       ((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar48) +
                                      *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar48)
                                     + *(double *)
                                        ((long)interp_from_pmm_to.fsten + local_8c0 * 0x20 + lVar48)
                                     ) * 2.25;
                      *(double *)(lVar105 * 0x48 + lVar38) =
                           (((*(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x38 + lVar48) -
                             *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x50 + lVar48)
                             ) - *(double *)
                                  ((long)interp_from_pmm_to.fsten + local_8c0 * 0x68 + lVar48)) +
                           *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x80 + lVar48))
                           * 9.0 + *(double *)(lVar24 + lVar40 * 8) * 0.5625 +
                                   ((-*(double *)
                                       ((long)interp_from_pmm_to.fsten + lVar25 * 8 + lVar26) -
                                    *(double *)
                                     ((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar48)) +
                                    *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar48) +
                                   *(double *)
                                    ((long)interp_from_pmm_to.fsten + local_8c0 * 0x28 + lVar48)) *
                                   2.25;
                      lVar56 = (lVar70 - local_8b0) * local_8c8;
                      lVar39 = (lVar57 - local_8b8) * 8 + (lVar101 - local_8b4) * local_8d0 * 8;
                      lVar26 = lVar56 * 8 + lVar39;
                      lVar25 = local_8c0 * 0x18;
                      lVar47 = local_8c0 * 0x28;
                      lVar81 = local_8c0 * 0x80;
                      *(double *)(lVar105 * 0x50 + lVar38) =
                           (*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x68 + lVar26)
                           - *(double *)((long)interp_from_pmm_to.fsten + lVar81 + lVar26)) * 18.0 +
                           *(double *)(lVar24 + lVar40 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar26) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar56 * 8 + lVar39)) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar26)) * 4.5;
                      lVar48 = (lVar70 - local_7e0) *
                               CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]);
                      lVar40 = (lVar101 - local_7e4) *
                               CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 8 +
                               lhs_1.smallend.vect._0_8_ + (lVar57 - local_7e8) * 8;
                      *(double *)(lVar105 * 0x58 + lVar38) =
                           (((*(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x50 + lVar26) -
                             *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x38 + lVar26)
                             ) - *(double *)
                                  ((long)interp_from_pmm_to.fsten + local_8c0 * 0x68 + lVar26)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar81 + lVar26)) * 9.0 +
                           *(double *)(lVar40 + lVar48 * 8) * 0.5625 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar26)
                            - *(double *)((long)interp_from_pmm_to.fsten + lVar56 * 8 + lVar39)) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar26) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar26)) * 2.25;
                      *(double *)(lVar105 * 0x60 + lVar38) =
                           (*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x50 + lVar26)
                           - *(double *)((long)interp_from_pmm_to.fsten + lVar81 + lVar26)) * 18.0 +
                           *(double *)(lVar40 + lVar48 * 8) * 1.125 +
                           ((-*(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar26) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar26)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar26)) * 4.5;
                      *(double *)(lVar105 * 0x68 + lVar38) =
                           *(double *)((long)interp_from_pmm_to.fsten + lVar81 + lVar26) * 36.0 +
                           *(double *)(lVar40 + lVar48 * 8) * 2.25 +
                           (-*(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar26) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar26)) * 9.0;
                      lVar56 = (lVar70 - local_8b0) * local_8c8;
                      lVar39 = (lVar57 - local_8b8) * 8 + (lVar101 - local_8b4) * local_8d0 * 8;
                      lVar26 = lVar56 * 8 + lVar39;
                      lVar47 = local_8c0 * 0x18;
                      lVar25 = local_8c0 * 0x28;
                      lVar81 = local_8c0 * 0x80;
                      *(double *)(lVar105 * 0x70 + lVar38) =
                           (-*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x50 + lVar26)
                           - *(double *)((long)interp_from_pmm_to.fsten + lVar81 + lVar26)) * 18.0 +
                           *(double *)(lVar40 + lVar48 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar26)
                            - *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar26)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar26)) * 4.5;
                      lVar24 = (lVar70 - local_7e0) *
                               CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]);
                      lVar40 = (lVar101 - local_7e4) *
                               CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 8 +
                               lhs_1.smallend.vect._0_8_ + (lVar57 - local_7e8) * 8;
                      *(double *)(lVar105 * 0x78 + lVar38) =
                           ((-*(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x38 + lVar26) -
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x50 + lVar26))
                            + *(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x68 + lVar26) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar81 + lVar26)) * 9.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 0.5625 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + lVar56 * 8 + lVar39) -
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar26))
                            + *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar26) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar26)) * 2.25;
                      *(double *)(lVar105 * 0x80 + lVar38) =
                           (-*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x68 + lVar26)
                           - *(double *)((long)interp_from_pmm_to.fsten + lVar81 + lVar26)) * 18.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + lVar56 * 8 + lVar39) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar26)) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar26)) * 4.5;
                      lVar25 = (lVar70 - local_8b0) * local_8c8;
                      lVar39 = (lVar57 - local_8b8) * 8 + (lVar101 - local_8b4) * local_8d0 * 8;
                      lVar26 = lVar25 * 8 + lVar39;
                      lVar48 = local_8c0 * 0x28;
                      *(double *)(lVar105 * 0x88 + lVar38) =
                           (*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x38 + lVar26)
                            + *(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x50 + lVar26) +
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x68 + lVar26)
                           + *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x80 + lVar26)
                           ) * 9.0 + *(double *)(lVar40 + lVar24 * 8) * 0.5625 +
                                     (*(double *)
                                       ((long)interp_from_pmm_to.fsten + lVar25 * 8 + lVar39) +
                                      *(double *)
                                       ((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar26)
                                      + *(double *)
                                         ((long)interp_from_pmm_to.fsten + local_8c0 * 0x18 + lVar26
                                         ) + *(double *)
                                              ((long)interp_from_pmm_to.fsten + lVar48 + lVar26)) *
                                     2.25;
                      lVar24 = (lVar70 - local_7e0) *
                               CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]);
                      lVar40 = (lVar101 - local_7e4) *
                               CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 8 +
                               lhs_1.smallend.vect._0_8_ + (lVar57 - local_7e8) * 8;
                      *(double *)(lVar105 * 0x90 + lVar38) =
                           (((*(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x40 + lVar26) -
                             *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x60 + lVar26)
                             ) - *(double *)
                                  ((long)interp_from_pmm_to.fsten + local_8c0 * 0x70 + lVar26)) +
                           *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x88 + lVar26))
                           * 9.0 + *(double *)(lVar40 + lVar24 * 8) * 0.5625 +
                                   ((-*(double *)
                                       ((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar26) -
                                    *(double *)
                                     ((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar26)) +
                                    *(double *)
                                     ((long)interp_from_pmm_to.fsten + local_8c0 * 0x20 + lVar26) +
                                   *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar26)) *
                                   2.25;
                      lVar39 = (lVar70 - local_8b0) * local_8c8 * 8 +
                               (lVar57 - local_8b8) * 8 + (lVar101 - local_8b4) * local_8d0 * 8;
                      *(double *)(lVar105 * 0x98 + lVar38) =
                           (*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x70 + lVar39)
                           - *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x88 + lVar39)
                           ) * 18.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x20 + lVar39)
                            - *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar39))
                           - *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar39)) * 4.5;
                      lVar26 = local_8c0 * 0x10;
                      lVar48 = local_8c0 * 0x28;
                      lVar25 = local_8c0 * 0x60;
                      lVar47 = local_8c0 * 0x88;
                      lVar56 = local_8c0 * 0x20;
                      *(double *)(lVar105 * 0xa0 + lVar38) =
                           (((*(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar39) -
                             *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x40 + lVar39)
                             ) - *(double *)
                                  ((long)interp_from_pmm_to.fsten + local_8c0 * 0x70 + lVar39)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar39)) * 9.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 0.5625 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + lVar26 + lVar39) -
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar39)) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar39) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar39)) * 2.25;
                      lVar24 = (lVar70 - local_7e0) *
                               CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]);
                      lVar40 = (lVar101 - local_7e4) *
                               CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 8 +
                               lhs_1.smallend.vect._0_8_ + (lVar57 - local_7e8) * 8;
                      *(double *)(lVar105 * 0xa8 + lVar38) =
                           (*(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar39) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar39)) * 18.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 1.125 +
                           ((-*(double *)((long)interp_from_pmm_to.fsten + lVar26 + lVar39) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar39)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar39)) * 4.5;
                      lVar39 = (lVar70 - local_8b0) * local_8c8 * 8 +
                               (lVar57 - local_8b8) * 8 + (lVar101 - local_8b4) * local_8d0 * 8;
                      *(double *)(lVar105 * 0xb0 + lVar38) =
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar39) * 36.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 2.25 +
                           (-*(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar39) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar39)) * 9.0;
                      *(double *)(lVar105 * 0xb8 + lVar38) =
                           (-*(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar39) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar39)) * 18.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + lVar26 + lVar39) -
                            *(double *)((long)interp_from_pmm_to.fsten + lVar56 + lVar39)) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar39)) * 4.5;
                      lVar48 = local_8c0 * 0x20;
                      lVar47 = local_8c0 * 0x28;
                      lVar26 = local_8c0 * 0x70;
                      lVar25 = local_8c0 * 0x88;
                      *(double *)(lVar105 * 0xc0 + lVar38) =
                           ((-*(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x40 + lVar39) -
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x60 + lVar39))
                            + *(double *)((long)interp_from_pmm_to.fsten + lVar26 + lVar39) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar39)) * 9.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 0.5625 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar39) -
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar39))
                            + *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar39) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar39)) * 2.25;
                      lVar40 = (lVar101 - local_7e4) *
                               CONCAT44(lhs_1.bigend.vect[0],lhs_1.smallend.vect[2]) * 8 +
                               lhs_1.smallend.vect._0_8_ + (lVar57 - local_7e8) * 8;
                      lVar39 = (lVar70 - local_8b0) * local_8c8 * 8 +
                               (lVar57 - local_8b8) * 8 + (lVar101 - local_8b4) * local_8d0 * 8;
                      lVar24 = (lVar70 - local_7e0) *
                               CONCAT44(lhs_1.bigend.vect[2],lhs_1.bigend.vect[1]);
                      *(double *)(lVar105 * 200 + lVar38) =
                           (-*(double *)((long)interp_from_pmm_to.fsten + lVar26 + lVar39) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar39)) * 18.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 1.125 +
                           ((*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar39) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar39)) -
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar39)) * 4.5;
                      *(double *)(lVar105 * 0xd0 + lVar38) =
                           (*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x40 + lVar39)
                            + *(double *)
                               ((long)interp_from_pmm_to.fsten + local_8c0 * 0x60 + lVar39) +
                            *(double *)((long)interp_from_pmm_to.fsten + lVar26 + lVar39) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar25 + lVar39)) * 9.0 +
                           *(double *)(lVar40 + lVar24 * 8) * 0.5625 +
                           (*(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 8 + lVar39) +
                            *(double *)((long)interp_from_pmm_to.fsten + local_8c0 * 0x10 + lVar39)
                            + *(double *)((long)interp_from_pmm_to.fsten + lVar48 + lVar39) +
                           *(double *)((long)interp_from_pmm_to.fsten + lVar47 + lVar39)) * 2.25;
                    }
                    dVar113 = *(double *)
                               (lVar103 + (lVar70 - iVar68) * lVar35 * 8 +
                                (lVar101 - iVar3) * lVar21 * 8 + (lVar57 - iVar83) * 8);
                  }
                  else {
                    while (bVar14 = lVar38 != 0, lVar38 = lVar38 + -1, bVar14) {
                      *puVar23 = 0;
                      puVar23 = (undefined8 *)((long)puVar23 + lVar65);
                    }
                    dVar113 = 0.0;
                  }
                  pdVar12[(lVar70 - lVar86) * lVar84 +
                          (lVar101 - lVar69) * lVar46 + (lVar57 - lVar45)] = dVar113;
                  puVar85 = puVar85 + 1;
                }
                local_d78 = local_d78 + lVar36;
              }
              local_968 = local_968 + lVar64;
            }
            lVar108 = (long)(int)interp_from_mmp_to.fsten;
            lVar89 = (long)interp_from_mmp_to.fsten._4_4_;
            lVar41 = (long)iVar31;
            lVar104 = ((lVar55 * 0x58 + lVar41 * 8 + lVar61 * -8 + -8) * lVar63 + lVar89 * 8 +
                      lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar37 = ((lVar55 * 0xa0 + lVar41 * 8 + lVar61 * -8 + -8) * lVar63 + lVar89 * 8 +
                     lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar107 = lVar55 * 0x20 + lVar41 * 8 + lVar61 * -8;
            lVar65 = ((lVar107 + -8) * lVar63 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 +
                     lVar100 * -8 + lVar43;
            lVar70 = ((lVar41 + lVar55) * 8 + lVar61 * -8 + -8) * lVar63;
            lVar105 = (lVar70 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                      lVar43;
            local_b58 = ((lVar55 * 0xb8 + lVar41 * 8 + lVar61 * -8 + -8) * lVar63 + lVar89 * 8 +
                        lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar66 = lVar55 * 0x18 + lVar41 * 8 + lVar61 * -8;
            local_6a8 = ((lVar66 + -8) * lVar63 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 +
                        lVar100 * -8 + lVar43;
            lVar35 = (lVar55 * 0x70 + lVar41 * 8 + lVar61 * -8 + -8) * lVar63 + lVar89 * 8 +
                     lVar96 * -8;
            local_590 = lVar35 * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar101 = (lVar55 * 0x48 + lVar41 * 8 + lVar61 * -8) * lVar63;
            local_598 = (element_type *)
                        ((lVar101 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8
                        + lVar43);
            lVar27 = (lVar55 * 0x90 + lVar41 * 8 + lVar61 * -8) * lVar63;
            local_5a0 = (lVar27 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                        lVar43;
            lVar57 = (lVar55 * 0xb0 + lVar41 * 8 + lVar61 * -8) * lVar63;
            local_5a8 = (element_type *)
                        ((lVar57 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                        lVar43);
            lVar38 = (lVar55 * 0x68 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar21 = lVar38 + lVar89 * 8 + lVar96 * -8;
            local_5b0 = lVar21 * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar107 = lVar107 * lVar63;
            local_7c0 = (lVar107 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                        lVar43;
            lVar103 = lVar89 * 8;
            lVar49 = (lVar103 + (lVar41 - lVar61) * lVar63 * 8 + lVar96 * -8) * lVar36;
            local_5b8 = lVar49 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar50 = (lVar55 * 0x50 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar92 = lVar50 + lVar89 * 8 + lVar96 * -8;
            local_5c0 = lVar92 * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar71 = (lVar55 * 0x98 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar72 = (lVar71 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                     lVar43;
            lVar73 = (lVar55 * 8 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar74 = (lVar73 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                     lVar43;
            lVar75 = (lVar55 * 0xa8 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar76 = (lVar75 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                     lVar43;
            lVar66 = lVar66 * lVar63;
            local_5c8 = (lVar89 * 8 + lVar66 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                        lVar43;
            lVar77 = (lVar55 * 0x60 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar99 = lVar77 + lVar89 * 8 + lVar96 * -8;
            local_2a0 = lVar99 * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            local_2a8 = ((lVar55 * 0xd0 + lVar41 * 8 + lVar61 * -8 + -8) * lVar63 + lVar89 * 8 +
                         lVar96 * -8 + -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar67 = lVar55 * 0x28 + lVar41 * 8 + lVar61 * -8;
            local_2b0 = ((lVar67 + -8) * lVar63 + lVar89 * 8 + lVar96 * -8 + -8) * lVar36 +
                        lVar108 * 8 + lVar100 * -8 + lVar43;
            local_2b8 = (lVar35 + -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar56 = (lVar55 * 0x10 + lVar41 * 8 + lVar61 * -8) * lVar63;
            local_2c0 = (lVar56 + lVar89 * 8 + lVar96 * -8 + -8) * lVar36 + lVar108 * 8 +
                        lVar100 * -8 + lVar43;
            lVar81 = (lVar55 * 0xc0 + lVar41 * 8 + lVar61 * -8) * lVar63;
            local_2c8 = (lVar81 + lVar89 * 8 + lVar96 * -8 + -8) * lVar36 + lVar108 * 8 +
                        lVar100 * -8 + lVar43;
            local_2d0 = (lVar21 + -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            local_2d8 = (lVar92 + -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            lVar40 = (lVar55 * 200 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar39 = (lVar40 + lVar89 * 8 + lVar96 * -8 + -8) * lVar36 + lVar108 * 8 + lVar100 * -8
                     + lVar43;
            lVar67 = lVar67 * lVar63;
            local_2e0 = (lVar89 * 8 + lVar67 + lVar96 * -8 + -8) * lVar36 + lVar108 * 8 +
                        lVar100 * -8 + lVar43;
            local_2e8 = (lVar99 + -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43;
            local_2f0 = ((lVar55 * 0x88 + lVar41 * 8 + lVar61 * -8 + -8) * lVar63 + lVar89 * 8 +
                        lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43 + -8;
            lVar51 = lVar55 * 0x38 + lVar41 * 8 + lVar61 * -8;
            local_2f8 = ((lVar51 + -8) * lVar63 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 +
                        lVar100 * -8 + lVar43 + -8;
            lVar26 = (lVar55 * 0x30 + lVar41 * 8 + lVar61 * -8) * lVar63;
            local_300 = (lVar26 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                        lVar43 + -8;
            lVar48 = (lVar55 * 0x78 + lVar41 * 8 + lVar61 * -8) * lVar63;
            local_308 = (lVar48 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                        lVar43 + -8;
            lVar24 = (lVar55 * 0x80 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar21 = lVar24 + lVar89 * 8 + lVar96 * -8;
            local_310 = lVar21 * lVar36 + lVar108 * 8 + lVar100 * -8 + lVar43 + -8;
            lVar51 = lVar51 * lVar63;
            local_318 = (lVar51 + lVar89 * 8 + lVar96 * -8) * lVar36 + lVar108 * 8 + lVar100 * -8 +
                        lVar43 + -8;
            lVar58 = lVar43 + (lVar21 + -8) * lVar36 + lVar108 * 8 + lVar100 * -8 + -8;
            lVar25 = (lVar55 * 0x40 + lVar41 * 8 + lVar61 * -8) * lVar63;
            lVar82 = lVar43 + (lVar25 + lVar89 * 8 + lVar96 * -8 + -8) * lVar36 + lVar108 * 8 +
                              lVar100 * -8 + -8;
            lVar88 = ((lVar41 - lVar86) + -1) * lVar80;
            lVar35 = lVar103 + lVar88 * 8 + lVar69 * -8;
            lVar106 = lVar35 * lVar46 + lVar108 * 8 + lVar45 * -8 + (long)pdVar12;
            lVar99 = lVar84 * 8;
            lVar21 = lVar103 + (lVar41 - lVar86) * lVar80 * 8 + lVar69 * -8;
            lVar78 = lVar21 * lVar46;
            lVar97 = lVar78 + lVar108 * 8 + lVar45 * -8 + (long)pdVar12;
            lVar93 = (lVar21 + -8) * lVar46;
            lVar90 = lVar93 + lVar108 * 8 + lVar45 * -8 + (long)pdVar12;
            lVar47 = (lVar35 + -8) * lVar46 + lVar108 * 8 + lVar45 * -8 + (long)pdVar12;
            lVar21 = lVar41 * 8;
            lVar35 = lVar108 * 8;
            lVar92 = lVar46 * 8;
            local_ab8 = lVar41;
            while( true ) {
              local_d98 = local_318;
              local_d80 = local_310;
              local_f48 = local_308;
              local_ea8 = local_300;
              local_e78 = local_2f8;
              local_e28 = local_2f0;
              local_c68 = local_2e8;
              local_e58 = local_2e0;
              local_d78 = (undefined8 *)local_2d8;
              local_d18 = local_2d0;
              local_cd8 = local_2c8;
              local_d28 = local_2c0;
              local_f68 = local_2b8;
              local_da8 = local_2b0;
              local_d08 = local_2a8;
              local_df8 = local_2a0;
              local_f00 = local_5c8;
              local_cc8 = local_5c0;
              local_c38 = local_5b8;
              local_b98 = local_7c0;
              local_bb8 = local_5b0;
              local_bd8 = local_5a8;
              local_ba8 = local_5a0;
              local_bc8 = local_598;
              local_b48 = local_590;
              local_b38 = local_6a8;
              local_868 = local_b58;
              lVar42 = lVar89;
              lVar91 = lVar97;
              local_f28 = lVar47;
              local_de8 = lVar74;
              local_d88 = lVar82;
              local_d68 = lVar39;
              local_cb8 = lVar58;
              local_c98 = lVar76;
              local_b88 = lVar72;
              local_9a8 = lVar90;
              local_858 = lVar104;
              local_848 = lVar37;
              local_838 = lVar65;
              local_828 = lVar105;
              local_818 = lVar106;
              if (iVar34 < local_ab8) break;
              for (; lVar42 <= iStack_ad8; lVar42 = lVar42 + 1) {
                lVar94 = (long)local_3c0.begin.x;
                lVar52 = (local_ab8 - local_3c0.begin.z) *
                         CONCAT44(local_3c0.kstride._4_4_,(int)local_3c0.kstride);
                lVar109 = (lVar42 - local_3c0.begin.y) *
                          CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride);
                for (lVar95 = 0; lVar108 + lVar95 <= (long)iStack_adc; lVar95 = lVar95 + 1) {
                  local_3c0.p[lVar108 + ((local_3c0.nstride + lVar52 + lVar109 + lVar95) - lVar94)]
                       = (*(double *)(local_da8 + lVar95 * 8) * dVar110 +
                         *(double *)(local_d08 + lVar95 * 8) * dVar302 +
                         *(double *)(local_f68 + lVar95 * 8) * dVar297) *
                         *(double *)(local_f28 + lVar95 * 8) +
                         (*(double *)(local_b38 + lVar95 * 8) * dVar110 +
                         *(double *)(local_848 + lVar95 * 8) * dVar302 +
                         *(double *)(local_b48 + lVar95 * 8) * dVar297) *
                         *(double *)(local_818 + lVar95 * 8) +
                         (*(double *)(local_f00 + lVar95 * 8) * dVar110 +
                         *(double *)(local_ba8 + lVar95 * 8) * dVar302 +
                         *(double *)(local_df8 + lVar95 * 8) * dVar297) *
                         *(double *)(lVar91 + lVar95 * 8) +
                         (*(double *)(local_e58 + lVar95 * 8) * dVar110 +
                         *(double *)(local_cd8 + lVar95 * 8) * dVar302 +
                         *(double *)(local_c68 + lVar95 * 8) * dVar297) *
                         *(double *)(local_9a8 + lVar95 * 8);
                  local_3c0.p
                  [lVar108 + ((lVar52 + lVar109 + local_3c0.nstride * 2 + lVar95) - lVar94)] =
                       (*(double *)(local_e78 + lVar95 * 8) * dVar110 +
                       *(double *)(local_868 + -8 + lVar95 * 8) * dVar111 +
                       *(double *)(local_e28 + lVar95 * 8) * dVar306) *
                       *(double *)(local_818 + -8 + lVar95 * 8) +
                       (*(double *)(local_828 + lVar95 * 8) * dVar110 +
                       *(double *)(local_868 + lVar95 * 8) * dVar111 +
                       *(double *)(local_858 + lVar95 * 8) * dVar306) *
                       *(double *)(local_818 + lVar95 * 8) +
                       (*(double *)(local_de8 + lVar95 * 8) * dVar110 +
                       *(double *)(local_c98 + lVar95 * 8) * dVar111 +
                       (double)(&(local_bc8->m_lbox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start)[lVar95] * dVar306) *
                       *(double *)(lVar91 + lVar95 * 8) +
                       (*(double *)(local_d98 + lVar95 * 8) * dVar110 +
                       *(double *)(local_c98 + -8 + lVar95 * 8) * dVar111 +
                       *(double *)(local_f48 + lVar95 * 8) * dVar306) *
                       *(double *)(lVar91 + -8 + lVar95 * 8);
                  local_3c0.p
                  [lVar108 + ((lVar52 + lVar109 + local_3c0.nstride * 3 + lVar95) - lVar94)] =
                       (*(double *)(local_d88 + lVar95 * 8) * dVar295 +
                       *(double *)(local_d68 + -8 + lVar95 * 8) * dVar111 +
                       *(double *)(local_cb8 + lVar95 * 8) * dVar297) *
                       *(double *)(local_9a8 + -8 + lVar95 * 8) +
                       (*(double *)(local_d28 + lVar95 * 8) * dVar295 +
                       *(double *)(local_d68 + lVar95 * 8) * dVar111 +
                       *(double *)((long)local_d78 + lVar95 * 8) * dVar297) *
                       *(double *)(local_9a8 + lVar95 * 8) +
                       (*(double *)(local_c38 + lVar95 * 8) * dVar295 +
                       *(double *)(local_b88 + lVar95 * 8) * dVar111 +
                       *(double *)(local_cc8 + lVar95 * 8) * dVar297) *
                       *(double *)(lVar91 + lVar95 * 8) +
                       (*(double *)(local_ea8 + lVar95 * 8) * dVar295 +
                       *(double *)(local_b88 + -8 + lVar95 * 8) * dVar111 +
                       *(double *)(local_d80 + lVar95 * 8) * dVar297) *
                       *(double *)(lVar91 + -8 + lVar95 * 8);
                  local_3c0.p
                  [lVar108 + ((lVar52 + lVar109 + local_3c0.nstride * 4 + lVar95) - lVar94)] =
                       (*(double *)(local_b98 + lVar95 * 8) * dVar296 +
                       *(double *)(local_c98 + lVar95 * 8) * dVar305 +
                       *(double *)(local_df8 + lVar95 * 8) * dVar304) *
                       *(double *)(lVar91 + lVar95 * 8) +
                       (*(double *)(local_838 + lVar95 * 8) * dVar296 +
                       *(double *)(local_868 + lVar95 * 8) * dVar305 +
                       *(double *)(local_b48 + lVar95 * 8) * dVar304) *
                       *(double *)(local_818 + lVar95 * 8);
                  local_3c0.p
                  [lVar108 + ((lVar52 + lVar109 + local_3c0.nstride * 5 + lVar95) - lVar94)] =
                       (*(double *)(local_f00 + lVar95 * 8) * dVar301 +
                       *(double *)(local_b88 + lVar95 * 8) * dVar305 +
                       *(double *)(local_bb8 + lVar95 * 8) * dVar7) *
                       *(double *)(lVar91 + lVar95 * 8) +
                       (*(double *)(local_e58 + lVar95 * 8) * dVar301 +
                       *(double *)(local_d68 + lVar95 * 8) * dVar305 +
                       *(double *)(local_d18 + lVar95 * 8) * dVar7) *
                       *(double *)(local_9a8 + lVar95 * 8);
                  local_3c0.p
                  [lVar108 + ((lVar52 + lVar109 + local_3c0.nstride * 6 + lVar95) - lVar94)] =
                       (*(double *)(local_de8 + lVar95 * 8) * dVar301 +
                       *(double *)((long)(&(local_bd8->bbox).smallend + -2) + lVar95 * 8) * dVar8 +
                       *(double *)(local_cc8 + lVar95 * 8) * dVar304) *
                       *(double *)(lVar91 + lVar95 * 8) +
                       (*(double *)(local_d98 + lVar95 * 8) * dVar301 +
                       *(double *)((local_bd8->bbox).smallend.vect + lVar95 * 2 + -8) * dVar8 +
                       *(double *)(local_d80 + lVar95 * 8) * dVar304) *
                       *(double *)(lVar91 + -8 + lVar95 * 8);
                  local_3c0.p
                  [lVar108 + ((lVar52 + lVar109 + local_3c0.nstride * 7 + lVar95) - lVar94)] =
                       (*(double *)(local_b98 + lVar95 * 8) * dVar300 +
                       *(double *)((long)(&(local_bd8->bbox).smallend + -2) + lVar95 * 8) * dVar298
                       + *(double *)(local_bb8 + lVar95 * 8) * dVar299) *
                       *(double *)(lVar91 + lVar95 * 8);
                }
                local_858 = local_858 + lVar54;
                local_848 = local_848 + lVar54;
                local_838 = local_838 + lVar54;
                local_828 = local_828 + lVar54;
                local_868 = local_868 + lVar54;
                local_b38 = local_b38 + lVar54;
                local_b48 = local_b48 + lVar54;
                local_bc8 = (element_type *)
                            (&(local_bc8->m_lbox).
                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar36);
                local_ba8 = local_ba8 + lVar54;
                local_bd8 = (element_type *)((long)(&(local_bd8->bbox).smallend + -2) + lVar54);
                local_bb8 = local_bb8 + lVar54;
                local_b98 = local_b98 + lVar54;
                local_c38 = local_c38 + lVar54;
                local_cc8 = local_cc8 + lVar54;
                local_b88 = local_b88 + lVar54;
                local_de8 = local_de8 + lVar54;
                local_c98 = local_c98 + lVar54;
                local_f00 = local_f00 + lVar54;
                local_df8 = local_df8 + lVar54;
                local_d08 = local_d08 + lVar54;
                local_da8 = local_da8 + lVar54;
                local_f68 = local_f68 + lVar54;
                local_d28 = local_d28 + lVar54;
                local_cd8 = local_cd8 + lVar54;
                local_d18 = local_d18 + lVar54;
                local_d78 = (undefined8 *)((long)local_d78 + lVar54);
                local_d68 = local_d68 + lVar54;
                local_e58 = local_e58 + lVar54;
                local_c68 = local_c68 + lVar54;
                local_e28 = local_e28 + lVar54;
                local_e78 = local_e78 + lVar54;
                local_ea8 = local_ea8 + lVar54;
                local_f48 = local_f48 + lVar54;
                local_d80 = local_d80 + lVar54;
                local_d98 = local_d98 + lVar54;
                local_cb8 = local_cb8 + lVar54;
                local_d88 = local_d88 + lVar54;
                local_818 = local_818 + lVar92;
                lVar91 = lVar91 + lVar92;
                local_9a8 = local_9a8 + lVar92;
                local_f28 = local_f28 + lVar92;
              }
              local_ab8 = local_ab8 + 1;
              lVar104 = lVar104 + lVar53;
              lVar37 = lVar37 + lVar53;
              lVar65 = lVar65 + lVar53;
              lVar105 = lVar105 + lVar53;
              local_b58 = local_b58 + lVar53;
              local_6a8 = local_6a8 + lVar53;
              local_590 = local_590 + lVar53;
              local_598 = (element_type *)
                          (&(local_598->m_lbox).
                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar64);
              local_5a0 = local_5a0 + lVar53;
              local_5a8 = (element_type *)((long)(&(local_5a8->bbox).smallend + -2) + lVar53);
              local_5b0 = local_5b0 + lVar53;
              local_7c0 = local_7c0 + lVar53;
              local_5b8 = local_5b8 + lVar53;
              local_5c0 = local_5c0 + lVar53;
              lVar72 = lVar72 + lVar53;
              lVar74 = lVar74 + lVar53;
              lVar76 = lVar76 + lVar53;
              local_5c8 = local_5c8 + lVar53;
              local_2a0 = local_2a0 + lVar53;
              local_2a8 = local_2a8 + lVar53;
              local_2b0 = local_2b0 + lVar53;
              local_2b8 = local_2b8 + lVar53;
              local_2c0 = local_2c0 + lVar53;
              local_2c8 = local_2c8 + lVar53;
              local_2d0 = local_2d0 + lVar53;
              local_2d8 = local_2d8 + lVar53;
              lVar39 = lVar39 + lVar53;
              local_2e0 = local_2e0 + lVar53;
              local_2e8 = local_2e8 + lVar53;
              local_2f0 = local_2f0 + lVar53;
              local_2f8 = local_2f8 + lVar53;
              local_300 = local_300 + lVar53;
              local_308 = local_308 + lVar53;
              local_310 = local_310 + lVar53;
              local_318 = local_318 + lVar53;
              lVar58 = lVar58 + lVar53;
              lVar82 = lVar82 + lVar53;
              lVar106 = lVar106 + lVar99;
              lVar97 = lVar97 + lVar99;
              lVar90 = lVar90 + lVar99;
              lVar47 = lVar47 + lVar99;
            }
            if (CONCAT44(ns_starr.p._4_4_,(int)ns_starr.p) != 0) {
              lVar104 = (long)lhs.smallend.vect[2];
              puVar85 = (undefined8 *)
                        (((long)lhs.smallend.vect[1] * 8 + (lVar104 - lVar86) * lVar80 * 8 +
                         lVar69 * -8) * lVar46 + (long)lhs.smallend.vect[0] * 8 + lVar45 * -8 +
                        (long)pdVar12);
              for (; puVar23 = puVar85, lVar80 = (long)lhs.smallend.vect[1],
                  lVar104 <= lhs.bigend.vect[2]; lVar104 = lVar104 + 1) {
                for (; puVar59 = puVar23, lVar86 = (long)lhs.smallend.vect[0],
                    lVar80 <= lhs.bigend.vect[1]; lVar80 = lVar80 + 1) {
                  for (; lVar86 <= lhs.bigend.vect[0]; lVar86 = lVar86 + 1) {
                    *puVar59 = 0x3ff0000000000000;
                    puVar59 = puVar59 + 1;
                  }
                  puVar23 = puVar23 + lVar46;
                }
                puVar85 = puVar85 + lVar84;
              }
              lVar37 = (lVar55 * 0x70 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 + lVar96 * -8;
              lVar84 = lVar38 + lVar103 + lVar96 * -8;
              lVar80 = lVar50 + lVar103 + lVar96 * -8;
              lVar86 = lVar77 + lVar103 + lVar96 * -8;
              lVar65 = lVar24 + lVar103 + lVar96 * -8;
              local_6b8 = ((lVar55 * 0x58 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                          lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_6c0 = ((lVar55 * 0xa0 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                          lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_990 = ((lVar55 * 0x20 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                          lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_a20 = (lVar70 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43
              ;
              local_a28 = ((lVar55 * 0xb8 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                          lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_a30 = ((lVar55 * 0x18 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                          lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_8e8 = (element_type *)(lVar37 * lVar36 + lVar35 + lVar100 * -8 + lVar43);
              local_a40 = (lVar101 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 +
                          lVar43;
              local_998 = (element_type *)
                          ((lVar27 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 +
                          lVar43);
              local_a48 = (lVar57 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43
              ;
              local_b58 = lVar84 * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              lVar107 = (lVar107 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_5d0 = lVar49 + lVar35 + lVar100 * -8 + lVar43;
              local_ab8 = lVar80 * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              lVar105 = (lVar71 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_a58 = (lVar73 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43
              ;
              local_a60 = (lVar75 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43
              ;
              lVar70 = (lVar66 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              lVar104 = lVar86 * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_a68 = ((lVar55 * 0xd0 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                           lVar96 * -8 + -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_a70 = ((lVar55 * 0x28 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                           lVar96 * -8 + -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              lVar101 = (lVar37 + -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_a80 = (lVar56 + lVar103 + lVar96 * -8 + -8) * lVar36 + lVar35 + lVar100 * -8 +
                          lVar43;
              local_a88 = (lVar81 + lVar103 + lVar96 * -8 + -8) * lVar36 + lVar35 + lVar100 * -8 +
                          lVar43;
              lVar84 = (lVar84 + -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              lVar37 = (lVar80 + -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              local_a90 = (lVar40 + lVar103 + lVar96 * -8 + -8) * lVar36 + lVar35 + lVar100 * -8 +
                          lVar43;
              local_a78 = (lVar67 + lVar103 + lVar96 * -8 + -8) * lVar36 + lVar35 + lVar100 * -8 +
                          lVar43;
              local_5d8 = (lVar86 + -8) * lVar36 + lVar35 + lVar100 * -8 + lVar43;
              lVar80 = lVar43 + ((lVar55 * 0x88 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                                lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8 + -8;
              local_768 = lVar43 + -8 +
                          ((lVar55 * 0x38 + lVar21 + lVar61 * -8 + -8) * lVar63 + lVar103 +
                          lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8;
              local_778 = lVar43 + -8 +
                          (lVar26 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8;
              local_758 = lVar43 + -8 +
                          (lVar48 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8;
              local_498 = lVar43 + -8 + lVar65 * lVar36 + lVar35 + lVar100 * -8;
              local_4a8 = lVar43 + -8 +
                          (lVar51 + lVar103 + lVar96 * -8) * lVar36 + lVar35 + lVar100 * -8;
              local_4b8 = lVar43 + -8 + (lVar65 + -8) * lVar36 + lVar35 + lVar100 * -8;
              local_4c8 = lVar43 + (lVar25 + lVar103 + lVar96 * -8 + -8) * lVar36 + lVar35 +
                                   lVar100 * -8 + -8;
              lVar43 = lVar88 * 8 + lVar103 + lVar69 * -8;
              lVar103 = CONCAT44(ns_starr.p._4_4_,(int)ns_starr.p) + lVar35;
              local_af8 = lVar43 * lVar46 + lVar35 + lVar45 * -8 + (long)pdVar12;
              lVar96 = lVar78 + lVar35 + lVar45 * -8 + (long)pdVar12;
              lVar21 = lVar93 + lVar35 + lVar45 * -8 + (long)pdVar12;
              lVar35 = (lVar43 + -8) * lVar46 + lVar35 + lVar45 * -8 + (long)pdVar12;
              for (; lVar41 <= iVar34; lVar41 = lVar41 + 1) {
                local_9a8 = local_af8;
                local_d88 = local_4c8;
                local_cb8 = local_4b8;
                local_d98 = local_4a8;
                local_d80 = local_498;
                local_f48 = local_758;
                local_ea8 = local_778;
                local_e78 = local_768;
                local_c68 = local_5d8;
                local_e58 = local_a78;
                local_d68 = local_a90;
                local_cd8 = local_a88;
                local_d28 = local_a80;
                local_da8 = local_a70;
                local_d08 = local_a68;
                local_c98 = local_a60;
                local_de8 = local_a58;
                local_c38 = local_ab8;
                local_b88 = local_5d0;
                local_ba8 = local_b58;
                local_bb8 = local_a48;
                local_bc8 = local_998;
                local_b38 = local_a40;
                local_bd8 = local_8e8;
                local_818 = local_a30;
                local_828 = local_a28;
                local_838 = local_a20;
                local_848 = local_990;
                local_858 = local_6c0;
                local_868 = local_6b8;
                lVar43 = lVar96;
                local_f68 = lVar101;
                local_f28 = lVar35;
                local_f00 = lVar70;
                local_e28 = lVar80;
                local_df8 = lVar104;
                local_d78 = (undefined8 *)lVar37;
                local_d18 = lVar84;
                local_cc8 = lVar105;
                local_b98 = lVar107;
                local_b48 = lVar21;
                for (lVar61 = lVar89; lVar61 <= iStack_ad8; lVar61 = lVar61 + 1) {
                  lVar45 = (long)ns_starr.begin.x;
                  lVar86 = (lVar61 - ns_starr.begin.y) *
                           CONCAT44(ns_starr.jstride._4_4_,(int)ns_starr.jstride) * 8 +
                           (lVar41 - ns_starr.begin.z) *
                           CONCAT44(ns_starr.kstride._4_4_,(int)ns_starr.kstride) * 8;
                  for (lVar46 = 0; lVar108 + lVar46 <= (long)iStack_adc; lVar46 = lVar46 + 1) {
                    *(double *)(lVar86 + ns_starr.nstride * 8 + lVar45 * -8 + lVar103 + lVar46 * 8)
                         = (*(double *)(local_da8 + lVar46 * 8) * dVar110 +
                           *(double *)(local_d08 + lVar46 * 8) * dVar302 +
                           *(double *)(local_f68 + lVar46 * 8) * dVar297) *
                           *(double *)(local_f28 + lVar46 * 8) +
                           (*(double *)(local_818 + lVar46 * 8) * dVar110 +
                           *(double *)(local_858 + lVar46 * 8) * dVar302 +
                           *(double *)((long)(&(local_bd8->bbox).smallend + -2) + lVar46 * 8) *
                           dVar297) * *(double *)(local_9a8 + lVar46 * 8) +
                           (*(double *)(local_f00 + lVar46 * 8) * dVar110 +
                           (double)(&(local_bc8->m_lbox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_start)[lVar46] * dVar302 +
                           *(double *)(local_df8 + lVar46 * 8) * dVar297) *
                           *(double *)(lVar43 + lVar46 * 8) +
                           (*(double *)(local_e58 + lVar46 * 8) * dVar110 +
                           *(double *)(local_cd8 + lVar46 * 8) * dVar302 +
                           *(double *)(local_c68 + lVar46 * 8) * dVar297) *
                           *(double *)(local_b48 + lVar46 * 8);
                    *(double *)
                     (ns_starr.nstride * 0x10 + lVar86 + lVar45 * -8 + lVar103 + lVar46 * 8) =
                         (*(double *)(local_e78 + lVar46 * 8) * dVar110 +
                         *(double *)(local_828 + -8 + lVar46 * 8) * dVar111 +
                         *(double *)(local_e28 + lVar46 * 8) * dVar306) *
                         *(double *)(local_9a8 + -8 + lVar46 * 8) +
                         (*(double *)(local_838 + lVar46 * 8) * dVar110 +
                         *(double *)(local_828 + lVar46 * 8) * dVar111 +
                         *(double *)(local_868 + lVar46 * 8) * dVar306) *
                         *(double *)(local_9a8 + lVar46 * 8) +
                         (*(double *)(local_de8 + lVar46 * 8) * dVar110 +
                         *(double *)(local_c98 + lVar46 * 8) * dVar111 +
                         *(double *)(local_b38 + lVar46 * 8) * dVar306) *
                         *(double *)(lVar43 + lVar46 * 8) +
                         (*(double *)(local_d98 + lVar46 * 8) * dVar110 +
                         *(double *)(local_c98 + -8 + lVar46 * 8) * dVar111 +
                         *(double *)(local_f48 + lVar46 * 8) * dVar306) *
                         *(double *)(lVar43 + -8 + lVar46 * 8);
                    *(double *)
                     (ns_starr.nstride * 0x18 + lVar86 + lVar45 * -8 + lVar103 + lVar46 * 8) =
                         (*(double *)(local_d88 + lVar46 * 8) * dVar295 +
                         *(double *)(local_d68 + -8 + lVar46 * 8) * dVar111 +
                         *(double *)(local_cb8 + lVar46 * 8) * dVar297) *
                         *(double *)(local_b48 + -8 + lVar46 * 8) +
                         (*(double *)(local_d28 + lVar46 * 8) * dVar295 +
                         *(double *)(local_d68 + lVar46 * 8) * dVar111 +
                         *(double *)((long)local_d78 + lVar46 * 8) * dVar297) *
                         *(double *)(local_b48 + lVar46 * 8) +
                         (*(double *)(local_b88 + lVar46 * 8) * dVar295 +
                         *(double *)(local_cc8 + lVar46 * 8) * dVar111 +
                         *(double *)(local_c38 + lVar46 * 8) * dVar297) *
                         *(double *)(lVar43 + lVar46 * 8) +
                         (*(double *)(local_ea8 + lVar46 * 8) * dVar295 +
                         *(double *)(local_cc8 + -8 + lVar46 * 8) * dVar111 +
                         *(double *)(local_d80 + lVar46 * 8) * dVar297) *
                         *(double *)(lVar43 + -8 + lVar46 * 8);
                    *(double *)
                     (ns_starr.nstride * 0x20 + lVar86 + lVar45 * -8 + lVar103 + lVar46 * 8) =
                         (*(double *)(local_b98 + lVar46 * 8) * dVar296 +
                         *(double *)(local_c98 + lVar46 * 8) * dVar305 +
                         *(double *)(local_df8 + lVar46 * 8) * dVar304) *
                         *(double *)(lVar43 + lVar46 * 8) +
                         (*(double *)(local_848 + lVar46 * 8) * dVar296 +
                         *(double *)(local_828 + lVar46 * 8) * dVar305 +
                         *(double *)((long)(&(local_bd8->bbox).smallend + -2) + lVar46 * 8) *
                         dVar304) * *(double *)(local_9a8 + lVar46 * 8);
                    *(double *)
                     (ns_starr.nstride * 0x28 + lVar86 + lVar45 * -8 + lVar103 + lVar46 * 8) =
                         (*(double *)(local_f00 + lVar46 * 8) * dVar301 +
                         *(double *)(local_cc8 + lVar46 * 8) * dVar305 +
                         *(double *)(local_ba8 + lVar46 * 8) * dVar7) *
                         *(double *)(lVar43 + lVar46 * 8) +
                         (*(double *)(local_e58 + lVar46 * 8) * dVar301 +
                         *(double *)(local_d68 + lVar46 * 8) * dVar305 +
                         *(double *)(local_d18 + lVar46 * 8) * dVar7) *
                         *(double *)(local_b48 + lVar46 * 8);
                    *(double *)
                     (ns_starr.nstride * 0x30 + lVar86 + lVar45 * -8 + lVar103 + lVar46 * 8) =
                         (*(double *)(local_de8 + lVar46 * 8) * dVar301 +
                         *(double *)(local_bb8 + lVar46 * 8) * dVar8 +
                         *(double *)(local_c38 + lVar46 * 8) * dVar304) *
                         *(double *)(lVar43 + lVar46 * 8) +
                         (*(double *)(local_d98 + lVar46 * 8) * dVar301 +
                         *(double *)(local_bb8 + -8 + lVar46 * 8) * dVar8 +
                         *(double *)(local_d80 + lVar46 * 8) * dVar304) *
                         *(double *)(lVar43 + -8 + lVar46 * 8);
                    *(double *)
                     (ns_starr.nstride * 0x38 + lVar86 + lVar45 * -8 + lVar103 + lVar46 * 8) =
                         (*(double *)(local_b98 + lVar46 * 8) * dVar300 +
                         *(double *)(local_bb8 + lVar46 * 8) * dVar298 +
                         *(double *)(local_ba8 + lVar46 * 8) * dVar299) *
                         *(double *)(lVar43 + lVar46 * 8);
                  }
                  local_868 = local_868 + lVar54;
                  local_858 = local_858 + lVar54;
                  local_848 = local_848 + lVar54;
                  local_838 = local_838 + lVar54;
                  local_828 = local_828 + lVar54;
                  local_818 = local_818 + lVar54;
                  local_bd8 = (element_type *)((long)(&(local_bd8->bbox).smallend + -2) + lVar54);
                  local_b38 = local_b38 + lVar54;
                  local_bc8 = (element_type *)
                              (&(local_bc8->m_lbox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar36);
                  local_bb8 = local_bb8 + lVar54;
                  local_ba8 = local_ba8 + lVar54;
                  local_b98 = local_b98 + lVar54;
                  local_b88 = local_b88 + lVar54;
                  local_c38 = local_c38 + lVar54;
                  local_cc8 = local_cc8 + lVar54;
                  local_de8 = local_de8 + lVar54;
                  local_c98 = local_c98 + lVar54;
                  local_f00 = local_f00 + lVar54;
                  local_df8 = local_df8 + lVar54;
                  local_d08 = local_d08 + lVar54;
                  local_da8 = local_da8 + lVar54;
                  local_f68 = local_f68 + lVar54;
                  local_d28 = local_d28 + lVar54;
                  local_cd8 = local_cd8 + lVar54;
                  local_d18 = local_d18 + lVar54;
                  local_d78 = (undefined8 *)((long)local_d78 + lVar54);
                  local_d68 = local_d68 + lVar54;
                  local_e58 = local_e58 + lVar54;
                  local_c68 = local_c68 + lVar54;
                  local_e28 = local_e28 + lVar54;
                  local_e78 = local_e78 + lVar54;
                  local_ea8 = local_ea8 + lVar54;
                  local_f48 = local_f48 + lVar54;
                  local_d80 = local_d80 + lVar54;
                  local_d98 = local_d98 + lVar54;
                  local_cb8 = local_cb8 + lVar54;
                  local_d88 = local_d88 + lVar54;
                  local_9a8 = local_9a8 + lVar92;
                  lVar43 = lVar43 + lVar92;
                  local_b48 = local_b48 + lVar92;
                  local_f28 = local_f28 + lVar92;
                }
                local_6b8 = local_6b8 + lVar53;
                local_6c0 = local_6c0 + lVar53;
                local_990 = local_990 + lVar53;
                local_a20 = local_a20 + lVar53;
                local_a28 = local_a28 + lVar53;
                local_a30 = local_a30 + lVar53;
                local_8e8 = (element_type *)((long)(&(local_8e8->bbox).smallend + -2) + lVar53);
                local_a40 = local_a40 + lVar53;
                local_998 = (element_type *)
                            (&(local_998->m_lbox).
                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar64);
                local_a48 = local_a48 + lVar53;
                local_b58 = local_b58 + lVar53;
                lVar107 = lVar107 + lVar53;
                local_5d0 = local_5d0 + lVar53;
                local_ab8 = local_ab8 + lVar53;
                lVar105 = lVar105 + lVar53;
                local_a58 = local_a58 + lVar53;
                local_a60 = local_a60 + lVar53;
                lVar70 = lVar70 + lVar53;
                lVar104 = lVar104 + lVar53;
                local_a68 = local_a68 + lVar53;
                local_a70 = local_a70 + lVar53;
                lVar101 = lVar101 + lVar53;
                local_a80 = local_a80 + lVar53;
                local_a88 = local_a88 + lVar53;
                lVar84 = lVar84 + lVar53;
                lVar37 = lVar37 + lVar53;
                local_a90 = local_a90 + lVar53;
                local_a78 = local_a78 + lVar53;
                local_5d8 = local_5d8 + lVar53;
                lVar80 = lVar80 + lVar53;
                local_768 = local_768 + lVar53;
                local_778 = local_778 + lVar53;
                local_758 = local_758 + lVar53;
                local_498 = local_498 + lVar53;
                local_4a8 = local_4a8 + lVar53;
                local_4b8 = local_4b8 + lVar53;
                local_4c8 = local_4c8 + lVar53;
                local_af8 = local_af8 + lVar99;
                lVar96 = lVar96 + lVar99;
                lVar21 = lVar21 + lVar99;
                lVar35 = lVar35 + lVar99;
              }
            }
            Gpu::Elixir::~Elixir(&sgeli);
            Gpu::Elixir::~Elixir(&cneli);
          }
          else {
            if (FVar16 != covered) goto LAB_00540d2b;
            iVar83 = (int)interp_from_mmp_to.fsten;
            lVar21 = (long)(int)interp_from_mmp_to.fsten;
            iVar3 = interp_from_mmp_to.fsten._4_4_;
            lVar53 = (long)interp_from_mmp_to.fsten._4_4_;
            __n = (ulong)(uint)(iStack_adc - (int)interp_from_mmp_to.fsten) * 8 + 8;
            local_d88 = 0;
            for (lVar103 = 0; iVar68 = iVar31, lVar103 != 9; lVar103 = lVar103 + 1) {
              for (; iVar68 <= iVar34; iVar68 = iVar68 + 1) {
                lVar35 = CONCAT44(local_3c0.jstride._4_4_,(int)local_3c0.jstride) * 8;
                pvVar62 = (void *)((long)local_3c0.p +
                                  local_3c0.nstride * local_d88 +
                                  (lVar53 - local_3c0.begin.y) * lVar35 +
                                  (long)(iVar68 - local_3c0.begin.z) *
                                  CONCAT44(local_3c0.kstride._4_4_,(int)local_3c0.kstride) * 8 +
                                  (long)local_3c0.begin.x * -8 + lVar21 * 8);
                for (iVar98 = iVar3; iVar98 <= iStack_ad8; iVar98 = iVar98 + 1) {
                  if (iVar83 <= iStack_adc) {
                    memset(pvVar62,0,__n);
                  }
                  pvVar62 = (void *)((long)pvVar62 + lVar35);
                }
              }
              local_d88 = local_d88 + 8;
            }
            lVar103 = CONCAT44(ns_starr.p._4_4_,(int)ns_starr.p);
            if (lVar103 != 0) {
              local_d88 = 0;
              for (lVar35 = 0; iVar68 = iVar31, lVar35 != 9; lVar35 = lVar35 + 1) {
                for (; iVar68 <= iVar34; iVar68 = iVar68 + 1) {
                  lVar54 = CONCAT44(ns_starr.jstride._4_4_,(int)ns_starr.jstride) * 8;
                  pvVar62 = (void *)(ns_starr.nstride * local_d88 +
                                     (lVar53 - ns_starr.begin.y) * lVar54 +
                                     (long)(iVar68 - ns_starr.begin.z) *
                                     CONCAT44(ns_starr.kstride._4_4_,(int)ns_starr.kstride) * 8 +
                                     (long)ns_starr.begin.x * -8 + lVar103 + lVar21 * 8);
                  for (iVar98 = iVar3; iVar98 <= iStack_ad8; iVar98 = iVar98 + 1) {
                    if (iVar83 <= iStack_adc) {
                      memset(pvVar62,0,__n);
                    }
                    pvVar62 = (void *)((long)pvVar62 + lVar54);
                  }
                }
                local_d88 = local_d88 + 8;
              }
            }
          }
        }
        MFIter::operator++(&mfi);
        iStack_ae0 = iVar31;
        local_ad4 = iVar34;
      }
      MFIter::~MFIter(&mfi);
      BaseFab<double>::~BaseFab((BaseFab<double> *)&nghost);
      BaseFab<double>::~BaseFab(&sgfab.super_BaseFab<double>);
      MFIter::MFIter(&mfi_1,(FabArrayBase *)
                            **(undefined8 **)
                              &(this_05->
                               super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                               ).
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar79].
                               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ,true);
      while( true ) {
        if (mfi_1.endIndex <= mfi_1.currentIndex) break;
        MFIter::tilebox((Box *)&nghost,&mfi_1);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&mfi,
                   (FabArray<amrex::FArrayBox> *)
                   **(undefined8 **)
                     &(this_05->
                      super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                      ).
                      super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar79].
                      super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ,&mfi_1);
        lVar53 = (long)iStack_66c;
        iVar31 = local_668 + -1;
        for (lVar103 = (long)local_668; (int)lVar103 <= iStack_65c; lVar103 = lVar103 + 1) {
          lVar96 = CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray) * 8;
          lVar37 = ((lVar53 + -1) - (long)mfi.beginIndex) * lVar96;
          lVar35 = CONCAT44(mfi.tile_size.vect[1],mfi.tile_size.vect[0]) * 8;
          lVar54 = (iVar31 - mfi.endIndex) * lVar35;
          lVar21 = lVar54 + lVar37;
          lVar43 = mfi._24_8_ * 0x38;
          lVar35 = (lVar103 - mfi.endIndex) * lVar35;
          lVar37 = lVar37 + lVar35;
          lVar61 = (lVar53 - mfi.beginIndex) * lVar96;
          lVar54 = lVar54 + lVar61;
          lVar61 = lVar61 + lVar35;
          lVar35 = mfi._24_8_ * 0x30;
          lVar107 = (long)mfi.currentIndex;
          local_ef8 = CONCAT44(mfi.m_fa._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                               _4_4_,CONCAT13(mfi.m_fa._M_t.
                                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                              _M_head_impl._3_1_,
                                              CONCAT21(mfi.m_fa._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl._1_2_,
                                                  mfi.m_fa._M_t.
                                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl._0_1_))) + (long)nghost * 8;
          lVar84 = lVar21 + lVar43 + lVar107 * -8 + local_ef8;
          lVar92 = lVar43 + lVar37 + lVar107 * -8 + local_ef8;
          lVar104 = mfi._24_8_ * 0x20 + lVar37 + lVar107 * -8 + local_ef8;
          lVar80 = lVar54 + lVar43 + lVar107 * -8 + local_ef8;
          lVar86 = lVar54 + mfi._24_8_ * 0x28 + lVar107 * -8 + local_ef8;
          lVar99 = lVar43 + lVar61 + lVar107 * -8 + local_ef8;
          local_f18 = mfi._24_8_ * 0x28 + lVar61 + lVar107 * -8 + local_ef8;
          lVar46 = mfi._24_8_ * 0x20 + lVar61 + lVar107 * -8 + local_ef8;
          lVar36 = mfi._24_8_ * 8 + lVar61 + lVar107 * -8 + local_ef8;
          local_c58 = lVar54 + lVar35 + lVar107 * -8 + local_ef8;
          lVar54 = lVar54 + mfi._24_8_ * 0x18 + lVar107 * -8 + local_ef8;
          lVar43 = mfi._24_8_ * 0x40 + lVar61 + lVar107 * -8 + local_ef8;
          local_c88 = lVar61 + lVar107 * -8 + local_ef8;
          local_e58 = lVar35 + lVar61 + lVar107 * -8 + local_ef8;
          local_f00 = mfi._24_8_ * 0x18 + lVar61 + lVar107 * -8 + local_ef8;
          lVar61 = lVar61 + mfi._24_8_ * 0x10 + lVar107 * -8 + local_ef8;
          lVar45 = lVar21 + lVar35 + lVar107 * -8 + local_ef8;
          lVar35 = lVar35 + lVar37 + lVar107 * -8 + local_ef8;
          local_ef8 = mfi._24_8_ * 0x10 + lVar37 + lVar107 * -8 + local_ef8;
          for (lVar21 = lVar53; lVar21 <= local_660; lVar21 = lVar21 + 1) {
            if (nghost <= local_664) {
              lVar37 = 0;
              do {
                *(double *)(local_c88 + lVar37 * 8) =
                     -(*(double *)(lVar36 + -8 + lVar37 * 8) + *(double *)(lVar36 + lVar37 * 8) +
                       *(double *)(local_ef8 + lVar37 * 8) + *(double *)(lVar61 + lVar37 * 8) +
                       *(double *)(lVar54 + lVar37 * 8) + *(double *)(local_f00 + lVar37 * 8) +
                       *(double *)(lVar104 + -8 + lVar37 * 8) + *(double *)(lVar104 + lVar37 * 8) +
                       *(double *)(lVar46 + -8 + lVar37 * 8) + *(double *)(lVar46 + lVar37 * 8) +
                       *(double *)(lVar86 + -8 + lVar37 * 8) + *(double *)(lVar86 + lVar37 * 8) +
                       *(double *)(local_f18 + -8 + lVar37 * 8) +
                       *(double *)(local_f18 + lVar37 * 8) + *(double *)(lVar45 + lVar37 * 8) +
                       *(double *)(local_c58 + lVar37 * 8) + *(double *)(lVar35 + lVar37 * 8) +
                       *(double *)(local_e58 + lVar37 * 8) + *(double *)(lVar84 + -8 + lVar37 * 8) +
                       *(double *)(lVar84 + lVar37 * 8) + *(double *)(lVar80 + -8 + lVar37 * 8) +
                       *(double *)(lVar80 + lVar37 * 8) + *(double *)(lVar92 + -8 + lVar37 * 8) +
                       *(double *)(lVar92 + lVar37 * 8) + *(double *)(lVar99 + -8 + lVar37 * 8) +
                      *(double *)(lVar99 + lVar37 * 8));
                *(double *)(lVar43 + lVar37 * 8) =
                     1.0 / (ABS(*(double *)(lVar99 + lVar37 * 8)) +
                            ABS(*(double *)(lVar99 + -8 + lVar37 * 8)) +
                            ABS(*(double *)(lVar92 + lVar37 * 8)) +
                            ABS(*(double *)(lVar92 + -8 + lVar37 * 8)) +
                            ABS(*(double *)(lVar80 + lVar37 * 8)) +
                            ABS(*(double *)(lVar80 + -8 + lVar37 * 8)) +
                            ABS(*(double *)(lVar84 + lVar37 * 8)) +
                            ABS(*(double *)(lVar84 + -8 + lVar37 * 8)) +
                            ABS(*(double *)(local_e58 + lVar37 * 8)) +
                            ABS(*(double *)(lVar35 + lVar37 * 8)) +
                            ABS(*(double *)(local_c58 + lVar37 * 8)) +
                            ABS(*(double *)(lVar45 + lVar37 * 8)) +
                            ABS(*(double *)(local_f18 + lVar37 * 8)) +
                            ABS(*(double *)(local_f18 + -8 + lVar37 * 8)) +
                            ABS(*(double *)(lVar86 + lVar37 * 8)) +
                            ABS(*(double *)(lVar86 + -8 + lVar37 * 8)) +
                            ABS(*(double *)(lVar46 + lVar37 * 8)) +
                            ABS(*(double *)(lVar46 + -8 + lVar37 * 8)) +
                            ABS(*(double *)(lVar104 + lVar37 * 8)) +
                            ABS(*(double *)(lVar104 + -8 + lVar37 * 8)) +
                            ABS(*(double *)(local_f00 + lVar37 * 8)) +
                            ABS(*(double *)(lVar54 + lVar37 * 8)) +
                            ABS(*(double *)(lVar61 + lVar37 * 8)) +
                            ABS(*(double *)(local_ef8 + lVar37 * 8)) +
                            ABS(*(double *)(lVar36 + lVar37 * 8)) +
                            ABS(*(double *)(lVar36 + -8 + lVar37 * 8)) + 1e-100);
                lVar37 = lVar37 + 1;
              } while ((local_664 - nghost) + 1 != (int)lVar37);
            }
            lVar84 = lVar84 + lVar96;
            lVar92 = lVar92 + lVar96;
            lVar104 = lVar104 + lVar96;
            lVar80 = lVar80 + lVar96;
            lVar86 = lVar86 + lVar96;
            lVar99 = lVar99 + lVar96;
            local_f18 = local_f18 + lVar96;
            lVar46 = lVar46 + lVar96;
            lVar36 = lVar36 + lVar96;
            local_c58 = local_c58 + lVar96;
            lVar54 = lVar54 + lVar96;
            lVar43 = lVar43 + lVar96;
            local_c88 = local_c88 + lVar96;
            local_e58 = local_e58 + lVar96;
            local_f00 = local_f00 + lVar96;
            lVar61 = lVar61 + lVar96;
            lVar45 = lVar45 + lVar96;
            lVar35 = lVar35 + lVar96;
            local_ef8 = local_ef8 + lVar96;
          }
          iVar31 = iVar31 + 1;
        }
        tVar6.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
              &(this_00->
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar79]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        if (tVar6.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
            (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&sgfab,
                     (FabArray<amrex::FArrayBox> *)
                     tVar6.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi_1);
          lVar53 = (long)iStack_66c;
          iVar31 = local_668 + -1;
          for (lVar103 = (long)local_668; (int)lVar103 <= iStack_65c; lVar103 = lVar103 + 1) {
            lVar96 = (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena * 8;
            lVar37 = ((lVar53 + -1) - (long)sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                     lVar96;
            lVar54 = (long)(iVar31 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                     (long)sgfab.super_BaseFab<double>.dptr * 8;
            lVar21 = lVar54 + lVar37;
            lVar43 = sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x38;
            lVar35 = (lVar103 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                     (long)sgfab.super_BaseFab<double>.dptr * 8;
            lVar37 = lVar37 + lVar35;
            lVar61 = (lVar53 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) * lVar96;
            lVar54 = lVar54 + lVar61;
            lVar61 = lVar61 + lVar35;
            lVar35 = sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x30;
            lVar107 = (long)sgfab.super_BaseFab<double>.domain.smallend.vect[2];
            lVar84 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar21 + lVar43 + lVar107 * -8 + (long)nghost * 8;
            lVar92 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar43 + lVar37 + lVar107 * -8 + (long)nghost * 8;
            lVar104 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                      sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x20 + lVar37 +
                      lVar107 * -8 + (long)nghost * 8;
            lVar80 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar54 + lVar43 + lVar107 * -8 + (long)nghost * 8;
            lVar86 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar54 + sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x28 +
                     lVar107 * -8 + (long)nghost * 8;
            lVar99 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar43 + lVar61 + lVar107 * -8 + (long)nghost * 8;
            local_f18 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x28 + lVar61 +
                        lVar107 * -8 + (long)nghost * 8;
            lVar46 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x20 + lVar61 +
                     lVar107 * -8 + (long)nghost * 8;
            lVar36 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 8 + lVar61 +
                     lVar107 * -8 + (long)nghost * 8;
            local_c58 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        lVar54 + lVar35 + lVar107 * -8 + (long)nghost * 8;
            lVar54 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar54 + sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x18 +
                     lVar107 * -8 + (long)nghost * 8;
            lVar43 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x40 + lVar61 +
                     lVar107 * -8 + (long)nghost * 8;
            local_c88 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        lVar61 + lVar107 * -8 + (long)nghost * 8;
            local_e58 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        lVar35 + lVar61 + lVar107 * -8 + (long)nghost * 8;
            local_f00 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x18 + lVar61 +
                        lVar107 * -8 + (long)nghost * 8;
            lVar61 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar61 + sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x10 +
                     lVar107 * -8 + (long)nghost * 8;
            lVar45 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar21 + lVar35 + lVar107 * -8 + (long)nghost * 8;
            lVar35 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar35 + lVar37 + lVar107 * -8 + (long)nghost * 8;
            local_ef8 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x10 + lVar37 +
                        lVar107 * -8 + (long)nghost * 8;
            for (lVar21 = lVar53; lVar21 <= local_660; lVar21 = lVar21 + 1) {
              if (nghost <= local_664) {
                lVar37 = 0;
                do {
                  *(double *)(local_c88 + lVar37 * 8) =
                       -(*(double *)(lVar36 + -8 + lVar37 * 8) + *(double *)(lVar36 + lVar37 * 8) +
                         *(double *)(local_ef8 + lVar37 * 8) + *(double *)(lVar61 + lVar37 * 8) +
                         *(double *)(lVar54 + lVar37 * 8) + *(double *)(local_f00 + lVar37 * 8) +
                         *(double *)(lVar104 + -8 + lVar37 * 8) + *(double *)(lVar104 + lVar37 * 8)
                         + *(double *)(lVar46 + -8 + lVar37 * 8) + *(double *)(lVar46 + lVar37 * 8)
                         + *(double *)(lVar86 + -8 + lVar37 * 8) + *(double *)(lVar86 + lVar37 * 8)
                         + *(double *)(local_f18 + -8 + lVar37 * 8) +
                         *(double *)(local_f18 + lVar37 * 8) + *(double *)(lVar45 + lVar37 * 8) +
                         *(double *)(local_c58 + lVar37 * 8) + *(double *)(lVar35 + lVar37 * 8) +
                         *(double *)(local_e58 + lVar37 * 8) + *(double *)(lVar84 + -8 + lVar37 * 8)
                         + *(double *)(lVar84 + lVar37 * 8) + *(double *)(lVar80 + -8 + lVar37 * 8)
                         + *(double *)(lVar80 + lVar37 * 8) + *(double *)(lVar92 + -8 + lVar37 * 8)
                         + *(double *)(lVar92 + lVar37 * 8) + *(double *)(lVar99 + -8 + lVar37 * 8)
                        + *(double *)(lVar99 + lVar37 * 8));
                  *(double *)(lVar43 + lVar37 * 8) =
                       1.0 / (ABS(*(double *)(lVar99 + lVar37 * 8)) +
                              ABS(*(double *)(lVar99 + -8 + lVar37 * 8)) +
                              ABS(*(double *)(lVar92 + lVar37 * 8)) +
                              ABS(*(double *)(lVar92 + -8 + lVar37 * 8)) +
                              ABS(*(double *)(lVar80 + lVar37 * 8)) +
                              ABS(*(double *)(lVar80 + -8 + lVar37 * 8)) +
                              ABS(*(double *)(lVar84 + lVar37 * 8)) +
                              ABS(*(double *)(lVar84 + -8 + lVar37 * 8)) +
                              ABS(*(double *)(local_e58 + lVar37 * 8)) +
                              ABS(*(double *)(lVar35 + lVar37 * 8)) +
                              ABS(*(double *)(local_c58 + lVar37 * 8)) +
                              ABS(*(double *)(lVar45 + lVar37 * 8)) +
                              ABS(*(double *)(local_f18 + lVar37 * 8)) +
                              ABS(*(double *)(local_f18 + -8 + lVar37 * 8)) +
                              ABS(*(double *)(lVar86 + lVar37 * 8)) +
                              ABS(*(double *)(lVar86 + -8 + lVar37 * 8)) +
                              ABS(*(double *)(lVar46 + lVar37 * 8)) +
                              ABS(*(double *)(lVar46 + -8 + lVar37 * 8)) +
                              ABS(*(double *)(lVar104 + lVar37 * 8)) +
                              ABS(*(double *)(lVar104 + -8 + lVar37 * 8)) +
                              ABS(*(double *)(local_f00 + lVar37 * 8)) +
                              ABS(*(double *)(lVar54 + lVar37 * 8)) +
                              ABS(*(double *)(lVar61 + lVar37 * 8)) +
                              ABS(*(double *)(local_ef8 + lVar37 * 8)) +
                              ABS(*(double *)(lVar36 + lVar37 * 8)) +
                              ABS(*(double *)(lVar36 + -8 + lVar37 * 8)) + 1e-100);
                  lVar37 = lVar37 + 1;
                } while ((local_664 - nghost) + 1 != (int)lVar37);
              }
              lVar84 = lVar84 + lVar96;
              lVar92 = lVar92 + lVar96;
              lVar104 = lVar104 + lVar96;
              lVar80 = lVar80 + lVar96;
              lVar86 = lVar86 + lVar96;
              lVar99 = lVar99 + lVar96;
              local_f18 = local_f18 + lVar96;
              lVar46 = lVar46 + lVar96;
              lVar36 = lVar36 + lVar96;
              local_c58 = local_c58 + lVar96;
              lVar54 = lVar54 + lVar96;
              lVar43 = lVar43 + lVar96;
              local_c88 = local_c88 + lVar96;
              local_e58 = local_e58 + lVar96;
              local_f00 = local_f00 + lVar96;
              lVar61 = lVar61 + lVar96;
              lVar45 = lVar45 + lVar96;
              lVar35 = lVar35 + lVar96;
              local_ef8 = local_ef8 + lVar96;
            }
            iVar31 = iVar31 + 1;
          }
        }
        MFIter::operator++(&mfi_1);
      }
      MFIter::~MFIter(&mfi_1);
      pFVar60 = (FabArray<amrex::FArrayBox> *)
                **(undefined8 **)
                  &(this_05->
                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   ).
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar79].
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ;
      PVar307 = Geometry::periodicity(this_01);
      mfi_1.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
           PVar307.period.vect[0];
      mfi_1.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
           PVar307.period.vect[1];
      mfi_1.fabArray._0_4_ = PVar307.period.vect[2];
      FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar60,(Periodicity *)&mfi_1,false);
      tVar6.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
            &(this_00->
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar79]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      if (tVar6.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
          (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
        PVar307 = Geometry::periodicity(this_01);
        mfi_1.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
             PVar307.period.vect[0];
        mfi_1.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
             PVar307.period.vect[1];
        mfi_1.fabArray._0_4_ = PVar307.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)
                   tVar6.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   (Periodicity *)&mfi_1,false);
      }
      for (lVar53 = 1;
          lVar53 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                   super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar79]; lVar53 = lVar53 + 1) {
        lVar103 = *(long *)&(this_05->
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            ).
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar79].
                            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ;
        this_02 = *(FabArray<amrex::FArrayBox> **)(lVar103 + -8 + lVar53 * 8);
        this_03 = *(FabArray<amrex::FArrayBox> **)(lVar103 + lVar53 * 8);
        bVar15 = isMFIterSafe(&this_03->super_FabArrayBase,&this_02->super_FabArrayBase);
        MultiFab::MultiFab((MultiFab *)&mfi_1);
        pFVar60 = this_03;
        if (!bVar15) {
          amrex::coarsen((BoxArray *)&mfi,&(this_02->super_FabArrayBase).boxarray,2);
          sgfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x1;
          sgfab.super_BaseFab<double>.domain.smallend.vect[0] = 0;
          sgfab.super_BaseFab<double>.domain.smallend.vect[1] = 0;
          sgfab.super_BaseFab<double>.domain.smallend.vect[2] = 0;
          sgfab.super_BaseFab<double>.domain.bigend.vect[0] = 0;
          sgfab.super_BaseFab<double>.super_DataAllocator.m_arena = (Arena *)0x0;
          sgfab.super_BaseFab<double>.dptr = (double *)0x0;
          _nghost = &PTR__FabFactory_006d8928;
          pFVar60 = (FabArray<amrex::FArrayBox> *)&mfi_1;
          MultiFab::define((MultiFab *)pFVar60,(BoxArray *)&mfi,
                           &(this_02->super_FabArrayBase).distributionMap,
                           (this_02->super_FabArrayBase).n_comp,1,(MFInfo *)&sgfab,
                           (FabFactory<amrex::FArrayBox> *)&nghost);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&sgfab.super_BaseFab<double>.dptr);
          FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>(pFVar60,0.0);
          BoxArray::~BoxArray((BoxArray *)&mfi);
        }
        MFIter::MFIter(&mfi,&pFVar60->super_FabArrayBase,true);
        while (mfi.currentIndex < mfi.endIndex) {
          MFIter::validbox((Box *)&local_3c0,&mfi);
          local_3c0.p = (double *)
                        CONCAT44((int)((ulong)local_3c0.p >> 0x20) + -1,(int)local_3c0.p + -1);
          local_3c0.jstride._0_4_ = (int)local_3c0.jstride + -1;
          MFIter::growntilebox((Box *)&ns_starr,&mfi,1);
          uVar20 = CONCAT44(-(uint)((int)((ulong)local_3c0.p >> 0x20) < ns_starr.p._4_4_),
                            -(uint)((int)local_3c0.p < (int)ns_starr.p));
          uVar20 = ~uVar20 & (ulong)local_3c0.p |
                   CONCAT44(ns_starr.p._4_4_,(int)ns_starr.p) & uVar20;
          ns_starr.p._0_4_ = (int)uVar20;
          ns_starr.p._4_4_ = (int)(uVar20 >> 0x20);
          iVar31 = (int)local_3c0.jstride;
          if ((int)local_3c0.jstride < (int)ns_starr.jstride) {
            iVar31 = (int)ns_starr.jstride;
          }
          uVar20 = CONCAT44(-(uint)((int)ns_starr.kstride < (int)local_3c0.kstride),
                            -(uint)(ns_starr.jstride._4_4_ < local_3c0.jstride._4_4_));
          uVar20 = ~uVar20 & CONCAT44((int)local_3c0.kstride,local_3c0.jstride._4_4_) |
                   CONCAT44((int)ns_starr.kstride,ns_starr.jstride._4_4_) & uVar20;
          ns_starr.jstride._4_4_ = (int)uVar20;
          ns_starr.kstride._0_4_ = (int)(uVar20 >> 0x20);
          iVar34 = local_3c0.kstride._4_4_;
          if (ns_starr.kstride._4_4_ < local_3c0.kstride._4_4_) {
            iVar34 = ns_starr.kstride._4_4_;
          }
          ns_starr.jstride._0_4_ = iVar31;
          ns_starr.kstride._4_4_ = iVar34;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&sgfab,pFVar60,&mfi);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&nghost,this_02,&mfi);
          iVar98 = ns_starr.kstride._4_4_;
          iVar68 = (int)ns_starr.kstride;
          iVar3 = ns_starr.jstride._4_4_;
          iVar83 = ns_starr.p._4_4_;
          iVar34 = (int)ns_starr.p;
          for (iVar31 = (int)ns_starr.jstride; iVar31 <= iVar98; iVar31 = iVar31 + 1) {
            iVar102 = iVar31 * 2;
            iVar32 = iVar31 * 2 + -1;
            k_ = iVar31 * 2 + 1;
            iVar18 = iVar31 * 2 + 2;
            for (iVar19 = iVar83; iVar19 <= iVar68; iVar19 = iVar19 + 1) {
              j_ = iVar19 * 2;
              j__01 = iVar19 * 2 + -1;
              j__02 = iVar19 * 2 + 1;
              j__00 = iVar19 * 2 + 2;
              for (iVar33 = iVar34; iVar33 <= iVar3; iVar33 = iVar33 + 1) {
                A00p.fsten = (Array4<const_double> *)&nghost;
                i__01 = iVar33 * 2;
                i_ = iVar33 * 2 + 1;
                A0pp.fsten = A00p.fsten;
                A0p0.fsten = A00p.fsten;
                Ap0p.fsten = A00p.fsten;
                Ap00.fsten = A00p.fsten;
                A000.fsten = A00p.fsten;
                App0.fsten = A00p.fsten;
                Am0p.fsten = A00p.fsten;
                Appp.fsten = A00p.fsten;
                A0mp.fsten = A00p.fsten;
                Amp0.fsten = A00p.fsten;
                Apmp.fsten = A00p.fsten;
                Ampp.fsten = A00p.fsten;
                Am00.fsten = A00p.fsten;
                A0m0.fsten = A00p.fsten;
                Appm.fsten = A00p.fsten;
                Ammp.fsten = A00p.fsten;
                Apm0.fsten = A00p.fsten;
                A0pm.fsten = A00p.fsten;
                Ap0m.fsten = A00p.fsten;
                A00m.fsten = A00p.fsten;
                Ampm.fsten = A00p.fsten;
                restrict_from_00p_to.fsten = A00p.fsten;
                interp_from_00p_to.fsten = A00p.fsten;
                Amm0.fsten = A00p.fsten;
                restrict_from_0pp_to.fsten = A00p.fsten;
                restrict_from_0p0_to.fsten = A00p.fsten;
                interp_from_0p0_to.fsten = A00p.fsten;
                interp_from_mmp_to.fsten = A00p.fsten;
                interp_from_0pp_to.fsten = A00p.fsten;
                restrict_from_p0p_to.fsten = A00p.fsten;
                restrict_from_p00_to.fsten = A00p.fsten;
                interp_from_p00_to.fsten = A00p.fsten;
                interp_from_p0p_to.fsten = A00p.fsten;
                result.smallend.vect._0_8_ = A00p.fsten;
                restrict_from_m0p_to.fsten = A00p.fsten;
                restrict_from_m00_to.fsten = A00p.fsten;
                interp_from_m00_to.fsten = A00p.fsten;
                interp_from_m0p_to.fsten = A00p.fsten;
                restrict_from_ppp_to.fsten = A00p.fsten;
                restrict_from_0mp_to.fsten = A00p.fsten;
                restrict_from_pp0_to.fsten = A00p.fsten;
                restrict_from_0m0_to.fsten = A00p.fsten;
                Apmm.fsten = A00p.fsten;
                interp_from_0m0_to.fsten = A00p.fsten;
                interp_from_pp0_to.fsten = A00p.fsten;
                interp_from_pmm_to.fsten = A00p.fsten;
                lhs_1.smallend.vect._0_8_ = A00p.fsten;
                restrict_from_mpp_to.fsten = A00p.fsten;
                restrict_from_mp0_to.fsten = A00p.fsten;
                interp_from_mp0_to.fsten = A00p.fsten;
                lhs.smallend.vect._0_8_ = A00p.fsten;
                restrict_from_pmp_to.fsten = A00p.fsten;
                restrict_from_pm0_to.fsten = A00p.fsten;
                Am0m.fsten = A00p.fsten;
                interp_from_pm0_to.fsten = A00p.fsten;
                restrict_from_mmp_to.fsten = A00p.fsten;
                restrict_from_mm0_to.fsten = A00p.fsten;
                restrict_from_0pm_to.fsten = A00p.fsten;
                restrict_from_00m_to.fsten = A00p.fsten;
                A0mm.fsten = A00p.fsten;
                interp_from_00m_to.fsten = A00p.fsten;
                interp_from_mm0_to.fsten = A00p.fsten;
                bx.smallend.vect._0_8_ = A00p.fsten;
                interp_from_0pm_to.fsten = A00p.fsten;
                restrict_from_ppm_to.fsten = A00p.fsten;
                restrict_from_p0m_to.fsten = A00p.fsten;
                interp_from_p0m_to.fsten = A00p.fsten;
                interp_from_ppm_to.fsten = A00p.fsten;
                sgeli.m_pa.
                super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                .
                super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)A00p.fsten;
                restrict_from_mpm_to.fsten = A00p.fsten;
                restrict_from_m0m_to.fsten = A00p.fsten;
                interp_from_m0m_to.fsten = A00p.fsten;
                cneli.m_pa.
                super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                .
                super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)A00p.fsten;
                restrict_from_pmm_to.fsten = A00p.fsten;
                restrict_from_0mm_to.fsten = A00p.fsten;
                RVar114 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs,i_,j__01,iVar32);
                i__02 = iVar33 * 2 + 2;
                RVar115 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__02,j__01,iVar32);
                RVar116 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i_,j_,iVar32);
                RVar117 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__02,j_,iVar32);
                RVar118 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&bx,i_,j__02,iVar32);
                RVar119 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&sgeli,i__02,j__02,iVar32);
                RVar120 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pp0_to,i_,j__01,iVar102);
                RVar121 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__02,j__01,iVar102);
                RVar122 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i_,j_,iVar102);
                RVar123 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pm0_to,i_,j__02,iVar102);
                RVar124 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0m0_to,i__02,j__02,iVar102);
                RVar125 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_ppm_to,i_,j__01,k_);
                RVar126 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pm_to,i__02,j__01,k_);
                RVar127 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0m_to,i_,j_,k_);
                RVar128 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00m_to,i__02,j_,k_);
                RVar129 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pmm_to,i_,j__02,k_);
                RVar130 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&cneli,i__02,j__02,k_);
                RVar131 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__01,iVar32);
                RVar132 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__01,iVar32);
                RVar133 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__01,iVar32);
                RVar134 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__01,iVar32);
                RVar135 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__01,iVar32);
                RVar136 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__01,iVar32);
                RVar137 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__01,iVar32);
                RVar138 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j__01,iVar32);
                RVar139 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__01,iVar32);
                RVar140 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__01,iVar32);
                RVar141 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__01,iVar32);
                RVar142 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j__01,iVar32);
                RVar143 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j_,iVar32);
                RVar144 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j_,iVar32);
                RVar145 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,iVar32);
                RVar146 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j_,iVar32);
                RVar147 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j_,iVar32);
                RVar148 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar32);
                RVar149 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j_,iVar32);
                RVar150 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i_,j_,iVar32);
                RVar151 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j_,iVar32);
                RVar152 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j_,iVar32);
                RVar153 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j_,iVar32);
                RVar154 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j_,iVar32);
                RVar155 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j_,iVar32);
                RVar156 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j_,iVar32);
                RVar157 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j_,iVar32);
                RVar158 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j_,iVar32);
                RVar159 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar32);
                RVar160 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j_,iVar32);
                RVar161 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__02,iVar32);
                RVar162 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,iVar32);
                RVar163 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,iVar32);
                RVar164 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar32);
                RVar165 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,iVar32);
                RVar166 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i_,j__02,iVar32);
                RVar167 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,iVar32);
                RVar168 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,iVar32);
                RVar169 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,iVar32);
                RVar170 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j__02,iVar32);
                RVar171 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar32);
                RVar172 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,iVar32);
                RVar173 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j__01,iVar102);
                RVar174 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j__01,iVar102);
                RVar175 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__01,iVar102);
                RVar176 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__01,iVar102);
                RVar177 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__01,iVar102);
                RVar178 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__01,iVar102);
                RVar179 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__01,iVar102);
                RVar180 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i_,j__01,iVar102);
                RVar181 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j__01,iVar102);
                RVar182 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i_,j__01,iVar102);
                RVar183 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__01,iVar102);
                RVar184 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__01,iVar102);
                RVar185 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__01,iVar102);
                RVar186 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j__01,iVar102);
                RVar187 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__01,iVar102);
                RVar188 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__01,iVar102);
                RVar189 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__01,iVar102);
                RVar190 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j__01,iVar102);
                RVar191 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmm,i__01,j_,iVar102);
                RVar192 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j_,iVar102);
                RVar193 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j_,iVar102);
                RVar194 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j_,iVar102);
                RVar195 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j_,iVar102);
                RVar196 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,iVar102);
                RVar197 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j_,iVar102);
                RVar198 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j_,iVar102);
                RVar199 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar102);
                RVar200 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mm,i_,j_,iVar102);
                RVar201 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmm,i_,j_,iVar102);
                RVar202 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j_,iVar102);
                RVar203 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i_,j_,iVar102);
                RVar204 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j_,iVar102);
                RVar205 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i_,j_,iVar102);
                RVar206 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j_,iVar102);
                RVar207 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i_,j_,iVar102);
                RVar208 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j_,iVar102);
                RVar209 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j_,iVar102);
                RVar210 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j_,iVar102);
                RVar211 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j_,iVar102);
                RVar212 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j_,iVar102);
                RVar213 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j_,iVar102);
                RVar214 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j_,iVar102);
                RVar215 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j_,iVar102);
                RVar216 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar217 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j_,iVar102);
                RVar218 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmm,i__01,j__02,iVar102);
                RVar219 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j__02,iVar102);
                RVar220 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__02,iVar102);
                RVar221 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,iVar102);
                RVar222 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,iVar102);
                RVar223 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar224 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mm,i_,j__02,iVar102);
                RVar225 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmm,i_,j__02,iVar102);
                RVar226 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__02,iVar102);
                RVar227 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i_,j__02,iVar102);
                RVar228 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,iVar102);
                RVar229 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i_,j__02,iVar102);
                RVar230 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,iVar102);
                RVar231 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,iVar102);
                RVar232 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,iVar102);
                RVar233 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j__02,iVar102);
                RVar234 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar235 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,iVar102);
                RVar236 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j__01,k_);
                RVar237 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j__01,k_);
                RVar238 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__01,k_);
                RVar239 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__01,k_);
                RVar240 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__01,k_);
                RVar241 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i_,j__01,k_);
                RVar242 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j__01,k_);
                RVar243 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i_,j__01,k_);
                RVar244 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__01,k_);
                RVar245 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__01,k_);
                RVar246 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__01,k_);
                RVar247 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j__01,k_);
                RVar248 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmm,i__01,j_,k_);
                RVar249 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j_,k_);
                RVar250 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j_,k_);
                RVar251 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j_,k_);
                RVar252 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j_,k_);
                RVar253 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,k_);
                RVar254 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0mm,i_,j_,k_);
                RVar255 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Apmm,i_,j_,k_);
                RVar256 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A00m,i_,j_,k_);
                RVar257 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ap0m,i_,j_,k_);
                RVar258 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pm,i_,j_,k_);
                RVar259 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Appm,i_,j_,k_);
                RVar260 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0m0,i_,j_,k_);
                RVar261 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Apm0,i_,j_,k_);
                RVar262 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A000,i_,j_,k_);
                RVar263 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ap00,i_,j_,k_);
                RVar264 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar265 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&App0,i_,j_,k_);
                RVar266 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmm,i__01,j__02,k_);
                RVar267 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j__02,k_);
                RVar268 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__02,k_);
                RVar269 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar270 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mm,i_,j__02,k_);
                RVar271 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmm,i_,j__02,k_);
                RVar272 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__02,k_);
                RVar273 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i_,j__02,k_);
                RVar274 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,k_);
                RVar275 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i_,j__02,k_);
                RVar276 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar277 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,k_);
                RVar278 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0mm_to,i__01,j_,iVar102);
                RVar279 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pmm_to,i__01,j_,iVar102);
                RVar280 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00m_to,i__01,j_,iVar102);
                RVar281 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0m_to,i__01,j_,iVar102);
                RVar282 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pm_to,i__01,j_,iVar102);
                RVar283 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppm_to,i__01,j_,iVar102);
                RVar284 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0m0_to,i__01,j_,iVar102);
                RVar285 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pm0_to,i__01,j_,iVar102);
                RVar286 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j_,iVar102);
                RVar287 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__01,j_,iVar102);
                RVar288 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pp0_to,i__01,j_,iVar102);
                RVar289 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0mp_to,i__01,j_,iVar102);
                RVar290 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pmp_to,i__01,j_,iVar102);
                RVar291 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j_,iVar102);
                RVar292 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j_,iVar102);
                RVar293 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__01,j_,iVar102);
                RVar294 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppp_to,i__01,j_,iVar102);
                lVar103 = (long)iVar33;
                lVar21 = (long)iVar19;
                lVar35 = (long)iVar31;
                sgfab.super_BaseFab<double>._vptr_BaseFab
                [(lVar21 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                 (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena +
                 (lVar103 - sgfab.super_BaseFab<double>.domain.smallend.vect[2]) +
                 (lVar35 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                 (long)sgfab.super_BaseFab<double>.dptr +
                 sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_] =
                     (_func_int *)
                     ((RVar294 * (RVar277 * RVar130 +
                                 RVar276 * RVar129 +
                                 RVar275 * RVar128 +
                                 RVar274 * RVar127 +
                                 RVar273 * RVar124 + RVar272 * RVar123 + RVar270 * RVar122 + RVar271
                                 ) +
                      RVar293 * (RVar269 * RVar129 +
                                RVar268 * RVar127 + RVar266 * RVar122 + RVar267 * RVar123) +
                      RVar292 * (RVar265 * RVar130 +
                                RVar264 * RVar129 +
                                RVar263 * RVar128 +
                                RVar262 * RVar127 +
                                RVar261 * RVar126 +
                                RVar260 * RVar125 +
                                RVar259 * RVar124 +
                                RVar258 * RVar123 +
                                RVar257 + RVar256 * RVar122 + RVar254 * RVar120 + RVar255 * RVar121)
                      + RVar291 * (RVar253 * RVar129 +
                                  RVar252 * RVar127 +
                                  RVar251 * RVar125 +
                                  RVar250 * RVar123 + RVar248 * RVar120 + RVar249 * RVar122) +
                        RVar290 * (RVar247 * RVar128 +
                                  RVar246 * RVar127 +
                                  RVar245 * RVar126 +
                                  RVar244 * RVar125 +
                                  RVar243 + RVar242 * RVar122 +
                                            RVar240 * RVar120 + RVar241 * RVar121) +
                        RVar289 * (RVar239 * RVar127 +
                                  RVar238 * RVar125 + RVar236 * RVar120 + RVar237 * RVar122) +
                        RVar288 * (RVar235 * RVar130 +
                                  RVar234 * RVar129 +
                                  RVar233 * RVar128 +
                                  RVar232 * RVar127 +
                                  RVar231 * RVar124 +
                                  RVar230 * RVar123 +
                                  RVar229 + RVar228 * RVar122 +
                                            RVar227 * RVar119 +
                                            RVar226 * RVar118 +
                                            RVar224 * RVar116 + RVar225 * RVar117) +
                        RVar287 * (RVar223 * RVar129 +
                                  RVar222 * RVar127 +
                                  RVar221 * RVar123 +
                                  RVar220 * RVar122 + RVar218 * RVar116 + RVar219 * RVar118) +
                        RVar286 * (RVar217 * RVar130 +
                                  RVar216 * RVar129 +
                                  RVar215 * RVar128 +
                                  RVar214 * RVar127 +
                                  RVar213 * RVar126 +
                                  RVar212 * RVar125 +
                                  RVar211 * RVar124 +
                                  RVar210 * RVar123 +
                                  RVar209 + RVar208 * RVar122 +
                                            RVar207 * RVar121 +
                                            RVar206 * RVar120 +
                                            RVar205 * RVar119 +
                                            RVar204 * RVar118 +
                                            RVar203 * RVar117 +
                                            RVar202 * RVar116 +
                                            RVar200 * RVar114 + RVar201 * RVar115) +
                        (RVar190 * RVar128 +
                        RVar189 * RVar127 +
                        RVar188 * RVar126 +
                        RVar187 * RVar125 +
                        RVar186 + RVar185 * RVar122 +
                                  RVar184 * RVar121 +
                                  RVar183 * RVar120 +
                                  RVar182 * RVar117 +
                                  RVar181 * RVar116 + RVar179 * RVar114 + RVar180 * RVar115) *
                        RVar285 + (RVar178 * RVar127 +
                                  RVar177 * RVar125 +
                                  RVar176 * RVar122 +
                                  RVar175 * RVar120 + RVar173 * RVar114 + RVar174 * RVar116) *
                                  RVar284 + (RVar172 * RVar124 +
                                            RVar171 * RVar123 +
                                            RVar170 + RVar169 * RVar122 +
                                                      RVar168 * RVar119 +
                                                      RVar167 * RVar118 +
                                                      RVar165 * RVar116 + RVar166 * RVar117) *
                                            RVar283 + (RVar164 * RVar123 +
                                                      RVar163 * RVar122 +
                                                      RVar161 * RVar116 + RVar162 * RVar118) *
                                                      RVar282 + (RVar160 * RVar124 +
                                                                RVar159 * RVar123 +
                                                                RVar158 + RVar157 * RVar122 +
                                                                          RVar156 * RVar121 +
                                                                          RVar155 * RVar120 +
                                                                          RVar154 * RVar119 +
                                                                          RVar153 * RVar118 +
                                                                          RVar152 * RVar117 +
                                                                          RVar151 * RVar116 +
                                                                          RVar149 * RVar114 +
                                                                          RVar150 * RVar115) *
                                                                RVar281 + (RVar148 * RVar123 +
                                                                          RVar147 * RVar122 +
                                                                          RVar146 * RVar120 +
                                                                          RVar145 * RVar118 +
                                                                          RVar143 * RVar114 +
                                                                          RVar144 * RVar116) *
                                                                          RVar280 + (RVar134 * 
                                                  RVar122 + RVar133 * RVar120 +
                                                            RVar131 * RVar114 + RVar132 * RVar116) *
                                                  RVar278 + RVar279 * (RVar142 +
                                                                      RVar141 * RVar122 +
                                                                      RVar140 * RVar121 +
                                                                      RVar139 * RVar120 +
                                                                      RVar138 * RVar117 +
                                                                      RVar137 * RVar116 +
                                                                      RVar135 * RVar114 +
                                                                      RVar136 * RVar115) +
                        RVar129 * RVar199 +
                        RVar127 * RVar198 +
                        RVar125 * RVar197 +
                        RVar123 * RVar196 +
                        RVar122 * RVar195 +
                        RVar120 * RVar194 +
                        RVar118 * RVar193 + RVar191 * RVar114 + RVar192 * RVar116) * 0.125);
                i__00 = iVar33 * 2 + -1;
                RVar114 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs,i__00,j__02,iVar32);
                RVar115 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__01,j__02,iVar32);
                RVar116 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&result,i_,j__02,iVar32);
                RVar117 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i__00,j__00,iVar32);
                RVar118 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__01,j__00,iVar32);
                RVar119 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0p_to,i_,j__00,iVar32);
                RVar120 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pp0_to,i__00,j__02,iVar102);
                RVar121 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__01,j__02,iVar102);
                RVar122 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mp0_to,i_,j__02,iVar102);
                RVar123 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i__00,j__00,iVar102);
                RVar124 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m00_to,i_,j__00,iVar102);
                RVar125 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_ppm_to,i__00,j__02,k_);
                RVar126 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pm_to,i__01,j__02,k_);
                RVar127 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs_1,i_,j__02,k_);
                RVar128 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0m_to,i__00,j__00,k_);
                RVar129 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00m_to,i__01,j__00,k_);
                RVar130 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0m_to,i_,j__00,k_);
                RVar131 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j_,iVar32);
                RVar132 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j_,iVar32);
                RVar133 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j_,iVar32);
                RVar134 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j_,iVar32);
                RVar135 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j_,iVar32);
                RVar136 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j_,iVar32);
                RVar137 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,iVar32);
                RVar138 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j_,iVar32);
                RVar139 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j_,iVar32);
                RVar140 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar32);
                RVar141 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j_,iVar32);
                RVar142 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j_,iVar32);
                RVar143 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j_,iVar32);
                RVar144 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar32);
                RVar145 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__00,j__02,iVar32);
                RVar146 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__00,j__02,iVar32);
                RVar147 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j__02,iVar32);
                RVar148 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j__02,iVar32);
                RVar149 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__02,iVar32);
                RVar150 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__02,iVar32);
                RVar151 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j__02,iVar32);
                RVar152 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j__02,iVar32);
                RVar153 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__01,j__02,iVar32);
                RVar154 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__01,j__02,iVar32);
                RVar155 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,iVar32);
                RVar156 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j__02,iVar32);
                RVar157 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j__02,iVar32);
                RVar158 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__02,iVar32);
                RVar159 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__02,iVar32);
                RVar160 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__02,iVar32);
                RVar161 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar32);
                RVar162 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j__02,iVar32);
                RVar163 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j__02,iVar32);
                RVar164 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__02,iVar32);
                RVar165 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,iVar32);
                RVar166 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,iVar32);
                RVar167 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__02,iVar32);
                RVar168 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,iVar32);
                RVar169 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar32);
                RVar170 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar32);
                RVar171 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__02,iVar32);
                RVar172 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar32);
                RVar173 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i__00,j_,iVar102);
                RVar174 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__00,j_,iVar102);
                RVar175 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j_,iVar102);
                RVar176 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j_,iVar102);
                RVar177 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j_,iVar102);
                RVar178 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j_,iVar102);
                RVar179 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i__01,j_,iVar102);
                RVar180 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i__01,j_,iVar102);
                RVar181 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j_,iVar102);
                RVar182 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j_,iVar102);
                RVar183 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j_,iVar102);
                RVar184 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,iVar102);
                RVar185 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j_,iVar102);
                RVar186 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j_,iVar102);
                RVar187 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar102);
                RVar188 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i_,j_,iVar102);
                RVar189 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j_,iVar102);
                RVar190 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j_,iVar102);
                RVar191 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j_,iVar102);
                RVar192 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j_,iVar102);
                RVar193 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar194 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i__00,j__02,iVar102);
                RVar195 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__00,j__02,iVar102);
                RVar196 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i__00,j__02,iVar102);
                RVar197 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__00,j__02,iVar102);
                RVar198 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__00,j__02,iVar102);
                RVar199 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__00,j__02,iVar102);
                RVar200 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j__02,iVar102);
                RVar201 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j__02,iVar102);
                RVar202 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__02,iVar102);
                RVar203 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__02,iVar102);
                RVar204 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j__02,iVar102);
                RVar205 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j__02,iVar102);
                RVar206 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0m,i__01,j__02,iVar102);
                RVar207 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i__01,j__02,iVar102);
                RVar208 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j__02,iVar102);
                RVar209 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i__01,j__02,iVar102);
                RVar210 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i__01,j__02,iVar102);
                RVar211 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j__02,iVar102);
                RVar212 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__01,j__02,iVar102);
                RVar213 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__01,j__02,iVar102);
                RVar214 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,iVar102);
                RVar215 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j__02,iVar102);
                RVar216 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j__02,iVar102);
                RVar217 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__02,iVar102);
                RVar218 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__02,iVar102);
                RVar219 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__02,iVar102);
                RVar220 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar221 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j__02,iVar102);
                RVar222 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j__02,iVar102);
                RVar223 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__02,iVar102);
                RVar224 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0m,i_,j__02,iVar102);
                RVar225 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__02,iVar102);
                RVar226 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i_,j__02,iVar102);
                RVar227 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j__02,iVar102);
                RVar228 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,iVar102);
                RVar229 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,iVar102);
                RVar230 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__02,iVar102);
                RVar231 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,iVar102);
                RVar232 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar102);
                RVar233 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar234 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__02,iVar102);
                RVar235 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar102);
                RVar236 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i__00,j_,k_);
                RVar237 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__00,j_,k_);
                RVar238 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j_,k_);
                RVar239 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j_,k_);
                RVar240 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i__01,j_,k_);
                RVar241 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i__01,j_,k_);
                RVar242 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j_,k_);
                RVar243 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j_,k_);
                RVar244 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j_,k_);
                RVar245 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,k_);
                RVar246 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ampm,i_,j_,k_);
                RVar247 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pm,i_,j_,k_);
                RVar248 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Amp0,i_,j_,k_);
                RVar249 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar250 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i__00,j__02,k_);
                RVar251 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__00,j__02,k_);
                RVar252 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i__00,j__02,k_);
                RVar253 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__00,j__02,k_);
                RVar254 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__00,j__02,k_);
                RVar255 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__00,j__02,k_);
                RVar256 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j__02,k_);
                RVar257 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j__02,k_);
                RVar258 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0m,i__01,j__02,k_);
                RVar259 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i__01,j__02,k_);
                RVar260 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j__02,k_);
                RVar261 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i__01,j__02,k_);
                RVar262 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i__01,j__02,k_);
                RVar263 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j__02,k_);
                RVar264 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__01,j__02,k_);
                RVar265 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__01,j__02,k_);
                RVar266 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar267 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j__02,k_);
                RVar268 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j__02,k_);
                RVar269 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__02,k_);
                RVar270 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0m,i_,j__02,k_);
                RVar271 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__02,k_);
                RVar272 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i_,j__02,k_);
                RVar273 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j__02,k_);
                RVar274 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,k_);
                RVar275 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar276 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__02,k_);
                RVar277 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,k_);
                RVar278 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0m_to,i__01,j_,iVar102);
                RVar279 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00m_to,i__01,j_,iVar102);
                RVar280 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0m_to,i__01,j_,iVar102);
                RVar281 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mpm_to,i__01,j_,iVar102);
                RVar282 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pm_to,i__01,j_,iVar102);
                RVar283 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppm_to,i__01,j_,iVar102);
                RVar284 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m00_to,i__01,j_,iVar102);
                RVar285 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j_,iVar102);
                RVar286 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mp0_to,i__01,j_,iVar102);
                RVar287 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__01,j_,iVar102);
                RVar288 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pp0_to,i__01,j_,iVar102);
                RVar289 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0p_to,i__01,j_,iVar102);
                RVar290 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j_,iVar102);
                RVar291 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j_,iVar102);
                RVar292 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mpp_to,i__01,j_,iVar102);
                RVar293 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__01,j_,iVar102);
                RVar294 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppp_to,i__01,j_,iVar102);
                sgfab.super_BaseFab<double>._vptr_BaseFab
                [(lVar21 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                 (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena +
                 (lVar103 - sgfab.super_BaseFab<double>.domain.smallend.vect[2]) +
                 (lVar35 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                 (long)sgfab.super_BaseFab<double>.dptr +
                 sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 2] =
                     (_func_int *)
                     ((RVar294 * (RVar277 * RVar130 +
                                 RVar276 * RVar129 +
                                 RVar275 * RVar127 +
                                 RVar274 * RVar126 +
                                 RVar273 * RVar124 + RVar272 + RVar270 * RVar121 + RVar271 * RVar122
                                 ) +
                      RVar293 * (RVar269 * RVar130 +
                                RVar268 * RVar129 +
                                RVar267 * RVar128 +
                                RVar266 * RVar127 +
                                RVar265 * RVar126 +
                                RVar264 * RVar125 +
                                RVar263 * RVar124 +
                                RVar262 + RVar261 * RVar123 +
                                          RVar260 * RVar122 + RVar258 * RVar120 + RVar259 * RVar121)
                      + RVar292 * (RVar257 * RVar129 +
                                  RVar256 * RVar128 +
                                  RVar255 * RVar126 +
                                  RVar254 * RVar125 +
                                  RVar253 + RVar252 * RVar123 +
                                            RVar250 * RVar120 + RVar251 * RVar121) +
                        RVar291 * (RVar249 * RVar127 +
                                  RVar248 * RVar126 + RVar246 * RVar121 + RVar247 * RVar122) +
                        RVar290 * (RVar245 * RVar127 +
                                  RVar244 * RVar126 +
                                  RVar243 * RVar125 +
                                  RVar242 * RVar122 + RVar240 * RVar120 + RVar241 * RVar121) +
                        RVar289 * (RVar239 * RVar126 +
                                  RVar238 * RVar125 + RVar236 * RVar120 + RVar237 * RVar121) +
                        RVar288 * (RVar235 * RVar130 +
                                  RVar234 * RVar129 +
                                  RVar233 * RVar127 +
                                  RVar232 * RVar126 +
                                  RVar231 * RVar124 +
                                  RVar230 + RVar229 * RVar122 +
                                            RVar228 * RVar121 +
                                            RVar227 * RVar119 +
                                            RVar226 * RVar118 +
                                            RVar224 * RVar115 + RVar225 * RVar116) +
                        RVar287 * (RVar223 * RVar130 +
                                  RVar222 * RVar129 +
                                  RVar221 * RVar128 +
                                  RVar220 * RVar127 +
                                  RVar219 * RVar126 +
                                  RVar218 * RVar125 +
                                  RVar217 * RVar124 +
                                  RVar216 + RVar215 * RVar123 +
                                            RVar214 * RVar122 +
                                            RVar213 * RVar121 +
                                            RVar212 * RVar120 +
                                            RVar211 * RVar119 +
                                            RVar210 * RVar118 +
                                            RVar209 * RVar117 +
                                            RVar208 * RVar116 +
                                            RVar206 * RVar114 + RVar207 * RVar115) +
                        RVar286 * (RVar205 * RVar129 +
                                  RVar204 * RVar128 +
                                  RVar203 * RVar126 +
                                  RVar202 * RVar125 +
                                  RVar201 + RVar200 * RVar123 +
                                            RVar199 * RVar121 +
                                            RVar198 * RVar120 +
                                            RVar197 * RVar118 +
                                            RVar196 * RVar117 +
                                            RVar194 * RVar114 + RVar195 * RVar115) +
                        RVar285 * (RVar193 * RVar127 +
                                  RVar192 * RVar126 +
                                  RVar191 * RVar122 +
                                  RVar190 * RVar121 + RVar188 * RVar115 + RVar189 * RVar116) +
                        (RVar178 * RVar126 +
                        RVar177 * RVar125 +
                        RVar176 * RVar121 +
                        RVar175 * RVar120 + RVar173 * RVar114 + RVar174 * RVar115) * RVar284 +
                        (RVar172 * RVar124 +
                        RVar171 + RVar170 * RVar122 +
                                  RVar169 * RVar121 +
                                  RVar168 * RVar119 +
                                  RVar167 * RVar118 + RVar165 * RVar115 + RVar166 * RVar116) *
                        RVar283 + (RVar164 * RVar124 +
                                  RVar163 + RVar162 * RVar123 +
                                            RVar161 * RVar122 +
                                            RVar160 * RVar121 +
                                            RVar159 * RVar120 +
                                            RVar158 * RVar119 +
                                            RVar157 * RVar118 +
                                            RVar156 * RVar117 +
                                            RVar155 * RVar116 +
                                            RVar153 * RVar114 + RVar154 * RVar115) * RVar282 +
                                  (RVar152 +
                                  RVar151 * RVar123 +
                                  RVar150 * RVar121 +
                                  RVar149 * RVar120 +
                                  RVar148 * RVar118 +
                                  RVar147 * RVar117 + RVar145 * RVar114 + RVar146 * RVar115) *
                                  RVar281 + (RVar144 * RVar122 +
                                            RVar143 * RVar121 +
                                            RVar141 * RVar115 + RVar142 * RVar116) * RVar280 +
                                            (RVar134 * RVar121 +
                                            RVar133 * RVar120 +
                                            RVar131 * RVar114 + RVar132 * RVar115) * RVar278 +
                                            RVar279 * (RVar140 * RVar122 +
                                                      RVar139 * RVar121 +
                                                      RVar138 * RVar120 +
                                                      RVar137 * RVar116 +
                                                      RVar135 * RVar114 + RVar136 * RVar115) +
                        RVar127 * RVar187 +
                        RVar126 * RVar186 +
                        RVar125 * RVar185 +
                        RVar122 * RVar184 +
                        RVar121 * RVar183 +
                        RVar120 * RVar182 +
                        RVar181 * RVar116 + RVar179 * RVar114 + RVar180 * RVar115) * 0.125);
                RVar114 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs,i__00,j__01,k_);
                RVar115 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__01,j__01,k_);
                RVar116 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&result,i_,j__01,k_);
                RVar117 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i__00,j_,k_);
                RVar118 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__01,j_,k_);
                RVar119 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0p_to,i_,j_,k_);
                RVar120 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&bx,i__00,j__02,k_);
                RVar121 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&sgeli,i__01,j__02,k_);
                RVar122 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mmp_to,i_,j__02,k_);
                RVar123 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pp0_to,i__00,j__01,iVar18);
                RVar124 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__01,j__01,iVar18);
                RVar125 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mp0_to,i_,j__01,iVar18);
                RVar126 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i__00,j_,iVar18);
                RVar127 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m00_to,i_,j_,iVar18);
                RVar128 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pm0_to,i__00,j__02,iVar18);
                RVar129 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0m0_to,i__01,j__02,iVar18);
                RVar130 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mm0_to,i_,j__02,iVar18);
                RVar131 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__01,iVar102);
                RVar132 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__01,iVar102);
                RVar133 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j__01,iVar102);
                RVar134 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j__01,iVar102);
                RVar135 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__01,iVar102);
                RVar136 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__01,iVar102);
                RVar137 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__01,iVar102);
                RVar138 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j__01,iVar102);
                RVar139 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j__01,iVar102);
                RVar140 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__01,iVar102);
                RVar141 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__01,iVar102);
                RVar142 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__01,iVar102);
                RVar143 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__01,iVar102);
                RVar144 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__01,iVar102);
                RVar145 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__00,j_,iVar102);
                RVar146 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__00,j_,iVar102);
                RVar147 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j_,iVar102);
                RVar148 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j_,iVar102);
                RVar149 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j_,iVar102);
                RVar150 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j_,iVar102);
                RVar151 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__01,j_,iVar102);
                RVar152 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__01,j_,iVar102);
                RVar153 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j_,iVar102);
                RVar154 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j_,iVar102);
                RVar155 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j_,iVar102);
                RVar156 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j_,iVar102);
                RVar157 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j_,iVar102);
                RVar158 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j_,iVar102);
                RVar159 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar102);
                RVar160 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j_,iVar102);
                RVar161 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j_,iVar102);
                RVar162 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j_,iVar102);
                RVar163 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j_,iVar102);
                RVar164 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j_,iVar102);
                RVar165 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar166 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__00,j__02,iVar102);
                RVar167 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__00,j__02,iVar102);
                RVar168 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__02,iVar102);
                RVar169 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__02,iVar102);
                RVar170 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__01,j__02,iVar102);
                RVar171 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__01,j__02,iVar102);
                RVar172 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,iVar102);
                RVar173 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__02,iVar102);
                RVar174 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__02,iVar102);
                RVar175 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar176 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__02,iVar102);
                RVar177 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,iVar102);
                RVar178 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar102);
                RVar179 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar180 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__00,j__01,k_);
                RVar181 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__00,j__01,k_);
                RVar182 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j__01,k_);
                RVar183 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j__01,k_);
                RVar184 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__01,k_);
                RVar185 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__01,k_);
                RVar186 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j__01,k_);
                RVar187 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j__01,k_);
                RVar188 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__01,j__01,k_);
                RVar189 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__01,j__01,k_);
                RVar190 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__01,k_);
                RVar191 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j__01,k_);
                RVar192 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j__01,k_);
                RVar193 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__01,k_);
                RVar194 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__01,k_);
                RVar195 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__01,k_);
                RVar196 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__01,k_);
                RVar197 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j__01,k_);
                RVar198 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j__01,k_);
                RVar199 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__01,k_);
                RVar200 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__01,k_);
                RVar201 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__01,k_);
                RVar202 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__01,k_);
                RVar203 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__01,k_);
                RVar204 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__01,k_);
                RVar205 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__01,k_);
                RVar206 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__01,k_);
                RVar207 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__01,k_);
                RVar208 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i__00,j_,k_);
                RVar209 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__00,j_,k_);
                RVar210 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__00,j_,k_);
                RVar211 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__00,j_,k_);
                RVar212 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j_,k_);
                RVar213 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j_,k_);
                RVar214 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__00,j_,k_);
                RVar215 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__00,j_,k_);
                RVar216 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j_,k_);
                RVar217 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j_,k_);
                RVar218 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j_,k_);
                RVar219 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j_,k_);
                RVar220 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i__01,j_,k_);
                RVar221 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i__01,j_,k_);
                RVar222 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j_,k_);
                RVar223 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__01,j_,k_);
                RVar224 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__01,j_,k_);
                RVar225 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j_,k_);
                RVar226 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j_,k_);
                RVar227 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j_,k_);
                RVar228 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,k_);
                RVar229 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__01,j_,k_);
                RVar230 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__01,j_,k_);
                RVar231 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j_,k_);
                RVar232 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j_,k_);
                RVar233 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j_,k_);
                RVar234 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j_,k_);
                RVar235 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j_,k_);
                RVar236 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j_,k_);
                RVar237 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,k_);
                RVar238 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Amm0,i_,j_,k_);
                RVar239 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0m0,i_,j_,k_);
                RVar240 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Am00,i_,j_,k_);
                RVar241 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A000,i_,j_,k_);
                RVar242 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Amp0,i_,j_,k_);
                RVar243 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar244 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ammp,i_,j_,k_);
                RVar245 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0mp,i_,j_,k_);
                RVar246 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Am0p,i_,j_,k_);
                RVar247 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A00p,i_,j_,k_);
                RVar248 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ampp,i_,j_,k_);
                RVar249 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pp,i_,j_,k_);
                RVar250 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i__00,j__02,k_);
                RVar251 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__00,j__02,k_);
                RVar252 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__00,j__02,k_);
                RVar253 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__00,j__02,k_);
                RVar254 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__00,j__02,k_);
                RVar255 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__00,j__02,k_);
                RVar256 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__02,k_);
                RVar257 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__02,k_);
                RVar258 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i__01,j__02,k_);
                RVar259 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i__01,j__02,k_);
                RVar260 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__02,k_);
                RVar261 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__01,j__02,k_);
                RVar262 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__01,j__02,k_);
                RVar263 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar264 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__01,j__02,k_);
                RVar265 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__01,j__02,k_);
                RVar266 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,k_);
                RVar267 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__02,k_);
                RVar268 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__02,k_);
                RVar269 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,k_);
                RVar270 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i_,j__02,k_);
                RVar271 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,k_);
                RVar272 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,k_);
                RVar273 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar274 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__02,k_);
                RVar275 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,k_);
                RVar276 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,k_);
                RVar277 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar278 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mm0_to,i__01,j_,iVar102);
                RVar279 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0m0_to,i__01,j_,iVar102);
                RVar280 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pm0_to,i__01,j_,iVar102);
                RVar281 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m00_to,i__01,j_,iVar102);
                RVar282 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j_,iVar102);
                RVar283 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mp0_to,i__01,j_,iVar102);
                RVar284 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__01,j_,iVar102);
                RVar285 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pp0_to,i__01,j_,iVar102);
                RVar286 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mmp_to,i__01,j_,iVar102);
                RVar287 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0mp_to,i__01,j_,iVar102);
                RVar288 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pmp_to,i__01,j_,iVar102);
                RVar289 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0p_to,i__01,j_,iVar102);
                RVar290 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j_,iVar102);
                RVar291 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j_,iVar102);
                RVar292 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mpp_to,i__01,j_,iVar102);
                RVar293 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__01,j_,iVar102);
                RVar294 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppp_to,i__01,j_,iVar102);
                sgfab.super_BaseFab<double>._vptr_BaseFab
                [(lVar21 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                 (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena +
                 (lVar103 - sgfab.super_BaseFab<double>.domain.smallend.vect[2]) +
                 (lVar35 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                 (long)sgfab.super_BaseFab<double>.dptr +
                 sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 3] =
                     (_func_int *)
                     ((RVar294 * (RVar277 * RVar130 +
                                 RVar276 * RVar129 +
                                 RVar275 * RVar127 +
                                 RVar274 + RVar273 * RVar122 +
                                           RVar272 * RVar121 + RVar270 * RVar118 + RVar271 * RVar119
                                 ) +
                      RVar293 * (RVar269 * RVar130 +
                                RVar268 * RVar129 +
                                RVar267 * RVar128 +
                                RVar266 * RVar127 +
                                RVar265 + RVar264 * RVar126 +
                                          RVar263 * RVar122 +
                                          RVar262 * RVar121 +
                                          RVar261 * RVar120 +
                                          RVar260 * RVar119 + RVar258 * RVar117 + RVar259 * RVar118)
                      + RVar292 * (RVar257 * RVar129 +
                                  RVar256 * RVar128 +
                                  RVar255 + RVar254 * RVar126 +
                                            RVar253 * RVar121 +
                                            RVar252 * RVar120 +
                                            RVar250 * RVar117 + RVar251 * RVar118) +
                        RVar291 * (RVar249 * RVar130 +
                                  RVar248 * RVar129 +
                                  RVar247 * RVar127 +
                                  RVar246 + RVar245 * RVar125 +
                                            RVar244 * RVar124 +
                                            RVar243 * RVar122 +
                                            RVar242 * RVar121 +
                                            RVar241 * RVar119 +
                                            RVar240 * RVar118 +
                                            RVar238 * RVar115 + RVar239 * RVar116) +
                        RVar290 * (RVar237 * RVar130 +
                                  RVar236 * RVar129 +
                                  RVar235 * RVar128 +
                                  RVar234 * RVar127 +
                                  RVar233 + RVar232 * RVar126 +
                                            RVar231 * RVar125 +
                                            RVar230 * RVar124 +
                                            RVar229 * RVar123 +
                                            RVar228 * RVar122 +
                                            RVar227 * RVar121 +
                                            RVar226 * RVar120 +
                                            RVar225 * RVar119 +
                                            RVar224 * RVar118 +
                                            RVar223 * RVar117 +
                                            RVar222 * RVar116 +
                                            RVar220 * RVar114 + RVar221 * RVar115) +
                        RVar289 * (RVar219 * RVar129 +
                                  RVar218 * RVar128 +
                                  RVar217 + RVar216 * RVar126 +
                                            RVar215 * RVar124 +
                                            RVar214 * RVar123 +
                                            RVar213 * RVar121 +
                                            RVar212 * RVar120 +
                                            RVar211 * RVar118 +
                                            RVar210 * RVar117 +
                                            RVar208 * RVar114 + RVar209 * RVar115) +
                        RVar288 * (RVar207 * RVar127 +
                                  RVar206 + RVar205 * RVar125 +
                                            RVar204 * RVar124 +
                                            RVar203 * RVar119 +
                                            RVar202 * RVar118 +
                                            RVar200 * RVar115 + RVar201 * RVar116) +
                        RVar287 * (RVar199 * RVar127 +
                                  RVar198 + RVar197 * RVar126 +
                                            RVar196 * RVar125 +
                                            RVar195 * RVar124 +
                                            RVar194 * RVar123 +
                                            RVar193 * RVar119 +
                                            RVar192 * RVar118 +
                                            RVar191 * RVar117 +
                                            RVar190 * RVar116 +
                                            RVar188 * RVar114 + RVar189 * RVar115) +
                        RVar286 * (RVar187 +
                                  RVar186 * RVar126 +
                                  RVar185 * RVar124 +
                                  RVar184 * RVar123 +
                                  RVar183 * RVar118 +
                                  RVar182 * RVar117 + RVar180 * RVar114 + RVar181 * RVar115) +
                        RVar285 * (RVar179 * RVar122 +
                                  RVar178 * RVar121 + RVar176 * RVar118 + RVar177 * RVar119) +
                        RVar284 * (RVar175 * RVar122 +
                                  RVar174 * RVar121 +
                                  RVar173 * RVar120 +
                                  RVar172 * RVar119 + RVar170 * RVar117 + RVar171 * RVar118) +
                        RVar283 * (RVar169 * RVar121 +
                                  RVar168 * RVar120 + RVar166 * RVar117 + RVar167 * RVar118) +
                        RVar282 * (RVar165 * RVar122 +
                                  RVar164 * RVar121 +
                                  RVar163 * RVar119 +
                                  RVar162 * RVar118 + RVar160 * RVar115 + RVar161 * RVar116) +
                        RVar281 * (RVar150 * RVar121 +
                                  RVar149 * RVar120 +
                                  RVar148 * RVar118 +
                                  RVar147 * RVar117 + RVar145 * RVar114 + RVar146 * RVar115) +
                        RVar280 * (RVar144 * RVar119 +
                                  RVar143 * RVar118 + RVar141 * RVar115 + RVar142 * RVar116) +
                        RVar278 * (RVar134 * RVar118 +
                                  RVar133 * RVar117 + RVar131 * RVar114 + RVar132 * RVar115) +
                        RVar279 * (RVar140 * RVar119 +
                                  RVar139 * RVar118 +
                                  RVar138 * RVar117 +
                                  RVar137 * RVar116 + RVar135 * RVar114 + RVar136 * RVar115) +
                        RVar159 * RVar122 +
                        RVar158 * RVar121 +
                        RVar157 * RVar120 +
                        RVar156 * RVar119 +
                        RVar155 * RVar118 +
                        RVar154 * RVar117 +
                        RVar153 * RVar116 + RVar151 * RVar114 + RVar152 * RVar115) * 0.125);
                RVar114 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs,i_,j__02,iVar32);
                RVar115 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__02,j__02,iVar32);
                RVar116 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i_,j__00,iVar32);
                RVar117 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__02,j__00,iVar32);
                RVar118 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pp0_to,i_,j__02,iVar102);
                RVar119 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__02,j__02,iVar102);
                RVar120 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i_,j__00,iVar102);
                RVar121 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_ppm_to,i_,j__02,k_);
                RVar122 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pm_to,i__02,j__02,k_);
                RVar123 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0m_to,i_,j__00,k_);
                RVar124 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00m_to,i__02,j__00,k_);
                RVar125 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,iVar32);
                RVar126 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar32);
                RVar127 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j_,iVar32);
                RVar128 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j_,iVar32);
                RVar129 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar32);
                RVar130 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j_,iVar32);
                RVar131 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,iVar32);
                RVar132 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__02,iVar32);
                RVar133 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar32);
                RVar134 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__02,iVar32);
                RVar135 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,iVar32);
                RVar136 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,iVar32);
                RVar137 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,iVar32);
                RVar138 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j__02,iVar32);
                RVar139 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar32);
                RVar140 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,iVar32);
                RVar141 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar32);
                RVar142 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j__02,iVar32);
                RVar143 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j_,iVar102);
                RVar144 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,iVar102);
                RVar145 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar102);
                RVar146 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j_,iVar102);
                RVar147 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i_,j_,iVar102);
                RVar148 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j_,iVar102);
                RVar149 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j_,iVar102);
                RVar150 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar151 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j_,iVar102);
                RVar152 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j__02,iVar102);
                RVar153 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j__02,iVar102);
                RVar154 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,iVar102);
                RVar155 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__02,iVar102);
                RVar156 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar157 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__02,iVar102);
                RVar158 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__02,iVar102);
                RVar159 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i_,j__02,iVar102);
                RVar160 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j__02,iVar102);
                RVar161 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i_,j__02,iVar102);
                RVar162 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,iVar102);
                RVar163 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,iVar102);
                RVar164 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,iVar102);
                RVar165 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j__02,iVar102);
                RVar166 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar167 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,iVar102);
                RVar168 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar102);
                RVar169 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j__02,iVar102);
                RVar170 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j_,k_);
                RVar171 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,k_);
                RVar172 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pm,i_,j_,k_);
                RVar173 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Appm,i_,j_,k_);
                RVar174 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar175 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&App0,i_,j_,k_);
                RVar176 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i__01,j__02,k_);
                RVar177 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i__01,j__02,k_);
                RVar178 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar179 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__02,k_);
                RVar180 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__02,k_);
                RVar181 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0m,i_,j__02,k_);
                RVar182 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j__02,k_);
                RVar183 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appm,i_,j__02,k_);
                RVar184 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar185 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,k_);
                RVar186 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,k_);
                RVar187 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j__02,k_);
                RVar188 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00m_to,i__01,j_,iVar102);
                RVar189 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0m_to,i__01,j_,iVar102);
                RVar190 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pm_to,i__01,j_,iVar102);
                RVar191 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppm_to,i__01,j_,iVar102);
                RVar192 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j_,iVar102);
                RVar193 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__01,j_,iVar102);
                RVar194 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pp0_to,i__01,j_,iVar102);
                RVar195 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j_,iVar102);
                RVar196 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j_,iVar102);
                RVar197 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__01,j_,iVar102);
                RVar198 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppp_to,i__01,j_,iVar102);
                RVar199 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__01,j__02,iVar32);
                RVar200 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&result,i_,j__02,iVar32);
                RVar201 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__01,j__00,iVar32);
                RVar202 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0p_to,i_,j__00,iVar32);
                RVar203 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__01,j__02,iVar102);
                RVar204 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mp0_to,i_,j__02,iVar102);
                RVar205 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m00_to,i_,j__00,iVar102);
                RVar206 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pm_to,i__01,j__02,k_);
                RVar207 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs_1,i_,j__02,k_);
                RVar208 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00m_to,i__01,j__00,k_);
                RVar209 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0m_to,i_,j__00,k_);
                RVar210 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j_,iVar32);
                RVar211 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j_,iVar32);
                RVar212 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j_,iVar32);
                RVar213 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar32);
                RVar214 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j_,iVar32);
                RVar215 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j_,iVar32);
                RVar216 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,iVar32);
                RVar217 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,iVar32);
                RVar218 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__02,iVar32);
                RVar219 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,iVar32);
                RVar220 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar32);
                RVar221 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar32);
                RVar222 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__02,iVar32);
                RVar223 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar32);
                RVar224 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__02,j__02,iVar32);
                RVar225 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j__02,iVar32);
                RVar226 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__02,iVar32);
                RVar227 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j__02,iVar32);
                RVar228 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i_,j_,iVar102);
                RVar229 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j_,iVar102);
                RVar230 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j_,iVar102);
                RVar231 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j_,iVar102);
                RVar232 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j_,iVar102);
                RVar233 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar234 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i__02,j_,iVar102);
                RVar235 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j_,iVar102);
                RVar236 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j_,iVar102);
                RVar237 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0m,i_,j__02,iVar102);
                RVar238 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__02,iVar102);
                RVar239 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i_,j__02,iVar102);
                RVar240 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j__02,iVar102);
                RVar241 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,iVar102);
                RVar242 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,iVar102);
                RVar243 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__02,iVar102);
                RVar244 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,iVar102);
                RVar245 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar102);
                RVar246 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar247 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__02,iVar102);
                RVar248 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar102);
                RVar249 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0m,i__02,j__02,iVar102);
                RVar250 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i__02,j__02,iVar102);
                RVar251 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__02,j__02,iVar102);
                RVar252 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j__02,iVar102);
                RVar253 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__02,iVar102);
                RVar254 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j__02,iVar102);
                RVar255 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ampm,i_,j_,k_);
                RVar256 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pm,i_,j_,k_);
                RVar257 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Amp0,i_,j_,k_);
                RVar258 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar259 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i__02,j_,k_);
                RVar260 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j_,k_);
                RVar261 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0m,i_,j__02,k_);
                RVar262 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00m,i_,j__02,k_);
                RVar263 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i_,j__02,k_);
                RVar264 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pm,i_,j__02,k_);
                RVar265 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,k_);
                RVar266 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar267 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__02,k_);
                RVar268 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,k_);
                RVar269 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0m,i__02,j__02,k_);
                RVar270 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampm,i__02,j__02,k_);
                RVar271 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__02,j__02,k_);
                RVar272 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j__02,k_);
                RVar273 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0m_to,i__02,j_,iVar102);
                RVar274 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00m_to,i__02,j_,iVar102);
                RVar275 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mpm_to,i__02,j_,iVar102);
                RVar276 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pm_to,i__02,j_,iVar102);
                RVar277 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m00_to,i__02,j_,iVar102);
                RVar278 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mp0_to,i__02,j_,iVar102);
                RVar279 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__02,j_,iVar102);
                RVar280 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0p_to,i__02,j_,iVar102);
                RVar281 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__02,j_,iVar102);
                RVar282 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mpp_to,i__02,j_,iVar102);
                RVar283 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__02,j_,iVar102);
                sgfab.super_BaseFab<double>._vptr_BaseFab
                [(lVar21 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                 (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena +
                 (lVar103 - sgfab.super_BaseFab<double>.domain.smallend.vect[2]) +
                 (lVar35 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                 (long)sgfab.super_BaseFab<double>.dptr +
                 sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 4] =
                     (_func_int *)
                     (((RVar283 * (RVar272 * RVar209 +
                                  RVar271 * RVar207 + RVar269 * RVar204 + RVar270 * RVar205) +
                       RVar282 * (RVar268 * RVar209 +
                                 RVar267 * RVar208 +
                                 RVar266 * RVar207 +
                                 RVar265 * RVar206 +
                                 RVar264 * RVar205 + RVar263 + RVar261 * RVar203 + RVar262 * RVar204
                                 ) +
                       RVar281 * (RVar259 * RVar204 + RVar260 * RVar207) +
                       RVar280 * (RVar258 * RVar207 +
                                 RVar257 * RVar206 + RVar255 * RVar203 + RVar256 * RVar204) +
                       RVar279 * (RVar254 * RVar209 +
                                 RVar253 * RVar207 +
                                 RVar205 * RVar252 +
                                 RVar204 * RVar251 + RVar249 * RVar200 + RVar250 * RVar202) +
                       RVar278 * (RVar248 * RVar209 +
                                 RVar247 * RVar208 +
                                 RVar207 * RVar246 +
                                 RVar206 * RVar245 +
                                 RVar205 * RVar244 +
                                 RVar243 + RVar242 * RVar204 +
                                           RVar241 * RVar203 +
                                           RVar240 * RVar202 +
                                           RVar239 * RVar201 + RVar237 * RVar199 + RVar238 * RVar200
                                 ) +
                       (RVar233 * RVar207 +
                       RVar232 * RVar206 +
                       RVar231 * RVar204 + RVar230 * RVar203 + RVar228 * RVar199 + RVar229 * RVar200
                       ) * RVar277 +
                       (RVar227 * RVar205 +
                       RVar226 * RVar204 + RVar224 * RVar200 + RVar225 * RVar202) * RVar276 +
                       RVar275 * (RVar223 * RVar205 +
                                 RVar222 + RVar221 * RVar204 +
                                           RVar220 * RVar203 +
                                           RVar219 * RVar202 +
                                           RVar218 * RVar201 + RVar216 * RVar199 + RVar217 * RVar200
                                 ) +
                       RVar273 * (RVar213 * RVar204 +
                                 RVar212 * RVar203 + RVar210 * RVar199 + RVar211 * RVar200) +
                       RVar274 * (RVar214 * RVar200 + RVar215 * RVar204) +
                       RVar207 * RVar236 + RVar200 * RVar234 + RVar235 * RVar204) * 0.125 +
                      (RVar198 * (RVar187 * RVar124 +
                                 RVar186 * RVar123 +
                                 RVar185 * RVar122 +
                                 RVar184 * RVar121 +
                                 RVar183 + RVar182 * RVar120 + RVar180 * RVar118 + RVar181 * RVar119
                                 ) +
                      RVar197 * (RVar179 * RVar123 +
                                RVar178 * RVar121 + RVar176 * RVar118 + RVar177 * RVar120) +
                      RVar196 * (RVar175 * RVar122 +
                                RVar174 * RVar121 + RVar172 * RVar118 + RVar173 * RVar119) +
                      RVar195 * (RVar170 * RVar118 + RVar171 * RVar121) +
                      RVar194 * (RVar169 * RVar124 +
                                RVar168 * RVar123 +
                                RVar122 * RVar167 +
                                RVar121 * RVar166 +
                                RVar165 + RVar164 * RVar120 +
                                          RVar163 * RVar119 +
                                          RVar162 * RVar118 +
                                          RVar161 * RVar117 +
                                          RVar160 * RVar116 + RVar158 * RVar114 + RVar159 * RVar115)
                      + RVar193 * (RVar157 * RVar123 +
                                  RVar156 * RVar121 +
                                  RVar120 * RVar155 +
                                  RVar118 * RVar154 + RVar114 * RVar152 + RVar153 * RVar116) +
                        RVar192 * (RVar151 * RVar122 +
                                  RVar150 * RVar121 +
                                  RVar149 * RVar119 +
                                  RVar148 * RVar118 + RVar146 * RVar114 + RVar147 * RVar115) +
                        (RVar142 +
                        RVar141 * RVar120 +
                        RVar140 * RVar119 +
                        RVar139 * RVar118 +
                        RVar138 * RVar117 +
                        RVar137 * RVar116 + RVar135 * RVar114 + RVar136 * RVar115) * RVar191 +
                        (RVar134 * RVar120 +
                        RVar133 * RVar118 + RVar131 * RVar114 + RVar132 * RVar116) * RVar190 +
                        RVar188 * (RVar125 * RVar114 + RVar126 * RVar118) +
                        RVar189 * (RVar130 * RVar119 +
                                  RVar129 * RVar118 + RVar127 * RVar114 + RVar128 * RVar115) +
                        RVar121 * RVar145 + RVar114 * RVar143 + RVar144 * RVar118) * 0.125) * 0.5);
                RVar114 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs,i_,j__01,k_);
                RVar115 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__02,j__01,k_);
                RVar116 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i_,j_,k_);
                RVar117 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__02,j_,k_);
                RVar118 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&bx,i_,j__02,k_);
                RVar119 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&sgeli,i__02,j__02,k_);
                RVar120 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pp0_to,i_,j__01,iVar18);
                RVar121 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__02,j__01,iVar18);
                RVar122 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i_,j_,iVar18);
                RVar123 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pm0_to,i_,j__02,iVar18);
                RVar124 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0m0_to,i__02,j__02,iVar18);
                RVar125 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__01,iVar102);
                RVar126 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__01,iVar102);
                RVar127 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__01,iVar102);
                RVar128 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__01,iVar102);
                RVar129 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__01,iVar102);
                RVar130 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j__01,iVar102);
                RVar131 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j_,iVar102);
                RVar132 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j_,iVar102);
                RVar133 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar102);
                RVar134 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j_,iVar102);
                RVar135 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j_,iVar102);
                RVar136 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j_,iVar102);
                RVar137 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j_,iVar102);
                RVar138 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar139 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j_,iVar102);
                RVar140 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,iVar102);
                RVar141 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar142 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,iVar102);
                RVar143 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j__02,iVar102);
                RVar144 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar145 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,iVar102);
                RVar146 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__01,k_);
                RVar147 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__01,k_);
                RVar148 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__01,k_);
                RVar149 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__01,k_);
                RVar150 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__01,k_);
                RVar151 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__01,k_);
                RVar152 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__01,k_);
                RVar153 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j__01,k_);
                RVar154 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__01,k_);
                RVar155 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__01,k_);
                RVar156 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__01,k_);
                RVar157 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j__01,k_);
                RVar158 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j_,k_);
                RVar159 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j_,k_);
                RVar160 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,k_);
                RVar161 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j_,k_);
                RVar162 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j_,k_);
                RVar163 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,k_);
                RVar164 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0m0,i_,j_,k_);
                RVar165 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Apm0,i_,j_,k_);
                RVar166 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A000,i_,j_,k_);
                RVar167 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ap00,i_,j_,k_);
                RVar168 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar169 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&App0,i_,j_,k_);
                RVar170 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0mp,i_,j_,k_);
                RVar171 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Apmp,i_,j_,k_);
                RVar172 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A00p,i_,j_,k_);
                RVar173 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ap0p,i_,j_,k_);
                RVar174 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pp,i_,j_,k_);
                RVar175 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Appp,i_,j_,k_);
                RVar176 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__02,k_);
                RVar177 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar178 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,k_);
                RVar179 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,k_);
                RVar180 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,k_);
                RVar181 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i_,j__02,k_);
                RVar182 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar183 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,k_);
                RVar184 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,k_);
                RVar185 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j__02,k_);
                RVar186 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar187 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,k_);
                RVar188 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0m0_to,i__01,j_,iVar102);
                RVar189 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pm0_to,i__01,j_,iVar102);
                RVar190 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j_,iVar102);
                RVar191 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__01,j_,iVar102);
                RVar192 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pp0_to,i__01,j_,iVar102);
                RVar193 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0mp_to,i__01,j_,iVar102);
                RVar194 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pmp_to,i__01,j_,iVar102);
                RVar195 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j_,iVar102);
                RVar196 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j_,iVar102);
                RVar197 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__01,j_,iVar102);
                RVar198 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppp_to,i__01,j_,iVar102);
                RVar199 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__01,j__01,k_);
                RVar200 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&result,i_,j__01,k_);
                RVar201 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__01,j_,k_);
                RVar202 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0p_to,i_,j_,k_);
                RVar203 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&sgeli,i__01,j__02,k_);
                RVar204 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mmp_to,i_,j__02,k_);
                RVar205 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__01,j__01,iVar18);
                RVar206 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mp0_to,i_,j__01,iVar18);
                RVar207 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m00_to,i_,j_,iVar18);
                RVar208 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0m0_to,i__01,j__02,iVar18);
                RVar209 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mm0_to,i_,j__02,iVar18);
                RVar210 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__01,iVar102);
                RVar211 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__01,iVar102);
                RVar212 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__01,iVar102);
                RVar213 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__01,iVar102);
                RVar214 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__01,iVar102);
                RVar215 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j__01,iVar102);
                RVar216 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j_,iVar102);
                RVar217 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j_,iVar102);
                RVar218 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j_,iVar102);
                RVar219 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j_,iVar102);
                RVar220 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j_,iVar102);
                RVar221 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar222 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__02,j_,iVar102);
                RVar223 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j_,iVar102);
                RVar224 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j_,iVar102);
                RVar225 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__02,iVar102);
                RVar226 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,iVar102);
                RVar227 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar102);
                RVar228 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar229 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__02,j__02,iVar102);
                RVar230 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__02,iVar102);
                RVar231 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__01,k_);
                RVar232 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__01,k_);
                RVar233 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__01,k_);
                RVar234 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__01,k_);
                RVar235 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__01,k_);
                RVar236 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__01,k_);
                RVar237 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__01,k_);
                RVar238 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__01,k_);
                RVar239 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__02,j__01,k_);
                RVar240 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j__01,k_);
                RVar241 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__01,k_);
                RVar242 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j__01,k_);
                RVar243 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Amm0,i_,j_,k_);
                RVar244 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0m0,i_,j_,k_);
                RVar245 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Am00,i_,j_,k_);
                RVar246 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A000,i_,j_,k_);
                RVar247 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Amp0,i_,j_,k_);
                RVar248 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar249 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ammp,i_,j_,k_);
                RVar250 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0mp,i_,j_,k_);
                RVar251 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Am0p,i_,j_,k_);
                RVar252 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A00p,i_,j_,k_);
                RVar253 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ampp,i_,j_,k_);
                RVar254 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pp,i_,j_,k_);
                RVar255 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i__02,j_,k_);
                RVar256 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__02,j_,k_);
                RVar257 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j_,k_);
                RVar258 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__02,j_,k_);
                RVar259 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j_,k_);
                RVar260 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j_,k_);
                RVar261 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i_,j__02,k_);
                RVar262 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,k_);
                RVar263 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,k_);
                RVar264 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar265 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__02,k_);
                RVar266 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,k_);
                RVar267 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,k_);
                RVar268 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar269 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i__02,j__02,k_);
                RVar270 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__02,j__02,k_);
                RVar271 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__02,j__02,k_);
                RVar272 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__02,k_);
                RVar273 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mm0_to,i__02,j_,iVar102);
                RVar274 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0m0_to,i__02,j_,iVar102);
                RVar275 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m00_to,i__02,j_,iVar102);
                RVar276 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mp0_to,i__02,j_,iVar102);
                RVar277 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__02,j_,iVar102);
                RVar278 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mmp_to,i__02,j_,iVar102);
                RVar279 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0mp_to,i__02,j_,iVar102);
                RVar280 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0p_to,i__02,j_,iVar102);
                RVar281 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__02,j_,iVar102);
                RVar282 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mpp_to,i__02,j_,iVar102);
                RVar283 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__02,j_,iVar102);
                sgfab.super_BaseFab<double>._vptr_BaseFab
                [(lVar21 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                 (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena +
                 (lVar103 - sgfab.super_BaseFab<double>.domain.smallend.vect[2]) +
                 (lVar35 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                 (long)sgfab.super_BaseFab<double>.dptr +
                 sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 5] =
                     (_func_int *)
                     (((RVar283 * (RVar272 * RVar209 +
                                  RVar271 * RVar207 + RVar269 * RVar202 + RVar270 * RVar204) +
                       RVar282 * (RVar268 * RVar209 +
                                 RVar267 * RVar208 +
                                 RVar207 * RVar266 +
                                 RVar265 + RVar264 * RVar204 +
                                           RVar263 * RVar203 + RVar261 * RVar201 + RVar262 * RVar202
                                 ) +
                       RVar281 * (RVar260 * RVar209 +
                                 RVar259 * RVar207 +
                                 RVar258 * RVar206 +
                                 RVar257 * RVar204 + RVar255 * RVar200 + RVar256 * RVar202) +
                       RVar280 * (RVar254 * RVar209 +
                                 RVar253 * RVar208 +
                                 RVar207 * RVar252 +
                                 RVar251 + RVar250 * RVar206 +
                                           RVar249 * RVar205 +
                                           RVar248 * RVar204 +
                                           RVar247 * RVar203 +
                                           RVar246 * RVar202 +
                                           RVar245 * RVar201 + RVar243 * RVar199 + RVar244 * RVar200
                                 ) +
                       RVar279 * (RVar242 * RVar207 +
                                 RVar241 * RVar206 + RVar239 * RVar200 + RVar240 * RVar202) +
                       RVar278 * (RVar207 * RVar238 +
                                 RVar237 + RVar236 * RVar206 +
                                           RVar235 * RVar205 +
                                           RVar234 * RVar202 +
                                           RVar233 * RVar201 + RVar231 * RVar199 + RVar232 * RVar200
                                 ) +
                       RVar277 * (RVar202 * RVar229 + RVar230 * RVar204) +
                       RVar276 * (RVar204 * RVar228 +
                                 RVar227 * RVar203 + RVar225 * RVar201 + RVar226 * RVar202) +
                       (RVar221 * RVar204 +
                       RVar220 * RVar203 +
                       RVar219 * RVar202 + RVar218 * RVar201 + RVar216 * RVar199 + RVar217 * RVar200
                       ) * RVar275 +
                       (RVar213 * RVar202 +
                       RVar212 * RVar201 + RVar210 * RVar199 + RVar211 * RVar200) * RVar273 +
                       RVar274 * (RVar214 * RVar200 + RVar215 * RVar202) +
                       RVar204 * RVar224 + RVar200 * RVar222 + RVar223 * RVar202) * 0.125 +
                      (RVar198 * (RVar187 * RVar124 +
                                 RVar186 * RVar123 +
                                 RVar185 + RVar184 * RVar122 +
                                           RVar183 * RVar119 +
                                           RVar182 * RVar118 + RVar180 * RVar116 + RVar181 * RVar117
                                 ) +
                      RVar197 * (RVar179 * RVar123 +
                                RVar178 * RVar122 + RVar116 * RVar176 + RVar177 * RVar118) +
                      RVar196 * (RVar175 * RVar124 +
                                RVar174 * RVar123 +
                                RVar173 + RVar172 * RVar122 +
                                          RVar171 * RVar121 +
                                          RVar170 * RVar120 +
                                          RVar169 * RVar119 +
                                          RVar168 * RVar118 +
                                          RVar167 * RVar117 +
                                          RVar166 * RVar116 + RVar164 * RVar114 + RVar165 * RVar115)
                      + RVar195 * (RVar163 * RVar123 +
                                  RVar162 * RVar122 +
                                  RVar120 * RVar161 +
                                  RVar160 * RVar118 + RVar158 * RVar114 + RVar159 * RVar116) +
                        RVar194 * (RVar157 +
                                  RVar156 * RVar122 +
                                  RVar155 * RVar121 +
                                  RVar154 * RVar120 +
                                  RVar153 * RVar117 +
                                  RVar152 * RVar116 + RVar150 * RVar114 + RVar151 * RVar115) +
                        RVar193 * (RVar122 * RVar149 +
                                  RVar148 * RVar120 + RVar146 * RVar114 + RVar147 * RVar116) +
                        RVar192 * (RVar119 * RVar145 +
                                  RVar144 * RVar118 + RVar142 * RVar116 + RVar143 * RVar117) +
                        RVar191 * (RVar116 * RVar140 + RVar141 * RVar118) +
                        RVar190 * (RVar139 * RVar119 +
                                  RVar138 * RVar118 +
                                  RVar137 * RVar117 +
                                  RVar136 * RVar116 + RVar134 * RVar114 + RVar135 * RVar115) +
                        RVar188 * (RVar125 * RVar114 + RVar126 * RVar116) +
                        RVar189 * (RVar130 * RVar117 +
                                  RVar129 * RVar116 + RVar127 * RVar114 + RVar128 * RVar115) +
                        RVar133 * RVar118 + RVar131 * RVar114 + RVar132 * RVar116) * 0.125) * 0.5);
                RVar114 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs,i__00,j__02,k_);
                RVar115 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__01,j__02,k_);
                RVar116 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&result,i_,j__02,k_);
                RVar117 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i__00,j__00,k_);
                RVar118 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__01,j__00,k_);
                RVar119 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0p_to,i_,j__00,k_);
                RVar120 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pp0_to,i__00,j__02,iVar18);
                RVar121 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__01,j__02,iVar18);
                RVar122 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mp0_to,i_,j__02,iVar18);
                RVar123 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i__00,j__00,iVar18);
                RVar124 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m00_to,i_,j__00,iVar18);
                RVar125 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j_,iVar102);
                RVar126 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j_,iVar102);
                RVar127 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j_,iVar102);
                RVar128 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j_,iVar102);
                RVar129 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar102);
                RVar130 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j_,iVar102);
                RVar131 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar132 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__02,iVar102);
                RVar133 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__02,iVar102);
                RVar134 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j__02,iVar102);
                RVar135 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j__02,iVar102);
                RVar136 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__02,iVar102);
                RVar137 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__02,iVar102);
                RVar138 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar139 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j__02,iVar102);
                RVar140 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j__02,iVar102);
                RVar141 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__02,iVar102);
                RVar142 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar102);
                RVar143 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar144 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__02,iVar102);
                RVar145 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar102);
                RVar146 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j_,k_);
                RVar147 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j_,k_);
                RVar148 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j_,k_);
                RVar149 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j_,k_);
                RVar150 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j_,k_);
                RVar151 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j_,k_);
                RVar152 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,k_);
                RVar153 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j_,k_);
                RVar154 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j_,k_);
                RVar155 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,k_);
                RVar156 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Amp0,i_,j_,k_);
                RVar157 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar158 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ampp,i_,j_,k_);
                RVar159 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pp,i_,j_,k_);
                RVar160 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__00,j__02,k_);
                RVar161 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__00,j__02,k_);
                RVar162 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__00,j__02,k_);
                RVar163 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__00,j__02,k_);
                RVar164 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__02,k_);
                RVar165 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__02,k_);
                RVar166 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__00,j__02,k_);
                RVar167 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__00,j__02,k_);
                RVar168 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__01,j__02,k_);
                RVar169 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__01,j__02,k_);
                RVar170 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar171 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__01,j__02,k_);
                RVar172 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i__01,j__02,k_);
                RVar173 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__02,k_);
                RVar174 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__02,k_);
                RVar175 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__02,k_);
                RVar176 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,k_);
                RVar177 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__01,j__02,k_);
                RVar178 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i__01,j__02,k_);
                RVar179 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__02,k_);
                RVar180 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,k_);
                RVar181 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar182 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__02,k_);
                RVar183 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,k_);
                RVar184 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,k_);
                RVar185 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar186 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__02,k_);
                RVar187 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,k_);
                RVar188 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m00_to,i__01,j_,iVar102);
                RVar189 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j_,iVar102);
                RVar190 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mp0_to,i__01,j_,iVar102);
                RVar191 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__01,j_,iVar102);
                RVar192 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pp0_to,i__01,j_,iVar102);
                RVar193 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0p_to,i__01,j_,iVar102);
                RVar194 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j_,iVar102);
                RVar195 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j_,iVar102);
                RVar196 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mpp_to,i__01,j_,iVar102);
                RVar197 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__01,j_,iVar102);
                RVar198 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppp_to,i__01,j_,iVar102);
                RVar199 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i__00,j_,k_);
                RVar200 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__01,j_,k_);
                RVar201 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0p_to,i_,j_,k_);
                RVar202 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&bx,i__00,j__02,k_);
                RVar203 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&sgeli,i__01,j__02,k_);
                RVar204 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mmp_to,i_,j__02,k_);
                RVar205 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i__00,j_,iVar18);
                RVar206 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m00_to,i_,j_,iVar18);
                RVar207 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pm0_to,i__00,j__02,iVar18);
                RVar208 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0m0_to,i__01,j__02,iVar18);
                RVar209 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mm0_to,i_,j__02,iVar18);
                RVar210 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__00,j__02,iVar102);
                RVar211 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__00,j__02,iVar102);
                RVar212 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__02,iVar102);
                RVar213 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__02,iVar102);
                RVar214 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__01,j__02,iVar102);
                RVar215 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__01,j__02,iVar102);
                RVar216 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,iVar102);
                RVar217 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__02,iVar102);
                RVar218 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__02,iVar102);
                RVar219 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar220 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__02,iVar102);
                RVar221 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,iVar102);
                RVar222 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar102);
                RVar223 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar224 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__00,j__00,iVar102);
                RVar225 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__00,j__00,iVar102);
                RVar226 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__01,j__00,iVar102);
                RVar227 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__01,j__00,iVar102);
                RVar228 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__00,iVar102);
                RVar229 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__00,iVar102);
                RVar230 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__00,iVar102);
                RVar231 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i__00,j__02,k_);
                RVar232 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__00,j__02,k_);
                RVar233 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__00,j__02,k_);
                RVar234 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__00,j__02,k_);
                RVar235 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__00,j__02,k_);
                RVar236 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__00,j__02,k_);
                RVar237 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__00,j__02,k_);
                RVar238 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__00,j__02,k_);
                RVar239 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i__01,j__02,k_);
                RVar240 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i__01,j__02,k_);
                RVar241 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__02,k_);
                RVar242 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__01,j__02,k_);
                RVar243 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i__01,j__02,k_);
                RVar244 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar245 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__01,j__02,k_);
                RVar246 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__01,j__02,k_);
                RVar247 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,k_);
                RVar248 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__01,j__02,k_);
                RVar249 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i__01,j__02,k_);
                RVar250 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,k_);
                RVar251 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i_,j__02,k_);
                RVar252 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,k_);
                RVar253 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,k_);
                RVar254 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar255 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__02,k_);
                RVar256 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,k_);
                RVar257 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,k_);
                RVar258 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar259 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i__00,j__00,k_);
                RVar260 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__00,j__00,k_);
                RVar261 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__00,j__00,k_);
                RVar262 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__00,j__00,k_);
                RVar263 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i__01,j__00,k_);
                RVar264 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i__01,j__00,k_);
                RVar265 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__00,k_);
                RVar266 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__01,j__00,k_);
                RVar267 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i__01,j__00,k_);
                RVar268 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__00,k_);
                RVar269 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i_,j__00,k_);
                RVar270 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__00,k_);
                RVar271 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__00,k_);
                RVar272 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__00,k_);
                RVar273 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mm0_to,i__01,j__00,iVar102);
                RVar274 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0m0_to,i__01,j__00,iVar102);
                RVar275 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pm0_to,i__01,j__00,iVar102);
                RVar276 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m00_to,i__01,j__00,iVar102);
                RVar277 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j__00,iVar102);
                RVar278 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mmp_to,i__01,j__00,iVar102);
                RVar279 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0mp_to,i__01,j__00,iVar102);
                RVar280 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pmp_to,i__01,j__00,iVar102);
                RVar281 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0p_to,i__01,j__00,iVar102);
                RVar282 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j__00,iVar102);
                RVar283 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j__00,iVar102);
                sgfab.super_BaseFab<double>._vptr_BaseFab
                [(lVar21 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                 (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena +
                 (lVar103 - sgfab.super_BaseFab<double>.domain.smallend.vect[2]) +
                 (lVar35 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                 (long)sgfab.super_BaseFab<double>.dptr +
                 sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 6] =
                     (_func_int *)
                     (((RVar283 * (RVar272 * RVar209 +
                                  RVar271 * RVar208 + RVar269 * RVar203 + RVar270 * RVar204) +
                       RVar282 * (RVar268 * RVar209 +
                                 RVar267 * RVar208 +
                                 RVar266 * RVar207 +
                                 RVar265 * RVar204 + RVar263 * RVar202 + RVar264 * RVar203) +
                       RVar281 * (RVar262 * RVar208 +
                                 RVar261 * RVar207 + RVar259 * RVar202 + RVar260 * RVar203) +
                       RVar280 * (RVar258 * RVar209 +
                                 RVar257 * RVar208 +
                                 RVar206 * RVar256 +
                                 RVar255 + RVar254 * RVar204 +
                                           RVar253 * RVar203 + RVar251 * RVar200 + RVar252 * RVar201
                                 ) +
                       RVar279 * (RVar250 * RVar209 +
                                 RVar249 * RVar208 +
                                 RVar248 * RVar207 +
                                 RVar206 * RVar247 +
                                 RVar246 + RVar245 * RVar205 +
                                           RVar244 * RVar204 +
                                           RVar243 * RVar203 +
                                           RVar242 * RVar202 +
                                           RVar241 * RVar201 + RVar239 * RVar199 + RVar240 * RVar200
                                 ) +
                       RVar278 * (RVar238 * RVar208 +
                                 RVar237 * RVar207 +
                                 RVar236 + RVar235 * RVar205 +
                                           RVar234 * RVar203 +
                                           RVar233 * RVar202 + RVar231 * RVar199 + RVar232 * RVar200
                                 ) +
                       RVar277 * (RVar203 * RVar229 + RVar230 * RVar204) +
                       (RVar224 * RVar202 + RVar225 * RVar203) * RVar276 +
                       (RVar223 * RVar204 +
                       RVar222 * RVar203 + RVar220 * RVar200 + RVar221 * RVar201) * RVar275 +
                       RVar273 * (RVar213 * RVar203 +
                                 RVar212 * RVar202 + RVar210 * RVar199 + RVar211 * RVar200) +
                       RVar274 * (RVar219 * RVar204 +
                                 RVar218 * RVar203 +
                                 RVar217 * RVar202 +
                                 RVar216 * RVar201 + RVar214 * RVar199 + RVar215 * RVar200) +
                       RVar204 * RVar228 + RVar202 * RVar226 + RVar227 * RVar203) * 0.125 +
                      (RVar198 * (RVar187 * RVar124 +
                                 RVar186 + RVar185 * RVar122 +
                                           RVar184 * RVar121 +
                                           RVar183 * RVar119 +
                                           RVar182 * RVar118 + RVar180 * RVar115 + RVar181 * RVar116
                                 ) +
                      RVar197 * (RVar179 * RVar124 +
                                RVar178 + RVar177 * RVar123 +
                                          RVar176 * RVar122 +
                                          RVar175 * RVar121 +
                                          RVar174 * RVar120 +
                                          RVar173 * RVar119 +
                                          RVar172 * RVar118 +
                                          RVar171 * RVar117 +
                                          RVar170 * RVar116 + RVar168 * RVar114 + RVar169 * RVar115)
                      + RVar196 * (RVar167 +
                                  RVar166 * RVar123 +
                                  RVar165 * RVar121 +
                                  RVar164 * RVar120 +
                                  RVar163 * RVar118 +
                                  RVar162 * RVar117 + RVar160 * RVar114 + RVar161 * RVar115) +
                        RVar195 * (RVar159 * RVar122 +
                                  RVar158 * RVar121 + RVar115 * RVar156 + RVar157 * RVar116) +
                        RVar194 * (RVar155 * RVar122 +
                                  RVar154 * RVar121 +
                                  RVar153 * RVar120 +
                                  RVar116 * RVar152 + RVar150 * RVar114 + RVar151 * RVar115) +
                        RVar193 * (RVar149 * RVar121 +
                                  RVar148 * RVar120 + RVar146 * RVar114 + RVar147 * RVar115) +
                        RVar192 * (RVar119 * RVar145 +
                                  RVar144 * RVar118 + RVar142 * RVar115 + RVar143 * RVar116) +
                        RVar191 * (RVar141 * RVar119 +
                                  RVar140 * RVar118 +
                                  RVar139 * RVar117 +
                                  RVar138 * RVar116 + RVar136 * RVar114 + RVar137 * RVar115) +
                        RVar190 * (RVar135 * RVar118 +
                                  RVar134 * RVar117 + RVar132 * RVar114 + RVar133 * RVar115) +
                        RVar189 * (RVar130 * RVar115 + RVar131 * RVar116) +
                        RVar188 * (RVar125 * RVar114 + RVar126 * RVar115) +
                        RVar129 * RVar116 + RVar127 * RVar114 + RVar128 * RVar115) * 0.125) * 0.5);
                RVar114 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&lhs,i_,j__02,k_);
                RVar115 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__02,j__02,k_);
                RVar116 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i_,j__00,k_);
                RVar117 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__02,j__00,k_);
                RVar118 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pp0_to,i_,j__02,iVar18);
                RVar119 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__02,j__02,iVar18);
                RVar120 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i_,j__00,iVar18);
                RVar121 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,iVar102);
                RVar122 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar123 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j_,iVar102);
                RVar124 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar125 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__02,iVar102);
                RVar126 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar127 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,iVar102);
                RVar128 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar102);
                RVar129 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j__02,iVar102);
                RVar130 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j_,k_);
                RVar131 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j_,k_);
                RVar132 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar133 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&App0,i_,j_,k_);
                RVar134 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pp,i_,j_,k_);
                RVar135 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Appp,i_,j_,k_);
                RVar136 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar137 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i__01,j__02,k_);
                RVar138 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,k_);
                RVar139 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i__01,j__02,k_);
                RVar140 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar141 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,k_);
                RVar142 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,k_);
                RVar143 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&App0,i_,j__02,k_);
                RVar144 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar145 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,k_);
                RVar146 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,k_);
                RVar147 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Appp,i_,j__02,k_);
                RVar148 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j_,iVar102);
                RVar149 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__01,j_,iVar102);
                RVar150 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pp0_to,i__01,j_,iVar102);
                RVar151 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j_,iVar102);
                RVar152 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j_,iVar102);
                RVar153 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__01,j_,iVar102);
                RVar154 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_ppp_to,i__01,j_,iVar102);
                RVar155 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0pp_to,i__01,j__02,k_);
                RVar156 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&result,i_,j__02,k_);
                RVar157 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__01,j__00,k_);
                RVar158 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0p_to,i_,j__00,k_);
                RVar159 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0p0_to,i__01,j__02,iVar18);
                RVar160 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mp0_to,i_,j__02,iVar18);
                RVar161 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m00_to,i_,j__00,iVar18);
                RVar162 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j_,iVar102);
                RVar163 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j_,iVar102);
                RVar164 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j_,iVar102);
                RVar165 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar102);
                RVar166 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar167 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__02,iVar102);
                RVar168 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,iVar102);
                RVar169 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__02,iVar102);
                RVar170 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j__02,iVar102);
                RVar171 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Amp0,i_,j_,k_);
                RVar172 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0p0,i_,j_,k_);
                RVar173 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&Ampp,i_,j_,k_);
                RVar174 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()(&A0pp,i_,j_,k_);
                RVar175 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j_,k_);
                RVar176 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j_,k_);
                RVar177 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,k_);
                RVar178 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar179 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i_,j__02,k_);
                RVar180 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0p0,i_,j__02,k_);
                RVar181 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,k_);
                RVar182 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar183 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i_,j__02,k_);
                RVar184 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0pp,i_,j__02,k_);
                RVar185 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__02,j__02,k_);
                RVar186 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amp0,i__02,j__02,k_);
                RVar187 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__02,k_);
                RVar188 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ampp,i__02,j__02,k_);
                RVar189 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m00_to,i__02,j_,iVar102);
                RVar190 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mp0_to,i__02,j_,iVar102);
                RVar191 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0p0_to,i__02,j_,iVar102);
                RVar192 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0p_to,i__02,j_,iVar102);
                RVar193 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__02,j_,iVar102);
                RVar194 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mpp_to,i__02,j_,iVar102);
                RVar195 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0pp_to,i__02,j_,iVar102);
                RVar196 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p0p_to,i_,j_,k_);
                RVar197 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__02,j_,k_);
                RVar198 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&bx,i_,j__02,k_);
                RVar199 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&sgeli,i__02,j__02,k_);
                RVar200 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_p00_to,i_,j_,iVar18);
                RVar201 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_pm0_to,i_,j__02,iVar18);
                RVar202 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0m0_to,i__02,j__02,iVar18);
                RVar203 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,iVar102);
                RVar204 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,iVar102);
                RVar205 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,iVar102);
                RVar206 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j__02,iVar102);
                RVar207 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar208 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,iVar102);
                RVar209 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__00,iVar102);
                RVar210 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__00,iVar102);
                RVar211 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j__00,iVar102);
                RVar212 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__02,k_);
                RVar213 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i__01,j__02,k_);
                RVar214 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__02,k_);
                RVar215 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i__01,j__02,k_);
                RVar216 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,k_);
                RVar217 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i_,j__02,k_);
                RVar218 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar219 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap00,i_,j__02,k_);
                RVar220 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,k_);
                RVar221 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j__02,k_);
                RVar222 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar223 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ap0p,i_,j__02,k_);
                RVar224 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i__01,j__00,k_);
                RVar225 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i__01,j__00,k_);
                RVar226 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__00,k_);
                RVar227 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apm0,i_,j__00,k_);
                RVar228 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__00,k_);
                RVar229 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Apmp,i_,j__00,k_);
                RVar230 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0m0_to,i__01,j__00,iVar102);
                RVar231 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pm0_to,i__01,j__00,iVar102);
                RVar232 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p00_to,i__01,j__00,iVar102);
                RVar233 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0mp_to,i__01,j__00,iVar102);
                RVar234 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_pmp_to,i__01,j__00,iVar102);
                RVar235 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__01,j__00,iVar102);
                RVar236 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_p0p_to,i__01,j__00,iVar102);
                RVar237 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_00p_to,i__01,j_,k_);
                RVar238 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m0p_to,i_,j_,k_);
                RVar239 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    ((anon_class_8_1_a7ed5350 *)&sgeli,i__01,j__02,k_);
                RVar240 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mmp_to,i_,j__02,k_);
                RVar241 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_m00_to,i_,j_,iVar18);
                RVar242 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_0m0_to,i__01,j__02,iVar18);
                RVar243 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&interp_from_mm0_to,i_,j__02,iVar18);
                RVar244 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__02,iVar102);
                RVar245 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,iVar102);
                RVar246 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,iVar102);
                RVar247 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,iVar102);
                RVar248 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__02,j__02,iVar102);
                RVar249 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__02,iVar102);
                RVar250 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__00,iVar102);
                RVar251 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__00,iVar102);
                RVar252 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__02,j__00,iVar102);
                RVar253 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i_,j__02,k_);
                RVar254 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__02,k_);
                RVar255 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i_,j__02,k_);
                RVar256 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A000,i_,j__02,k_);
                RVar257 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__02,k_);
                RVar258 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__02,k_);
                RVar259 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i_,j__02,k_);
                RVar260 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A00p,i_,j__02,k_);
                RVar261 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i__02,j__02,k_);
                RVar262 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am00,i__02,j__02,k_);
                RVar263 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__02,j__02,k_);
                RVar264 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Am0p,i__02,j__02,k_);
                RVar265 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i_,j__00,k_);
                RVar266 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0m0,i_,j__00,k_);
                RVar267 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i_,j__00,k_);
                RVar268 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&A0mp,i_,j__00,k_);
                RVar269 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Amm0,i__02,j__00,k_);
                RVar270 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&Ammp,i__02,j__00,k_);
                RVar271 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mm0_to,i__02,j__00,iVar102);
                RVar272 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0m0_to,i__02,j__00,iVar102);
                RVar273 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m00_to,i__02,j__00,iVar102);
                RVar274 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_mmp_to,i__02,j__00,iVar102);
                RVar275 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_0mp_to,i__02,j__00,iVar102);
                RVar276 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_m0p_to,i__02,j__00,iVar102);
                RVar277 = mlndlap_stencil_rap::anon_class_8_1_a7ed5350::operator()
                                    (&restrict_from_00p_to,i__02,j__00,iVar102);
                sgfab.super_BaseFab<double>._vptr_BaseFab
                [(lVar21 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                 (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena +
                 (lVar103 - sgfab.super_BaseFab<double>.domain.smallend.vect[2]) +
                 (lVar35 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                 (long)sgfab.super_BaseFab<double>.dptr +
                 sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 7] =
                     (_func_int *)
                     (((RVar277 * (RVar240 * RVar269 + RVar270 * RVar243) +
                       RVar276 * (RVar243 * RVar268 +
                                 RVar267 * RVar242 + RVar265 * RVar239 + RVar266 * RVar240) +
                       RVar275 * (RVar243 * RVar264 +
                                 RVar241 * RVar263 + RVar261 * RVar238 + RVar262 * RVar240) +
                       RVar274 * (RVar243 * RVar260 +
                                 RVar242 * RVar259 +
                                 RVar241 * RVar258 +
                                 RVar257 + RVar256 * RVar240 +
                                           RVar255 * RVar239 + RVar253 * RVar237 + RVar254 * RVar238
                                 ) +
                       RVar273 * (RVar250 * RVar239 + RVar251 * RVar240) +
                       RVar271 * (RVar247 * RVar240 +
                                 RVar246 * RVar239 + RVar244 * RVar237 + RVar245 * RVar238) +
                       RVar272 * (RVar248 * RVar238 + RVar249 * RVar240) + RVar252 * RVar240) *
                       0.125 + (RVar195 * (RVar188 * RVar161 +
                                          RVar187 * RVar160 + RVar185 * RVar156 + RVar186 * RVar158)
                               + RVar194 * (RVar161 * RVar184 +
                                           RVar183 + RVar182 * RVar160 +
                                                     RVar181 * RVar159 +
                                                     RVar180 * RVar158 +
                                                     RVar179 * RVar157 +
                                                     RVar177 * RVar155 + RVar178 * RVar156) +
                                 RVar193 * (RVar156 * RVar175 + RVar176 * RVar160) +
                                 RVar192 * (RVar160 * RVar174 +
                                           RVar173 * RVar159 + RVar171 * RVar155 + RVar172 * RVar156
                                           ) +
                                 RVar191 * (RVar156 * RVar169 + RVar170 * RVar158) +
                                 RVar190 * (RVar158 * RVar168 +
                                           RVar167 * RVar157 + RVar165 * RVar155 + RVar166 * RVar156
                                           ) +
                                 RVar189 * (RVar162 * RVar155 + RVar163 * RVar156) +
                                 RVar164 * RVar156) * 0.125 +
                               (RVar154 * (RVar147 +
                                          RVar146 * RVar120 +
                                          RVar145 * RVar119 +
                                          RVar144 * RVar118 +
                                          RVar143 * RVar117 +
                                          RVar142 * RVar116 + RVar140 * RVar114 + RVar141 * RVar115)
                               + RVar153 * (RVar120 * RVar139 +
                                           RVar138 * RVar118 + RVar136 * RVar114 + RVar137 * RVar116
                                           ) +
                                 RVar152 * (RVar119 * RVar135 +
                                           RVar134 * RVar118 + RVar132 * RVar114 + RVar133 * RVar115
                                           ) +
                                 RVar151 * (RVar114 * RVar130 + RVar131 * RVar118) +
                                 RVar150 * (RVar117 * RVar129 +
                                           RVar128 * RVar116 + RVar126 * RVar114 + RVar127 * RVar115
                                           ) +
                                 RVar149 * (RVar114 * RVar124 + RVar125 * RVar116) +
                                 RVar148 * (RVar122 * RVar114 + RVar123 * RVar115) +
                                 RVar121 * RVar114) * 0.125 +
                               (RVar236 * (RVar202 * RVar229 +
                                          RVar228 * RVar201 + RVar226 * RVar198 + RVar227 * RVar199)
                               + RVar235 * (RVar198 * RVar224 + RVar225 * RVar201) +
                                 RVar234 * (RVar202 * RVar223 +
                                           RVar201 * RVar222 +
                                           RVar221 + RVar220 * RVar200 +
                                                     RVar219 * RVar199 +
                                                     RVar218 * RVar198 +
                                                     RVar216 * RVar196 + RVar217 * RVar197) +
                                 RVar233 * (RVar201 * RVar215 +
                                           RVar200 * RVar214 + RVar196 * RVar212 + RVar213 * RVar198
                                           ) +
                                 RVar232 * (RVar210 * RVar198 + RVar211 * RVar199) +
                                 RVar230 * (RVar203 * RVar196 + RVar204 * RVar198) +
                                 RVar231 * (RVar208 * RVar199 +
                                           RVar207 * RVar198 + RVar205 * RVar196 + RVar206 * RVar197
                                           ) + RVar209 * RVar198) * 0.125) * 0.25);
              }
            }
          }
          MFIter::operator++(&mfi);
        }
        MFIter::~MFIter(&mfi);
        MFIter::MFIter(&mfi,&pFVar60->super_FabArrayBase,true);
        while (mfi.currentIndex < mfi.endIndex) {
          MFIter::tilebox((Box *)&nghost,&mfi);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&sgfab,pFVar60,&mfi);
          lVar103 = (long)iStack_66c;
          iVar31 = local_668 + -1;
          for (lVar21 = (long)local_668; (int)lVar21 <= iStack_65c; lVar21 = lVar21 + 1) {
            lVar61 = (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena * 8;
            lVar107 = ((lVar103 + -1) - (long)sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                      lVar61;
            lVar43 = (long)(iVar31 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                     (long)sgfab.super_BaseFab<double>.dptr * 8;
            lVar35 = lVar43 + lVar107;
            lVar96 = sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x38;
            lVar54 = (lVar21 - sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                     (long)sgfab.super_BaseFab<double>.dptr * 8;
            lVar107 = lVar107 + lVar54;
            lVar80 = (lVar103 - sgfab.super_BaseFab<double>.domain.bigend.vect[0]) * lVar61;
            lVar43 = lVar43 + lVar80;
            lVar80 = lVar80 + lVar54;
            lVar54 = sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x30;
            lVar45 = (long)sgfab.super_BaseFab<double>.domain.smallend.vect[2];
            lVar86 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar35 + lVar96 + lVar45 * -8 + (long)nghost * 8;
            lVar99 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar96 + lVar107 + lVar45 * -8 + (long)nghost * 8;
            lVar36 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x20 + lVar107 +
                     lVar45 * -8 + (long)nghost * 8;
            lVar84 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar43 + lVar96 + lVar45 * -8 + (long)nghost * 8;
            lVar92 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar43 + sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x28 +
                     lVar45 * -8 + (long)nghost * 8;
            lVar104 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                      lVar96 + lVar80 + lVar45 * -8 + (long)nghost * 8;
            local_f18 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x28 + lVar80 +
                        lVar45 * -8 + (long)nghost * 8;
            lVar55 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x20 + lVar80 +
                     lVar45 * -8 + (long)nghost * 8;
            lVar37 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 8 + lVar80 +
                     lVar45 * -8 + (long)nghost * 8;
            local_c58 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        lVar43 + lVar54 + lVar45 * -8 + (long)nghost * 8;
            lVar43 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar43 + sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x18 +
                     lVar45 * -8 + (long)nghost * 8;
            lVar96 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x40 + lVar80 +
                     lVar45 * -8 + (long)nghost * 8;
            local_c88 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        lVar80 + lVar45 * -8 + (long)nghost * 8;
            local_e58 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        lVar54 + lVar80 + lVar45 * -8 + (long)nghost * 8;
            local_f00 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x18 + lVar80 +
                        lVar45 * -8 + (long)nghost * 8;
            lVar80 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar80 + sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x10 +
                     lVar45 * -8 + (long)nghost * 8;
            lVar46 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar35 + lVar54 + lVar45 * -8 + (long)nghost * 8;
            lVar54 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     lVar54 + lVar107 + lVar45 * -8 + (long)nghost * 8;
            local_ef8 = (long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                        sgfab.super_BaseFab<double>.domain.smallend.vect._0_8_ * 0x10 + lVar107 +
                        lVar45 * -8 + (long)nghost * 8;
            for (lVar35 = lVar103; lVar35 <= local_660; lVar35 = lVar35 + 1) {
              if (nghost <= local_664) {
                lVar107 = 0;
                do {
                  *(double *)(local_c88 + lVar107 * 8) =
                       -(*(double *)(lVar37 + -8 + lVar107 * 8) + *(double *)(lVar37 + lVar107 * 8)
                         + *(double *)(local_ef8 + lVar107 * 8) + *(double *)(lVar80 + lVar107 * 8)
                         + *(double *)(lVar43 + lVar107 * 8) + *(double *)(local_f00 + lVar107 * 8)
                         + *(double *)(lVar36 + -8 + lVar107 * 8) +
                         *(double *)(lVar36 + lVar107 * 8) + *(double *)(lVar55 + -8 + lVar107 * 8)
                         + *(double *)(lVar55 + lVar107 * 8) +
                         *(double *)(lVar92 + -8 + lVar107 * 8) + *(double *)(lVar92 + lVar107 * 8)
                         + *(double *)(local_f18 + -8 + lVar107 * 8) +
                         *(double *)(local_f18 + lVar107 * 8) + *(double *)(lVar46 + lVar107 * 8) +
                         *(double *)(local_c58 + lVar107 * 8) + *(double *)(lVar54 + lVar107 * 8) +
                         *(double *)(local_e58 + lVar107 * 8) +
                         *(double *)(lVar86 + -8 + lVar107 * 8) + *(double *)(lVar86 + lVar107 * 8)
                         + *(double *)(lVar84 + -8 + lVar107 * 8) +
                         *(double *)(lVar84 + lVar107 * 8) + *(double *)(lVar99 + -8 + lVar107 * 8)
                         + *(double *)(lVar99 + lVar107 * 8) +
                         *(double *)(lVar104 + -8 + lVar107 * 8) +
                        *(double *)(lVar104 + lVar107 * 8));
                  *(double *)(lVar96 + lVar107 * 8) =
                       1.0 / (ABS(*(double *)(lVar104 + lVar107 * 8)) +
                              ABS(*(double *)(lVar104 + -8 + lVar107 * 8)) +
                              ABS(*(double *)(lVar99 + lVar107 * 8)) +
                              ABS(*(double *)(lVar99 + -8 + lVar107 * 8)) +
                              ABS(*(double *)(lVar84 + lVar107 * 8)) +
                              ABS(*(double *)(lVar84 + -8 + lVar107 * 8)) +
                              ABS(*(double *)(lVar86 + lVar107 * 8)) +
                              ABS(*(double *)(lVar86 + -8 + lVar107 * 8)) +
                              ABS(*(double *)(local_e58 + lVar107 * 8)) +
                              ABS(*(double *)(lVar54 + lVar107 * 8)) +
                              ABS(*(double *)(local_c58 + lVar107 * 8)) +
                              ABS(*(double *)(lVar46 + lVar107 * 8)) +
                              ABS(*(double *)(local_f18 + lVar107 * 8)) +
                              ABS(*(double *)(local_f18 + -8 + lVar107 * 8)) +
                              ABS(*(double *)(lVar92 + lVar107 * 8)) +
                              ABS(*(double *)(lVar92 + -8 + lVar107 * 8)) +
                              ABS(*(double *)(lVar55 + lVar107 * 8)) +
                              ABS(*(double *)(lVar55 + -8 + lVar107 * 8)) +
                              ABS(*(double *)(lVar36 + lVar107 * 8)) +
                              ABS(*(double *)(lVar36 + -8 + lVar107 * 8)) +
                              ABS(*(double *)(local_f00 + lVar107 * 8)) +
                              ABS(*(double *)(lVar43 + lVar107 * 8)) +
                              ABS(*(double *)(lVar80 + lVar107 * 8)) +
                              ABS(*(double *)(local_ef8 + lVar107 * 8)) +
                              ABS(*(double *)(lVar37 + lVar107 * 8)) +
                              ABS(*(double *)(lVar37 + -8 + lVar107 * 8)) + 1e-100);
                  lVar107 = lVar107 + 1;
                } while ((local_664 - nghost) + 1 != (int)lVar107);
              }
              lVar86 = lVar86 + lVar61;
              lVar99 = lVar99 + lVar61;
              lVar36 = lVar36 + lVar61;
              lVar84 = lVar84 + lVar61;
              lVar92 = lVar92 + lVar61;
              lVar104 = lVar104 + lVar61;
              local_f18 = local_f18 + lVar61;
              lVar55 = lVar55 + lVar61;
              lVar37 = lVar37 + lVar61;
              local_c58 = local_c58 + lVar61;
              lVar43 = lVar43 + lVar61;
              lVar96 = lVar96 + lVar61;
              local_c88 = local_c88 + lVar61;
              local_e58 = local_e58 + lVar61;
              local_f00 = local_f00 + lVar61;
              lVar80 = lVar80 + lVar61;
              lVar46 = lVar46 + lVar61;
              lVar54 = lVar54 + lVar61;
              local_ef8 = local_ef8 + lVar61;
            }
            iVar31 = iVar31 + 1;
          }
          MFIter::operator++(&mfi);
        }
        MFIter::~MFIter(&mfi);
        if (!bVar15) {
          period = Periodicity::NonPeriodic();
          FabArray<amrex::FArrayBox>::ParallelCopy
                    (this_03,(FabArray<amrex::FArrayBox> *)&mfi_1,period,COPY);
        }
        pFVar60 = *(FabArray<amrex::FArrayBox> **)
                   (*(long *)&(this->m_stencil).
                              super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar79].
                              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   + lVar53 * 8);
        PVar307 = Geometry::periodicity
                            ((Geometry *)
                             (lVar53 * 200 +
                             *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar79].
                                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                       .
                                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                             ));
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
             (undefined1)PVar307.period.vect[0];
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_2_ =
             PVar307.period.vect[0]._1_2_;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._3_1_ =
             PVar307.period.vect[0]._3_1_;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
             PVar307.period.vect[1];
        mfi.fabArray._0_4_ = PVar307.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar60,(Periodicity *)&mfi,false);
        MultiFab::~MultiFab((MultiFab *)&mfi_1);
      }
      uVar79 = uVar79 + 1;
    }
    for (lVar53 = 0; lVar53 < (int)uVar20; lVar53 = lVar53 + 1) {
      for (lVar103 = 0;
          lVar103 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                    super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[lVar53]; lVar103 = lVar103 + 1) {
        MFIter::MFIter(&mfi_1,*(FabArrayBase **)
                               (*(long *)&(this_05->
                                          super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                          ).
                                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar53].
                                          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                          .
                                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                               + lVar103 * 8),true);
        while (mfi_1.currentIndex < mfi_1.endIndex) {
          MFIter::tilebox((Box *)&nghost,&mfi_1);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&mfi,
                     *(FabArray<amrex::FArrayBox> **)
                      (*(long *)&(this->m_stencil).
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar53].
                                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      + lVar103 * 8),&mfi_1);
          FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                    ((Array4<int> *)&sgfab,
                     *(FabArray<amrex::IArrayBox> **)
                      (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar53].
                                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                      + lVar103 * 8),&mfi_1);
          for (iVar31 = local_668; iVar31 <= iStack_65c; iVar31 = iVar31 + 1) {
            for (iVar34 = iStack_66c; iVar34 <= local_660; iVar34 = iVar34 + 1) {
              if (nghost <= local_664) {
                uVar79 = (ulong)_nghost & 0xffffffff;
                do {
                  iVar83 = (int)uVar79;
                  dVar300 = *(double *)
                             (CONCAT44(mfi.m_fa._M_t.
                                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                       _M_head_impl._4_4_,
                                       CONCAT13(mfi.m_fa._M_t.
                                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                ._M_head_impl._3_1_,
                                                CONCAT21(mfi.m_fa._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl._1_2_,
                                                  mfi.m_fa._M_t.
                                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl._0_1_))) +
                              ((long)iVar34 - (long)mfi.beginIndex) *
                              CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray) * 8 +
                              (long)(iVar83 - mfi.currentIndex) * 8 +
                             ((long)iVar31 - (long)mfi.endIndex) *
                             CONCAT44(mfi.tile_size.vect[1],mfi.tile_size.vect[0]) * 8);
                  if ((dVar300 == 0.0) && (!NAN(dVar300))) {
                    *(undefined4 *)
                     ((long)sgfab.super_BaseFab<double>._vptr_BaseFab +
                     ((long)iVar31 - (long)sgfab.super_BaseFab<double>.domain.bigend.vect[1]) *
                     (long)sgfab.super_BaseFab<double>.dptr * 4 +
                     (long)(iVar83 - sgfab.super_BaseFab<double>.domain.smallend.vect[2]) * 4 +
                     ((long)iVar34 - (long)sgfab.super_BaseFab<double>.domain.bigend.vect[0]) *
                     (long)sgfab.super_BaseFab<double>.super_DataAllocator.m_arena * 4) = 1;
                  }
                  uVar79 = (ulong)(iVar83 + 1U);
                } while (local_664 + 1U != iVar83 + 1U);
              }
            }
          }
          MFIter::operator++(&mfi_1);
        }
        MFIter::~MFIter(&mfi_1);
      }
      uVar20 = (ulong)(uint)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
    }
    uVar20 = (ulong)(uint)*(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                           super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
    uVar79 = uVar20;
    do {
      uVar79 = uVar79 - 1;
      iVar31 = (int)uVar20;
      if (iVar31 < 2) {
        iVar31 = 1;
        break;
      }
      iVar34 = iMultiFab::min(*(iMultiFab **)
                               (*(long *)&(((this->super_MLNodeLinOp).m_dirichlet_mask.
                                            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                          ).
                                          super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                               + uVar79 * 8),0,0,false);
      uVar20 = (ulong)(iVar31 - 1);
    } while (iVar34 != 0);
    iVar34 = *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (iVar31 < iVar34) {
      resizeMultiGrid(this,iVar31);
      iVar34 = *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
                super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
    }
    pMVar1 = &(this->super_MLNodeLinOp).m_bottom_dot_mask;
    MVar28 = FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                       (&pMVar1->super_FabArray<amrex::FArrayBox>);
    MVar29 = FabArray<amrex::IArrayBox>::const_arrays<amrex::IArrayBox,_0>
                       (*(FabArray<amrex::IArrayBox> **)
                         (*(long *)&(((this->super_MLNodeLinOp).m_dirichlet_mask.
                                      super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                    ).
                                    super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                          + -8 + (long)iVar34 * 8));
    sgfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x0;
    auVar9._12_4_ = 0;
    auVar9._0_12_ = (undefined1  [12])sgfab.super_BaseFab<double>._12_12_;
    sgfab.super_BaseFab<double>._8_16_ = auVar9 << 0x20;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
         Gpu::Device::max_gpu_streams;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
    mfi.fabArray._0_4_ = (int)FabArrayBase::mfiter_tile_size;
    mfi.fabArray._4_4_ = (int)((ulong)FabArrayBase::mfiter_tile_size >> 0x20);
    mfi.tile_size.vect[0] = DAT_006ddef0;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_2_ = 0x100;
    MFIter::MFIter(&mfi_1,(FabArrayBase *)pMVar1,(MFItInfo *)&mfi);
    while( true ) {
      if (mfi_1.endIndex <= mfi_1.currentIndex) break;
      MFIter::growntilebox((Box *)&mfi,&mfi_1,(IntVect *)&sgfab);
      piVar22 = &mfi_1.currentIndex;
      if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar22 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi_1.currentIndex;
      }
      iVar31 = CONCAT13(mfi.m_fa._M_t.
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._3_1_,
                        CONCAT21(mfi.m_fa._M_t.
                                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                                 _1_2_,mfi.m_fa._M_t.
                                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                       _M_head_impl._0_1_));
      pAVar2 = MVar29.hp + *piVar22;
      pAVar30 = MVar28.hp + *piVar22;
      for (lVar53 = (long)(int)mfi.fabArray;
          lVar103 = (long)mfi.m_fa._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
          (int)lVar53 <= mfi.tile_size.vect[1]; lVar53 = lVar53 + 1) {
        for (; (int)lVar103 <= mfi.tile_size.vect[0]; lVar103 = lVar103 + 1) {
          if (iVar31 <= mfi.fabArray._4_4_) {
            iVar34 = (pAVar2->begin).x;
            iVar83 = (pAVar2->begin).y;
            iVar3 = (pAVar2->begin).z;
            piVar22 = pAVar2->p;
            lVar21 = pAVar2->kstride;
            lVar35 = pAVar2->jstride;
            lVar54 = 0;
            do {
              if (piVar22[(long)iVar31 +
                          (((lVar103 - iVar83) * lVar35 + (lVar53 - iVar3) * lVar21 + lVar54) -
                          (long)iVar34)] != 0) {
                pAVar30->p
                [((lVar103 - (pAVar30->begin).y) * pAVar30->jstride +
                 (lVar53 - (pAVar30->begin).z) * pAVar30->kstride + iVar31 + lVar54) -
                 (long)(pAVar30->begin).x] = 0.0;
              }
              lVar54 = lVar54 + 1;
            } while ((mfi.fabArray._4_4_ - iVar31) + 1 != (int)lVar54);
          }
        }
      }
      MFIter::operator++(&mfi_1);
    }
    MFIter::~MFIter(&mfi_1);
    if ((this->super_MLNodeLinOp).m_is_bottom_singular == true) {
      pMVar1 = &(this->super_MLNodeLinOp).m_coarse_dot_mask;
      MVar28 = FabArray<amrex::FArrayBox>::arrays<amrex::FArrayBox,_0>
                         (&pMVar1->super_FabArray<amrex::FArrayBox>);
      MVar29 = FabArray<amrex::IArrayBox>::const_arrays<amrex::IArrayBox,_0>
                         ((FabArray<amrex::IArrayBox> *)
                          **(undefined8 **)
                            &(((this->super_MLNodeLinOp).m_dirichlet_mask.
                               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                             ).
                             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                         );
      sgfab.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x0;
      auVar10._12_4_ = 0;
      auVar10._0_12_ = (undefined1  [12])sgfab.super_BaseFab<double>._12_12_;
      sgfab.super_BaseFab<double>._8_16_ = auVar10 << 0x20;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
           Gpu::Device::max_gpu_streams;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
      mfi.fabArray._0_4_ = (int)FabArrayBase::mfiter_tile_size;
      mfi.fabArray._4_4_ = (int)((ulong)FabArrayBase::mfiter_tile_size >> 0x20);
      mfi.tile_size.vect[0] = DAT_006ddef0;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_2_ = 0x100;
      MFIter::MFIter(&mfi_1,(FabArrayBase *)pMVar1,(MFItInfo *)&mfi);
      while( true ) {
        if (mfi_1.endIndex <= mfi_1.currentIndex) break;
        MFIter::growntilebox((Box *)&mfi,&mfi_1,(IntVect *)&sgfab);
        piVar22 = &mfi_1.currentIndex;
        if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar22 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi_1.currentIndex;
        }
        iVar31 = CONCAT13(mfi.m_fa._M_t.
                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._3_1_,
                          CONCAT21(mfi.m_fa._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                                   ._1_2_,mfi.m_fa._M_t.
                                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                          _M_head_impl._0_1_));
        pAVar2 = MVar29.hp + *piVar22;
        pAVar30 = MVar28.hp + *piVar22;
        for (lVar53 = (long)(int)mfi.fabArray;
            lVar103 = (long)mfi.m_fa._M_t.
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
            (int)lVar53 <= mfi.tile_size.vect[1]; lVar53 = lVar53 + 1) {
          for (; (int)lVar103 <= mfi.tile_size.vect[0]; lVar103 = lVar103 + 1) {
            if (iVar31 <= mfi.fabArray._4_4_) {
              iVar34 = (pAVar2->begin).x;
              iVar83 = (pAVar2->begin).y;
              iVar3 = (pAVar2->begin).z;
              piVar22 = pAVar2->p;
              lVar21 = pAVar2->kstride;
              lVar35 = pAVar2->jstride;
              lVar54 = 0;
              do {
                if (piVar22[(long)iVar31 +
                            (((lVar103 - iVar83) * lVar35 + (lVar53 - iVar3) * lVar21 + lVar54) -
                            (long)iVar34)] != 0) {
                  pAVar30->p
                  [((lVar103 - (pAVar30->begin).y) * pAVar30->jstride +
                   (lVar53 - (pAVar30->begin).z) * pAVar30->kstride + iVar31 + lVar54) -
                   (long)(pAVar30->begin).x] = 0.0;
                }
                lVar54 = lVar54 + 1;
              } while ((mfi.fabArray._4_4_ - iVar31) + 1 != (int)lVar54);
            }
          }
        }
        MFIter::operator++(&mfi_1);
      }
      MFIter::~MFIter(&mfi_1);
    }
    Gpu::Device::streamSynchronize();
    RVar114 = MultiFab::norm0((MultiFab *)
                              (*(pointer *)
                                ((long)&(((this->m_stencil).
                                          super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                        ).
                                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                + 8))[-1]._M_t.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ,0,0,false,false);
    (*(pointer *)
      ((long)&(((this->m_s0_norm0).
                super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                .
                super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_> + 8))[-1] =
         RVar114 * this->m_normalization_threshold;
  }
  return;
}

Assistant:

void
MLNodeLaplacian::buildStencil ()
{
    m_stencil.resize(m_num_amr_levels);
    m_nosigma_stencil.resize(m_num_amr_levels);
    m_s0_norm0.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_stencil[amrlev].resize(m_num_mg_levels[amrlev]);
        m_s0_norm0[amrlev].resize(m_num_mg_levels[amrlev],0.0);
    }

    if (m_coarsening_strategy != CoarseningStrategy::RAP) return;

    const int ncomp_s = (AMREX_SPACEDIM == 2) ? 5 : 9;
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMREX_SPACEDIM != 1,
                                     "MLNodeLaplacian::buildStencil: 1d not supported");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!m_geom[0][0].IsRZ(),
                                     "MLNodeLaplacian::buildStencil: cylindrical not supported for RAP");

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        AMREX_ALWAYS_ASSERT(amrlev == m_num_amr_levels-1 || AMRRefRatio(amrlev) == 2);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const int nghost = (0 == amrlev && mglev+1 == m_num_mg_levels[amrlev]) ? 1 : 4;
            m_stencil[amrlev][mglev] = std::make_unique<MultiFab>
                (amrex::convert(m_grids[amrlev][mglev], IntVect::TheNodeVector()),
                 m_dmap[amrlev][mglev], ncomp_s, nghost);
            m_stencil[amrlev][mglev]->setVal(0.0);
        }

        if (amrlev > 0) {
            m_nosigma_stencil[amrlev] = std::make_unique<MultiFab>
                (amrex::convert(m_grids[amrlev][0], IntVect::TheNodeVector()),
                 m_dmap[amrlev][0], ncomp_s, 4);
            m_nosigma_stencil[amrlev]->setVal(0.0);
        }

        {
            const Geometry& geom = m_geom[amrlev][0];
            const auto dxinvarr = geom.InvCellSizeArray();

#ifdef AMREX_USE_EB
            auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
            const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
            const MultiFab* intg = m_integral[amrlev].get();
            const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
#endif

            MFItInfo mfi_info;
            if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            {
                FArrayBox sgfab;
                FArrayBox cnfab;

                for (MFIter mfi(*m_stencil[amrlev][0],mfi_info); mfi.isValid(); ++mfi)
                {
                    Box vbx = mfi.validbox();
                    AMREX_D_TERM(vbx.growLo(0,1);, vbx.growLo(1,1);, vbx.growLo(2,1));
                    Box bx = mfi.growntilebox(1);
                    bx &= vbx;
                    const Box& ccbx = amrex::enclosedCells(bx);
                    const Box& ccbxg1 = amrex::grow(ccbx,1);
                    const FArrayBox& sgfab_orig = (*m_sigma[amrlev][0][0])[mfi];
                    Array4<Real const> const& sgarr_orig = sgfab_orig.const_array();

                    Array4<Real> const& starr = m_stencil[amrlev][0]->array(mfi);
                    Array4<Real> const ns_starr = m_nosigma_stencil[amrlev] ?
                        m_nosigma_stencil[amrlev]->array(mfi) : Array4<Real>{};
#ifdef AMREX_USE_EB
                    Array4<Real const> const& intgarr = intg->const_array(mfi);

                    const int ncomp_c = (AMREX_SPACEDIM == 2) ? 6 : 27;
                    bool regular = !factory;
                    if (factory)
                    {
                        Array4<EBCellFlag const> const& flagarr = flags->const_array(mfi);
                        Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                        const auto& flag = (*flags)[mfi];
                        const auto& typ = flag.getType(ccbxg1);
                        if (typ == FabType::covered)
                        {
                            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx,ncomp_s,i,j,k,n,
                            {
                                starr(i,j,k,n) = 0.0;
                            });

                            if (ns_starr) {
                                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx,ncomp_s,i,j,k,n,
                                {
                                    ns_starr(i,j,k,n) = 0.0;
                                });
                            }
                        }
                        else if (typ == FabType::singlevalued)
                        {
                            const Box& btmp = ccbxg1 & sgfab_orig.box();

                            cnfab.resize(ccbxg1, ncomp_c);
                            Elixir cneli = cnfab.elixir();
                            Array4<Real> const& cnarr = cnfab.array();

                            sgfab.resize(ccbxg1);
                            Elixir sgeli = sgfab.elixir();
                            Array4<Real> const& sgarr = sgfab.array();

                            AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                            {
                                if (btmp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                    mlndlap_set_connection(i,j,k,cnarr,intgarr,vfracarr,flagarr);
                                    sgarr(i,j,k) = sgarr_orig(i,j,k);
                                } else {
                                    for (int n = 0; n < ncomp_c; ++n) {
                                        cnarr(i,j,k,n) = 0.0;
                                    }
                                    sgarr(i,j,k) = 0.0;
                                }
                            });

                            AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                            {
                                mlndlap_set_stencil_eb(i, j, k, starr, sgarr, cnarr, dxinvarr);
                            });

                            if (ns_starr) {
                                AMREX_HOST_DEVICE_FOR_3D(btmp, i, j, k,
                                {
                                    sgarr(i,j,k) = Real(1.0);
                                });
                                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                                {
                                    mlndlap_set_stencil_eb(i,j,k, ns_starr, sgarr, cnarr, dxinvarr);
                                });
                            }
                        }
                        else
                        {
                            regular = true;
                        }
                    }
                    if (regular)
#endif
                    {
                        const Box& btmp = ccbxg1 & sgfab_orig.box();

                        sgfab.resize(ccbxg1);
                        Elixir sgeli = sgfab.elixir();
                        Array4<Real> const& sgarr = sgfab.array();

                        AMREX_HOST_DEVICE_FOR_3D(ccbxg1, i, j, k,
                        {
                            if (btmp.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                                sgarr(i,j,k) = sgarr_orig(i,j,k);
                            } else {
                                sgarr(i,j,k) = 0.0;
                            }
                        });

                        AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
                        {
                            mlndlap_set_stencil(tbx,starr,sgarr,dxinvarr);
                        });

                        if (ns_starr) {
                            AMREX_HOST_DEVICE_FOR_3D(btmp, i, j, k,
                            {
                                sgarr(i,j,k) = Real(1.0);
                            });

                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
                            {
                                mlndlap_set_stencil(tbx, ns_starr, sgarr, dxinvarr);
                            });
                        }
                    }
                }
            }

            // set_stencil_s0 has to be in a separate MFIter from set_stencil
            // because it uses other cells' data.
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*m_stencil[amrlev][0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                Array4<Real> const& starr = m_stencil[amrlev][0]->array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_set_stencil_s0(i,j,k,starr);
                });

                if (m_nosigma_stencil[amrlev]) {
                    Array4<Real> const& ns_starr = m_nosigma_stencil[amrlev]->array(mfi);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_set_stencil_s0(i,j,k,ns_starr);
                    });
                }
            }

            m_stencil[amrlev][0]->FillBoundary(geom.periodicity());

            if (m_nosigma_stencil[amrlev]) {
                m_nosigma_stencil[amrlev]->FillBoundary(geom.periodicity());
            }
        }

        for (int mglev = 1; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const MultiFab& fine = *m_stencil[amrlev][mglev-1];
            MultiFab& crse = *m_stencil[amrlev][mglev];
            bool need_parallel_copy = !amrex::isMFIterSafe(crse, fine);
            MultiFab cfine;
            if (need_parallel_copy) {
                const BoxArray& ba = amrex::coarsen(fine.boxArray(), 2);
                cfine.define(ba, fine.DistributionMap(), fine.nComp(), 1);
                cfine.setVal(0.0);
            }

            MultiFab* pcrse = (need_parallel_copy) ? &cfine : &crse;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*pcrse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                Box vbx = mfi.validbox();
                AMREX_D_TERM(vbx.growLo(0,1);, vbx.growLo(1,1);, vbx.growLo(2,1));
                Box bx = mfi.growntilebox(1);
                bx &= vbx;
                Array4<Real> const& csten = pcrse->array(mfi);
                Array4<Real const> const& fsten = fine.const_array(mfi);

                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_stencil_rap(i,j,k,csten,fsten);
                });
            }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*pcrse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                Array4<Real> const& starr = pcrse->array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_set_stencil_s0(i,j,k,starr);
                });
            }

            if (need_parallel_copy) {
                crse.ParallelCopy(cfine);
            }

            m_stencil[amrlev][mglev]->FillBoundary(m_geom[amrlev][mglev].periodicity());
        }
    }

#ifdef AMREX_USE_EB
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && m_stencil[amrlev][mglev]->isFusingCandidate()) {
                auto const& stma = m_stencil[amrlev][mglev]->const_arrays();
                auto const& dmskma = m_dirichlet_mask[amrlev][mglev]->arrays();
                ParallelFor(*m_stencil[amrlev][mglev],
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    if (stma[box_no](i,j,k,0) == Real(0.0)) {
                        dmskma[box_no](i,j,k) = 1;
                    }
                });
                // We only need to sync once at the end of this function.
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(*m_stencil[amrlev][mglev],TilingIfNotGPU()); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    Array4<Real const> const& starr = m_stencil[amrlev][mglev]->const_array(mfi);
                    Array4<int> const& dmskarr = m_dirichlet_mask[amrlev][mglev]->array(mfi);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        if (starr(i,j,k,0) == Real(0.0)) {
                            dmskarr(i,j,k) = 1;
                        }
                    });
                }
            }
        }
    }
#endif

#ifdef AMREX_USE_EB
    int max_eb_level = 0;
    for (int mglev = m_num_mg_levels[0]-1; mglev > 0; --mglev) {
        int mlo = m_dirichlet_mask[0][mglev]->min(0);
        if (!mlo) {
            // This level is good because not every nodes are Dirichlet.
            max_eb_level = mglev;
            break;
        }
    }
    if (max_eb_level+1 < m_num_mg_levels[0]) {
        resizeMultiGrid(max_eb_level+1);
    }
#endif

    {
        int amrlev = 0;
        int mglev = m_num_mg_levels[amrlev]-1;
        auto const& dotmasks = m_bottom_dot_mask.arrays();
        auto const& dirmasks = m_dirichlet_mask[amrlev][mglev]->const_arrays();
        amrex::ParallelFor(m_bottom_dot_mask,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
        {
            if (dirmasks[box_no](i,j,k)) {
                dotmasks[box_no](i,j,k) = Real(0.);
            }
        });
    }

    if (m_is_bottom_singular)
    {
        int amrlev = 0;
        int mglev = 0;
        auto const& dotmasks = m_coarse_dot_mask.arrays();
        auto const& dirmasks = m_dirichlet_mask[amrlev][mglev]->const_arrays();
        amrex::ParallelFor(m_coarse_dot_mask,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
        {
            if (dirmasks[box_no](i,j,k)) {
                dotmasks[box_no](i,j,k) = Real(0.);
            }
        });
    }

    Gpu::streamSynchronize();

    // This is only needed at the bottom.
    m_s0_norm0[0].back() = m_stencil[0].back()->norm0(0,0) * m_normalization_threshold;
}